

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  long lVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [28];
  undefined1 auVar113 [28];
  undefined1 auVar114 [28];
  undefined1 auVar115 [24];
  int iVar116;
  long lVar117;
  RTCIntersectArguments *pRVar118;
  ulong uVar119;
  uint uVar120;
  ulong uVar121;
  long lVar122;
  Primitive *pPVar123;
  ulong uVar124;
  bool bVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar141;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar147;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar148;
  undefined1 auVar140 [64];
  float fVar146;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar149;
  float fVar159;
  float fVar160;
  vint4 bi_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar161;
  float fVar162;
  undefined1 auVar154 [32];
  float fVar163;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar171;
  vint4 ai;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar172;
  undefined1 auVar170 [32];
  float fVar173;
  float fVar188;
  float fVar190;
  vint4 bi;
  undefined1 auVar175 [16];
  float fVar192;
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  float fVar174;
  float fVar193;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar177 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar189;
  float fVar191;
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  float fVar198;
  float fVar215;
  float fVar219;
  vint4 ai_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar223;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar208 [16];
  float fVar216;
  float fVar217;
  float fVar220;
  float fVar221;
  float fVar224;
  float fVar225;
  undefined1 auVar209 [32];
  float fVar218;
  float fVar222;
  float fVar226;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar227;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar228;
  float fVar238;
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar229;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar244;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar253;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar254;
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar272;
  float fVar273;
  vint4 ai_1;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar275;
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar274;
  undefined1 auVar270 [32];
  float fVar276;
  float fVar282;
  float fVar283;
  undefined1 auVar277 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar296 [32];
  float fVar304;
  float fVar311;
  float fVar312;
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  float fVar313;
  float fVar314;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar315;
  float fVar316;
  float fVar321;
  float fVar323;
  undefined1 auVar317 [16];
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar327;
  float fVar328;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  float fVar338;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7fc;
  RayQueryContext *local_7f8;
  Ray *local_7f0;
  undefined4 local_7e4;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  Primitive *local_7d0;
  Precalculations *local_7c8;
  uint local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  ulong local_7a0;
  undefined1 auStack_798 [24];
  ulong local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  undefined1 local_660 [32];
  uint local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [16];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_260 [32];
  float local_240 [4];
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar271 [64];
  
  local_7c8 = pre;
  PVar10 = prim[1];
  uVar121 = (ulong)(byte)PVar10;
  lVar99 = uVar121 * 0x19;
  auVar178 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar99 + 6));
  fVar173 = *(float *)(prim + lVar99 + 0x12);
  auVar150._0_4_ = fVar173 * auVar178._0_4_;
  auVar150._4_4_ = fVar173 * auVar178._4_4_;
  auVar150._8_4_ = fVar173 * auVar178._8_4_;
  auVar150._12_4_ = fVar173 * auVar178._12_4_;
  auVar230._0_4_ = fVar173 * (ray->dir).field_0.m128[0];
  auVar230._4_4_ = fVar173 * (ray->dir).field_0.m128[1];
  auVar230._8_4_ = fVar173 * (ray->dir).field_0.m128[2];
  auVar230._12_4_ = fVar173 * (ray->dir).field_0.m128[3];
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 4 + 6)));
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 5 + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 6 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar121 * 0xb + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar121 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar124 = (ulong)(uint)((int)(uVar121 * 9) * 2);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 + uVar121 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  uVar124 = (ulong)(uint)((int)(uVar121 * 5) << 2);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar129 = vshufps_avx(auVar230,auVar230,0);
  auVar151 = vshufps_avx(auVar230,auVar230,0x55);
  auVar164 = vshufps_avx(auVar230,auVar230,0xaa);
  fVar173 = auVar164._0_4_;
  fVar198 = auVar164._4_4_;
  fVar228 = auVar164._8_4_;
  fVar188 = auVar164._12_4_;
  fVar240 = auVar151._0_4_;
  fVar192 = auVar151._4_4_;
  fVar223 = auVar151._8_4_;
  fVar241 = auVar151._12_4_;
  fVar215 = auVar129._0_4_;
  fVar238 = auVar129._4_4_;
  fVar190 = auVar129._8_4_;
  fVar219 = auVar129._12_4_;
  auVar305._0_4_ = fVar215 * auVar178._0_4_ + fVar240 * auVar166._0_4_ + fVar173 * auVar208._0_4_;
  auVar305._4_4_ = fVar238 * auVar178._4_4_ + fVar192 * auVar166._4_4_ + fVar198 * auVar208._4_4_;
  auVar305._8_4_ = fVar190 * auVar178._8_4_ + fVar223 * auVar166._8_4_ + fVar228 * auVar208._8_4_;
  auVar305._12_4_ =
       fVar219 * auVar178._12_4_ + fVar241 * auVar166._12_4_ + fVar188 * auVar208._12_4_;
  auVar317._0_4_ = fVar215 * auVar179._0_4_ + fVar240 * auVar17._0_4_ + auVar18._0_4_ * fVar173;
  auVar317._4_4_ = fVar238 * auVar179._4_4_ + fVar192 * auVar17._4_4_ + auVar18._4_4_ * fVar198;
  auVar317._8_4_ = fVar190 * auVar179._8_4_ + fVar223 * auVar17._8_4_ + auVar18._8_4_ * fVar228;
  auVar317._12_4_ = fVar219 * auVar179._12_4_ + fVar241 * auVar17._12_4_ + auVar18._12_4_ * fVar188;
  auVar231._0_4_ = fVar215 * auVar130._0_4_ + fVar240 * auVar131._0_4_ + auVar152._0_4_ * fVar173;
  auVar231._4_4_ = fVar238 * auVar130._4_4_ + fVar192 * auVar131._4_4_ + auVar152._4_4_ * fVar198;
  auVar231._8_4_ = fVar190 * auVar130._8_4_ + fVar223 * auVar131._8_4_ + auVar152._8_4_ * fVar228;
  auVar231._12_4_ =
       fVar219 * auVar130._12_4_ + fVar241 * auVar131._12_4_ + auVar152._12_4_ * fVar188;
  auVar129 = vshufps_avx(auVar150,auVar150,0);
  auVar151 = vshufps_avx(auVar150,auVar150,0x55);
  auVar164 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar173 = auVar164._0_4_;
  fVar198 = auVar164._4_4_;
  fVar228 = auVar164._8_4_;
  fVar188 = auVar164._12_4_;
  fVar240 = auVar151._0_4_;
  fVar192 = auVar151._4_4_;
  fVar223 = auVar151._8_4_;
  fVar241 = auVar151._12_4_;
  fVar215 = auVar129._0_4_;
  fVar238 = auVar129._4_4_;
  fVar190 = auVar129._8_4_;
  fVar219 = auVar129._12_4_;
  auVar245._0_4_ = fVar215 * auVar178._0_4_ + fVar240 * auVar166._0_4_ + fVar173 * auVar208._0_4_;
  auVar245._4_4_ = fVar238 * auVar178._4_4_ + fVar192 * auVar166._4_4_ + fVar198 * auVar208._4_4_;
  auVar245._8_4_ = fVar190 * auVar178._8_4_ + fVar223 * auVar166._8_4_ + fVar228 * auVar208._8_4_;
  auVar245._12_4_ =
       fVar219 * auVar178._12_4_ + fVar241 * auVar166._12_4_ + fVar188 * auVar208._12_4_;
  auVar129._0_4_ = fVar215 * auVar179._0_4_ + auVar18._0_4_ * fVar173 + fVar240 * auVar17._0_4_;
  auVar129._4_4_ = fVar238 * auVar179._4_4_ + auVar18._4_4_ * fVar198 + fVar192 * auVar17._4_4_;
  auVar129._8_4_ = fVar190 * auVar179._8_4_ + auVar18._8_4_ * fVar228 + fVar223 * auVar17._8_4_;
  auVar129._12_4_ = fVar219 * auVar179._12_4_ + auVar18._12_4_ * fVar188 + fVar241 * auVar17._12_4_;
  auVar265._8_4_ = 0x7fffffff;
  auVar265._0_8_ = 0x7fffffff7fffffff;
  auVar265._12_4_ = 0x7fffffff;
  auVar178 = vandps_avx(auVar305,auVar265);
  auVar202._8_4_ = 0x219392ef;
  auVar202._0_8_ = 0x219392ef219392ef;
  auVar202._12_4_ = 0x219392ef;
  auVar178 = vcmpps_avx(auVar178,auVar202,1);
  auVar166 = vblendvps_avx(auVar305,auVar202,auVar178);
  auVar178 = vandps_avx(auVar317,auVar265);
  auVar178 = vcmpps_avx(auVar178,auVar202,1);
  auVar208 = vblendvps_avx(auVar317,auVar202,auVar178);
  auVar178 = vandps_avx(auVar265,auVar231);
  auVar178 = vcmpps_avx(auVar178,auVar202,1);
  auVar178 = vblendvps_avx(auVar231,auVar202,auVar178);
  auVar151._0_4_ = fVar215 * auVar130._0_4_ + fVar240 * auVar131._0_4_ + auVar152._0_4_ * fVar173;
  auVar151._4_4_ = fVar238 * auVar130._4_4_ + fVar192 * auVar131._4_4_ + auVar152._4_4_ * fVar198;
  auVar151._8_4_ = fVar190 * auVar130._8_4_ + fVar223 * auVar131._8_4_ + auVar152._8_4_ * fVar228;
  auVar151._12_4_ =
       fVar219 * auVar130._12_4_ + fVar241 * auVar131._12_4_ + auVar152._12_4_ * fVar188;
  auVar179 = vrcpps_avx(auVar166);
  fVar173 = auVar179._0_4_;
  auVar175._0_4_ = fVar173 * auVar166._0_4_;
  fVar188 = auVar179._4_4_;
  auVar175._4_4_ = fVar188 * auVar166._4_4_;
  fVar190 = auVar179._8_4_;
  auVar175._8_4_ = fVar190 * auVar166._8_4_;
  fVar192 = auVar179._12_4_;
  auVar175._12_4_ = fVar192 * auVar166._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = &DAT_3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar166 = vsubps_avx(auVar266,auVar175);
  fVar173 = fVar173 + fVar173 * auVar166._0_4_;
  fVar188 = fVar188 + fVar188 * auVar166._4_4_;
  fVar190 = fVar190 + fVar190 * auVar166._8_4_;
  fVar192 = fVar192 + fVar192 * auVar166._12_4_;
  auVar166 = vrcpps_avx(auVar208);
  fVar198 = auVar166._0_4_;
  auVar203._0_4_ = fVar198 * auVar208._0_4_;
  fVar215 = auVar166._4_4_;
  auVar203._4_4_ = fVar215 * auVar208._4_4_;
  fVar219 = auVar166._8_4_;
  auVar203._8_4_ = fVar219 * auVar208._8_4_;
  fVar223 = auVar166._12_4_;
  auVar203._12_4_ = fVar223 * auVar208._12_4_;
  auVar166 = vsubps_avx(auVar266,auVar203);
  fVar198 = fVar198 + fVar198 * auVar166._0_4_;
  fVar215 = fVar215 + fVar215 * auVar166._4_4_;
  fVar219 = fVar219 + fVar219 * auVar166._8_4_;
  fVar223 = fVar223 + fVar223 * auVar166._12_4_;
  auVar166 = vrcpps_avx(auVar178);
  fVar228 = auVar166._0_4_;
  auVar232._0_4_ = fVar228 * auVar178._0_4_;
  fVar238 = auVar166._4_4_;
  auVar232._4_4_ = fVar238 * auVar178._4_4_;
  fVar240 = auVar166._8_4_;
  auVar232._8_4_ = fVar240 * auVar178._8_4_;
  fVar241 = auVar166._12_4_;
  auVar232._12_4_ = fVar241 * auVar178._12_4_;
  auVar166 = vsubps_avx(auVar266,auVar232);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar121 * 7 + 6);
  auVar178 = vpmovsxwd_avx(auVar178);
  fVar228 = fVar228 + fVar228 * auVar166._0_4_;
  fVar238 = fVar238 + fVar238 * auVar166._4_4_;
  fVar240 = fVar240 + fVar240 * auVar166._8_4_;
  fVar241 = fVar241 + fVar241 * auVar166._12_4_;
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar245);
  auVar164._0_4_ = fVar173 * auVar178._0_4_;
  auVar164._4_4_ = fVar188 * auVar178._4_4_;
  auVar164._8_4_ = fVar190 * auVar178._8_4_;
  auVar164._12_4_ = fVar192 * auVar178._12_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar121 * 9 + 6);
  auVar178 = vpmovsxwd_avx(auVar166);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar245);
  auVar176._0_4_ = fVar173 * auVar178._0_4_;
  auVar176._4_4_ = fVar188 * auVar178._4_4_;
  auVar176._8_4_ = fVar190 * auVar178._8_4_;
  auVar176._12_4_ = fVar192 * auVar178._12_4_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar166 = vpmovsxwd_avx(auVar208);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar121 * -2 + 6);
  auVar178 = vpmovsxwd_avx(auVar179);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar129);
  auVar267._0_4_ = auVar178._0_4_ * fVar198;
  auVar267._4_4_ = auVar178._4_4_ * fVar215;
  auVar267._8_4_ = auVar178._8_4_ * fVar219;
  auVar267._12_4_ = auVar178._12_4_ * fVar223;
  auVar271 = ZEXT1664(auVar267);
  auVar178 = vcvtdq2ps_avx(auVar166);
  auVar178 = vsubps_avx(auVar178,auVar129);
  auVar130._0_4_ = fVar198 * auVar178._0_4_;
  auVar130._4_4_ = fVar215 * auVar178._4_4_;
  auVar130._8_4_ = fVar219 * auVar178._8_4_;
  auVar130._12_4_ = fVar223 * auVar178._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar124 + uVar121 + 6);
  auVar178 = vpmovsxwd_avx(auVar17);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar151);
  auVar204._0_4_ = auVar178._0_4_ * fVar228;
  auVar204._4_4_ = auVar178._4_4_ * fVar238;
  auVar204._8_4_ = auVar178._8_4_ * fVar240;
  auVar204._12_4_ = auVar178._12_4_ * fVar241;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar121 * 0x17 + 6);
  auVar178 = vpmovsxwd_avx(auVar18);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar151);
  auVar152._0_4_ = auVar178._0_4_ * fVar228;
  auVar152._4_4_ = auVar178._4_4_ * fVar238;
  auVar152._8_4_ = auVar178._8_4_ * fVar240;
  auVar152._12_4_ = auVar178._12_4_ * fVar241;
  auVar178 = vpminsd_avx(auVar164,auVar176);
  auVar166 = vpminsd_avx(auVar267,auVar130);
  auVar178 = vmaxps_avx(auVar178,auVar166);
  auVar166 = vpminsd_avx(auVar204,auVar152);
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar277._4_4_ = uVar7;
  auVar277._0_4_ = uVar7;
  auVar277._8_4_ = uVar7;
  auVar277._12_4_ = uVar7;
  auVar166 = vmaxps_avx(auVar166,auVar277);
  auVar178 = vmaxps_avx(auVar178,auVar166);
  local_330._0_4_ = auVar178._0_4_ * 0.99999964;
  local_330._4_4_ = auVar178._4_4_ * 0.99999964;
  local_330._8_4_ = auVar178._8_4_ * 0.99999964;
  local_330._12_4_ = auVar178._12_4_ * 0.99999964;
  auVar178 = vpmaxsd_avx(auVar164,auVar176);
  auVar166 = vpmaxsd_avx(auVar267,auVar130);
  auVar178 = vminps_avx(auVar178,auVar166);
  auVar166 = vpmaxsd_avx(auVar204,auVar152);
  fVar173 = ray->tfar;
  auVar165._4_4_ = fVar173;
  auVar165._0_4_ = fVar173;
  auVar165._8_4_ = fVar173;
  auVar165._12_4_ = fVar173;
  auVar166 = vminps_avx(auVar166,auVar165);
  auVar178 = vminps_avx(auVar178,auVar166);
  auVar131._0_4_ = auVar178._0_4_ * 1.0000004;
  auVar131._4_4_ = auVar178._4_4_ * 1.0000004;
  auVar131._8_4_ = auVar178._8_4_ * 1.0000004;
  auVar131._12_4_ = auVar178._12_4_ * 1.0000004;
  auVar178 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar166 = vpcmpgtd_avx(auVar178,_DAT_01ff0cf0);
  auVar178 = vcmpps_avx(local_330,auVar131,2);
  auVar178 = vandps_avx(auVar178,auVar166);
  uVar120 = vmovmskps_avx(auVar178);
  bVar125 = uVar120 != 0;
  if (bVar125) {
    uVar120 = uVar120 & 0xff;
    local_4e0 = mm_lookupmask_ps._16_8_;
    uStack_4d8 = mm_lookupmask_ps._24_8_;
    uStack_4d0 = mm_lookupmask_ps._16_8_;
    uStack_4c8 = mm_lookupmask_ps._24_8_;
    pPVar123 = prim;
    do {
      auVar9 = local_760;
      uVar124 = (ulong)uVar120;
      auVar268 = auVar271._0_32_;
      lVar117 = 0;
      if (uVar124 != 0) {
        for (; (uVar120 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
        }
      }
      uVar124 = uVar124 - 1 & uVar124;
      local_7e4 = *(undefined4 *)(pPVar123 + lVar117 * 4 + 6);
      lVar117 = lVar117 * 0x40;
      lVar122 = 0;
      if (uVar124 != 0) {
        for (; (uVar124 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
        }
      }
      local_768 = (ulong)*(uint *)(pPVar123 + 2);
      pGVar11 = (context->scene->geometries).items[*(uint *)(pPVar123 + 2)].ptr;
      _local_7e0 = *(undefined1 (*) [16])(prim + lVar117 + lVar99 + 0x16);
      if (((uVar124 != 0) && (uVar121 = uVar124 - 1 & uVar124, uVar121 != 0)) &&
         (lVar122 = 0, uVar121 != 0)) {
        for (; (uVar121 >> lVar122 & 1) == 0; lVar122 = lVar122 + 1) {
        }
      }
      local_450 = *(undefined1 (*) [16])(prim + lVar117 + lVar99 + 0x26);
      local_460 = *(undefined1 (*) [16])(prim + lVar117 + lVar99 + 0x36);
      local_470 = *(undefined1 (*) [16])(prim + lVar117 + lVar99 + 0x46);
      uVar120 = (uint)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar208 = vsubps_avx(_local_7e0,(undefined1  [16])aVar8);
      auVar130 = _local_7e0;
      auVar178 = vshufps_avx(auVar208,auVar208,0);
      auVar166 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      fVar173 = (pre->ray_space).vx.field_0.m128[0];
      fVar198 = (pre->ray_space).vx.field_0.m128[1];
      fVar228 = (pre->ray_space).vx.field_0.m128[2];
      fVar188 = (pre->ray_space).vx.field_0.m128[3];
      fVar215 = (pre->ray_space).vy.field_0.m128[0];
      fVar238 = (pre->ray_space).vy.field_0.m128[1];
      fVar190 = (pre->ray_space).vy.field_0.m128[2];
      fVar219 = (pre->ray_space).vy.field_0.m128[3];
      fVar240 = (pre->ray_space).vz.field_0.m128[0];
      fVar192 = (pre->ray_space).vz.field_0.m128[1];
      fVar223 = (pre->ray_space).vz.field_0.m128[2];
      fVar241 = (pre->ray_space).vz.field_0.m128[3];
      auVar205._0_4_ =
           auVar178._0_4_ * fVar173 + auVar208._0_4_ * fVar240 + auVar166._0_4_ * fVar215;
      auVar205._4_4_ =
           auVar178._4_4_ * fVar198 + auVar208._4_4_ * fVar192 + auVar166._4_4_ * fVar238;
      auVar205._8_4_ =
           auVar178._8_4_ * fVar228 + auVar208._8_4_ * fVar223 + auVar166._8_4_ * fVar190;
      auVar205._12_4_ =
           auVar178._12_4_ * fVar188 + auVar208._12_4_ * fVar241 + auVar166._12_4_ * fVar219;
      auVar178 = vblendps_avx(auVar205,_local_7e0,8);
      auVar179 = vsubps_avx(local_450,(undefined1  [16])aVar8);
      auVar166 = vshufps_avx(auVar179,auVar179,0);
      auVar208 = vshufps_avx(auVar179,auVar179,0x55);
      auVar179 = vshufps_avx(auVar179,auVar179,0xaa);
      auVar206._0_8_ =
           CONCAT44(auVar166._4_4_ * fVar198 + auVar208._4_4_ * fVar238 + auVar179._4_4_ * fVar192,
                    auVar166._0_4_ * fVar173 + auVar208._0_4_ * fVar215 + auVar179._0_4_ * fVar240);
      auVar206._8_4_ =
           auVar166._8_4_ * fVar228 + auVar208._8_4_ * fVar190 + auVar179._8_4_ * fVar223;
      auVar206._12_4_ =
           auVar166._12_4_ * fVar188 + auVar208._12_4_ * fVar219 + auVar179._12_4_ * fVar241;
      auVar166 = vblendps_avx(auVar206,local_450,8);
      auVar17 = vsubps_avx(local_460,(undefined1  [16])aVar8);
      auVar208 = vshufps_avx(auVar17,auVar17,0);
      auVar179 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar207._0_4_ = auVar208._0_4_ * fVar173 + auVar179._0_4_ * fVar215 + auVar17._0_4_ * fVar240
      ;
      auVar207._4_4_ = auVar208._4_4_ * fVar198 + auVar179._4_4_ * fVar238 + auVar17._4_4_ * fVar192
      ;
      auVar207._8_4_ = auVar208._8_4_ * fVar228 + auVar179._8_4_ * fVar190 + auVar17._8_4_ * fVar223
      ;
      auVar207._12_4_ =
           auVar208._12_4_ * fVar188 + auVar179._12_4_ * fVar219 + auVar17._12_4_ * fVar241;
      auVar208 = vblendps_avx(auVar207,local_460,8);
      auVar18 = vsubps_avx(local_470,(undefined1  [16])aVar8);
      auVar179 = vshufps_avx(auVar18,auVar18,0);
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar246._0_4_ = auVar179._0_4_ * fVar173 + auVar18._0_4_ * fVar240 + auVar17._0_4_ * fVar215;
      auVar246._4_4_ = auVar179._4_4_ * fVar198 + auVar18._4_4_ * fVar192 + auVar17._4_4_ * fVar238;
      auVar246._8_4_ = auVar179._8_4_ * fVar228 + auVar18._8_4_ * fVar223 + auVar17._8_4_ * fVar190;
      auVar246._12_4_ =
           auVar179._12_4_ * fVar188 + auVar18._12_4_ * fVar241 + auVar17._12_4_ * fVar219;
      auVar179 = vblendps_avx(auVar246,local_470,8);
      auVar177._8_4_ = 0x7fffffff;
      auVar177._0_8_ = 0x7fffffff7fffffff;
      auVar177._12_4_ = 0x7fffffff;
      auVar178 = vandps_avx(auVar178,auVar177);
      auVar166 = vandps_avx(auVar166,auVar177);
      auVar17 = vmaxps_avx(auVar178,auVar166);
      auVar178 = vandps_avx(auVar208,auVar177);
      auVar166 = vandps_avx(auVar179,auVar177);
      auVar178 = vmaxps_avx(auVar178,auVar166);
      auVar178 = vmaxps_avx(auVar17,auVar178);
      auVar166 = vmovshdup_avx(auVar178);
      auVar166 = vmaxss_avx(auVar166,auVar178);
      auVar178 = vshufpd_avx(auVar178,auVar178,1);
      auVar178 = vmaxss_avx(auVar178,auVar166);
      local_760._0_4_ = auVar178._0_4_;
      lVar117 = (long)(int)uVar120 * 0x44;
      fVar293 = *(float *)(bspline_basis0 + lVar117 + 0x908);
      fVar314 = *(float *)(bspline_basis0 + lVar117 + 0x90c);
      fVar172 = *(float *)(bspline_basis0 + lVar117 + 0x910);
      fVar148 = *(float *)(bspline_basis0 + lVar117 + 0x914);
      fVar193 = *(float *)(bspline_basis0 + lVar117 + 0x918);
      fVar297 = *(float *)(bspline_basis0 + lVar117 + 0x91c);
      fVar196 = *(float *)(bspline_basis0 + lVar117 + 0x920);
      auVar166 = vshufps_avx(auVar207,auVar207,0);
      register0x00001250 = auVar166;
      _local_540 = auVar166;
      auVar208 = vshufps_avx(auVar207,auVar207,0x55);
      register0x00001310 = auVar208;
      _local_700 = auVar208;
      fVar299 = *(float *)(bspline_basis0 + lVar117 + 0xd8c);
      fVar242 = *(float *)(bspline_basis0 + lVar117 + 0xd90);
      fVar300 = *(float *)(bspline_basis0 + lVar117 + 0xd94);
      fVar146 = *(float *)(bspline_basis0 + lVar117 + 0xd98);
      fVar301 = *(float *)(bspline_basis0 + lVar117 + 0xd9c);
      fVar243 = *(float *)(bspline_basis0 + lVar117 + 0xda0);
      fVar303 = *(float *)(bspline_basis0 + lVar117 + 0xda4);
      auVar179 = vshufps_avx(auVar246,auVar246,0);
      register0x00001550 = auVar179;
      _local_420 = auVar179;
      auVar17 = vshufps_avx(auVar246,auVar246,0x55);
      register0x00001390 = auVar17;
      _local_6e0 = auVar17;
      fVar315 = auVar179._0_4_;
      fVar321 = auVar179._4_4_;
      fVar323 = auVar179._8_4_;
      fVar325 = auVar179._12_4_;
      fVar149 = auVar166._0_4_;
      fVar159 = auVar166._4_4_;
      fVar160 = auVar166._8_4_;
      fVar161 = auVar166._12_4_;
      fVar244 = auVar17._0_4_;
      fVar251 = auVar17._4_4_;
      fVar252 = auVar17._8_4_;
      fVar253 = auVar17._12_4_;
      fVar199 = auVar208._0_4_;
      fVar216 = auVar208._4_4_;
      fVar220 = auVar208._8_4_;
      fVar224 = auVar208._12_4_;
      auVar18 = local_460;
      auVar166 = vshufps_avx(local_460,local_460,0xff);
      register0x00001490 = auVar166;
      _local_80 = auVar166;
      auVar17 = local_470;
      auVar208 = vshufps_avx(local_470,local_470,0xff);
      register0x00001410 = auVar208;
      _local_100 = auVar208;
      fVar163 = auVar208._0_4_;
      fVar254 = auVar208._4_4_;
      fVar260 = auVar208._8_4_;
      fVar261 = auVar208._12_4_;
      fVar282 = auVar166._0_4_;
      fVar283 = auVar166._4_4_;
      fVar284 = auVar166._8_4_;
      auVar103._8_4_ = auVar206._8_4_;
      auVar103._0_8_ = auVar206._0_8_;
      auVar103._12_4_ = auVar206._12_4_;
      auVar208 = vshufps_avx(auVar103,auVar103,0);
      register0x000014d0 = auVar208;
      _local_620 = auVar208;
      pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar117 + 0x484);
      fVar173 = *(float *)*pauVar2;
      fVar198 = *(float *)(bspline_basis0 + lVar117 + 0x488);
      fVar228 = *(float *)(bspline_basis0 + lVar117 + 0x48c);
      fVar188 = *(float *)(bspline_basis0 + lVar117 + 0x490);
      fVar215 = *(float *)(bspline_basis0 + lVar117 + 0x494);
      fVar238 = *(float *)(bspline_basis0 + lVar117 + 0x498);
      fVar190 = *(float *)(bspline_basis0 + lVar117 + 0x49c);
      auVar112 = *(undefined1 (*) [28])*pauVar2;
      fVar285 = auVar208._0_4_;
      fVar286 = auVar208._4_4_;
      fVar287 = auVar208._8_4_;
      fVar298 = auVar208._12_4_;
      auVar208 = vshufps_avx(auVar103,auVar103,0x55);
      register0x000015d0 = auVar208;
      _local_740 = auVar208;
      fVar338 = auVar208._0_4_;
      fVar341 = auVar208._4_4_;
      fVar342 = auVar208._8_4_;
      fVar343 = auVar208._12_4_;
      auVar131 = local_450;
      auVar208 = vshufps_avx(local_450,local_450,0xff);
      register0x00001590 = auVar208;
      _local_120 = auVar208;
      _local_3a0 = *pauVar2;
      auVar27 = _local_3a0;
      fVar327 = auVar208._0_4_;
      fVar331 = auVar208._4_4_;
      fVar333 = auVar208._8_4_;
      fVar335 = auVar208._12_4_;
      auVar208 = vshufps_avx(auVar205,auVar205,0);
      register0x00001350 = auVar208;
      _local_e0 = auVar208;
      pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar117);
      fVar219 = *(float *)*pauVar2;
      fVar240 = *(float *)(bspline_basis0 + lVar117 + 4);
      fVar192 = *(float *)(bspline_basis0 + lVar117 + 8);
      fVar223 = *(float *)(bspline_basis0 + lVar117 + 0xc);
      fVar241 = *(float *)(bspline_basis0 + lVar117 + 0x10);
      fVar171 = *(float *)(bspline_basis0 + lVar117 + 0x14);
      fVar337 = *(float *)(bspline_basis0 + lVar117 + 0x18);
      auVar113 = *(undefined1 (*) [28])*pauVar2;
      fVar229 = auVar208._0_4_;
      fVar239 = auVar208._4_4_;
      fVar128 = auVar208._8_4_;
      fVar227 = auVar208._12_4_;
      auVar306._0_4_ = fVar229 * fVar219 + fVar285 * fVar173 + fVar149 * fVar293 + fVar315 * fVar299
      ;
      auVar306._4_4_ = fVar239 * fVar240 + fVar286 * fVar198 + fVar159 * fVar314 + fVar321 * fVar242
      ;
      auVar306._8_4_ = fVar128 * fVar192 + fVar287 * fVar228 + fVar160 * fVar172 + fVar323 * fVar300
      ;
      auVar306._12_4_ =
           fVar227 * fVar223 + fVar298 * fVar188 + fVar161 * fVar148 + fVar325 * fVar146;
      auVar306._16_4_ =
           fVar229 * fVar241 + fVar285 * fVar215 + fVar149 * fVar193 + fVar315 * fVar301;
      auVar306._20_4_ =
           fVar239 * fVar171 + fVar286 * fVar238 + fVar159 * fVar297 + fVar321 * fVar243;
      auVar306._24_4_ =
           fVar128 * fVar337 + fVar287 * fVar190 + fVar160 * fVar196 + fVar323 * fVar303;
      auVar306._28_4_ = fVar161 + 0.0 + 0.0 + 0.0;
      auVar208 = vshufps_avx(auVar205,auVar205,0x55);
      register0x00001310 = auVar208;
      _local_360 = auVar208;
      fVar200 = auVar208._0_4_;
      fVar217 = auVar208._4_4_;
      fVar221 = auVar208._8_4_;
      fVar225 = auVar208._12_4_;
      auVar247._0_4_ = fVar200 * fVar219 + fVar338 * fVar173 + fVar199 * fVar293 + fVar244 * fVar299
      ;
      auVar247._4_4_ = fVar217 * fVar240 + fVar341 * fVar198 + fVar216 * fVar314 + fVar251 * fVar242
      ;
      auVar247._8_4_ = fVar221 * fVar192 + fVar342 * fVar228 + fVar220 * fVar172 + fVar252 * fVar300
      ;
      auVar247._12_4_ =
           fVar225 * fVar223 + fVar343 * fVar188 + fVar224 * fVar148 + fVar253 * fVar146;
      auVar247._16_4_ =
           fVar200 * fVar241 + fVar338 * fVar215 + fVar199 * fVar193 + fVar244 * fVar301;
      auVar247._20_4_ =
           fVar217 * fVar171 + fVar341 * fVar238 + fVar216 * fVar297 + fVar251 * fVar243;
      auVar247._24_4_ =
           fVar221 * fVar337 + fVar342 * fVar190 + fVar220 * fVar196 + fVar252 * fVar303;
      auVar247._28_4_ = fVar161 + 0.0 + 0.0 + 0.0;
      auVar208 = vpermilps_avx(_local_7e0,0xff);
      register0x00001450 = auVar208;
      _local_140 = auVar208;
      _local_3c0 = *pauVar2;
      auVar26 = _local_3c0;
      fVar262 = auVar208._0_4_;
      fVar263 = auVar208._4_4_;
      fVar276 = auVar208._8_4_;
      fVar126 = fVar262 * fVar219 + fVar327 * fVar173 + fVar282 * fVar293 + fVar163 * fVar299;
      fStack_63c = fVar263 * fVar240 + fVar331 * fVar198 + fVar283 * fVar314 + fVar254 * fVar242;
      fStack_638 = fVar276 * fVar192 + fVar333 * fVar228 + fVar284 * fVar172 + fVar260 * fVar300;
      fStack_634 = auVar208._12_4_ * fVar223 +
                   fVar335 * fVar188 + auVar166._12_4_ * fVar148 + fVar261 * fVar146;
      fStack_630 = fVar262 * fVar241 + fVar327 * fVar215 + fVar282 * fVar193 + fVar163 * fVar301;
      fStack_62c = fVar263 * fVar171 + fVar331 * fVar238 + fVar283 * fVar297 + fVar254 * fVar243;
      fStack_628 = fVar276 * fVar337 + fVar333 * fVar190 + fVar284 * fVar196 + fVar260 * fVar303;
      fStack_624 = *(float *)(bspline_basis0 + lVar117 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar302 = *(float *)(bspline_basis1 + lVar117 + 0x908);
      fVar194 = *(float *)(bspline_basis1 + lVar117 + 0x90c);
      fVar294 = *(float *)(bspline_basis1 + lVar117 + 0x910);
      fVar272 = *(float *)(bspline_basis1 + lVar117 + 0x914);
      fVar273 = *(float *)(bspline_basis1 + lVar117 + 0x918);
      fVar195 = *(float *)(bspline_basis1 + lVar117 + 0x91c);
      fVar295 = *(float *)(bspline_basis1 + lVar117 + 0x920);
      fVar173 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar117 + 0xd8c);
      fVar198 = *(float *)(bspline_basis1 + lVar117 + 0xd90);
      fVar228 = *(float *)(bspline_basis1 + lVar117 + 0xd94);
      fVar188 = *(float *)(bspline_basis1 + lVar117 + 0xd98);
      fVar215 = *(float *)(bspline_basis1 + lVar117 + 0xd9c);
      fVar238 = *(float *)(bspline_basis1 + lVar117 + 0xda0);
      fVar190 = *(float *)(bspline_basis1 + lVar117 + 0xda4);
      auVar114 = *(undefined1 (*) [28])(bspline_basis1 + lVar117 + 0xd8c);
      fVar274 = *(float *)(bspline_basis1 + lVar117 + 0x484);
      fVar275 = *(float *)(bspline_basis1 + lVar117 + 0x488);
      fVar197 = *(float *)(bspline_basis1 + lVar117 + 0x48c);
      fVar162 = *(float *)(bspline_basis1 + lVar117 + 0x490);
      fVar127 = *(float *)(bspline_basis1 + lVar117 + 0x494);
      fVar141 = *(float *)(bspline_basis1 + lVar117 + 0x498);
      fVar142 = *(float *)(bspline_basis1 + lVar117 + 0x49c);
      fVar219 = fVar325 + 0.0;
      fVar143 = *(float *)(bspline_basis1 + lVar117);
      fVar144 = *(float *)(bspline_basis1 + lVar117 + 4);
      fVar145 = *(float *)(bspline_basis1 + lVar117 + 8);
      fVar147 = *(float *)(bspline_basis1 + lVar117 + 0xc);
      fVar174 = *(float *)(bspline_basis1 + lVar117 + 0x10);
      fVar189 = *(float *)(bspline_basis1 + lVar117 + 0x14);
      fVar191 = *(float *)(bspline_basis1 + lVar117 + 0x18);
      auVar209._0_4_ = fVar229 * fVar143 + fVar285 * fVar274 + fVar302 * fVar149 + fVar315 * fVar173
      ;
      auVar209._4_4_ = fVar239 * fVar144 + fVar286 * fVar275 + fVar194 * fVar159 + fVar321 * fVar198
      ;
      auVar209._8_4_ = fVar128 * fVar145 + fVar287 * fVar197 + fVar294 * fVar160 + fVar323 * fVar228
      ;
      auVar209._12_4_ =
           fVar227 * fVar147 + fVar298 * fVar162 + fVar272 * fVar161 + fVar325 * fVar188;
      auVar209._16_4_ =
           fVar229 * fVar174 + fVar285 * fVar127 + fVar273 * fVar149 + fVar315 * fVar215;
      auVar209._20_4_ =
           fVar239 * fVar189 + fVar286 * fVar141 + fVar195 * fVar159 + fVar321 * fVar238;
      auVar209._24_4_ =
           fVar128 * fVar191 + fVar287 * fVar142 + fVar295 * fVar160 + fVar323 * fVar190;
      auVar209._28_4_ = fVar335 + fVar219;
      auVar182._0_4_ = fVar143 * fVar200 + fVar338 * fVar274 + fVar302 * fVar199 + fVar173 * fVar244
      ;
      auVar182._4_4_ = fVar144 * fVar217 + fVar341 * fVar275 + fVar194 * fVar216 + fVar198 * fVar251
      ;
      auVar182._8_4_ = fVar145 * fVar221 + fVar342 * fVar197 + fVar294 * fVar220 + fVar228 * fVar252
      ;
      auVar182._12_4_ =
           fVar147 * fVar225 + fVar343 * fVar162 + fVar272 * fVar224 + fVar188 * fVar253;
      auVar182._16_4_ =
           fVar174 * fVar200 + fVar338 * fVar127 + fVar273 * fVar199 + fVar215 * fVar244;
      auVar182._20_4_ =
           fVar189 * fVar217 + fVar341 * fVar141 + fVar195 * fVar216 + fVar238 * fVar251;
      auVar182._24_4_ =
           fVar191 * fVar221 + fVar342 * fVar142 + fVar295 * fVar220 + fVar190 * fVar252;
      auVar182._28_4_ = fVar219 + fVar325 + 0.0;
      auVar296._0_4_ = fVar327 * fVar274 + fVar282 * fVar302 + fVar163 * fVar173 + fVar262 * fVar143
      ;
      auVar296._4_4_ = fVar331 * fVar275 + fVar283 * fVar194 + fVar254 * fVar198 + fVar263 * fVar144
      ;
      auVar296._8_4_ = fVar333 * fVar197 + fVar284 * fVar294 + fVar260 * fVar228 + fVar276 * fVar145
      ;
      auVar296._12_4_ =
           fVar335 * fVar162 + auVar166._12_4_ * fVar272 + fVar261 * fVar188 +
           auVar208._12_4_ * fVar147;
      auVar296._16_4_ =
           fVar327 * fVar127 + fVar282 * fVar273 + fVar163 * fVar215 + fVar262 * fVar174;
      auVar296._20_4_ =
           fVar331 * fVar141 + fVar283 * fVar195 + fVar254 * fVar238 + fVar263 * fVar189;
      auVar296._24_4_ =
           fVar333 * fVar142 + fVar284 * fVar295 + fVar260 * fVar190 + fVar276 * fVar191;
      auVar296._28_4_ = fVar325 + fVar261 + 0.0 + fVar219;
      auVar19 = vsubps_avx(auVar209,auVar306);
      local_380 = vsubps_avx(auVar182,auVar247);
      fVar173 = auVar19._0_4_;
      fVar228 = auVar19._4_4_;
      auVar15._4_4_ = auVar247._4_4_ * fVar228;
      auVar15._0_4_ = auVar247._0_4_ * fVar173;
      fVar215 = auVar19._8_4_;
      auVar15._8_4_ = auVar247._8_4_ * fVar215;
      fVar190 = auVar19._12_4_;
      auVar15._12_4_ = auVar247._12_4_ * fVar190;
      fVar240 = auVar19._16_4_;
      auVar15._16_4_ = auVar247._16_4_ * fVar240;
      fVar223 = auVar19._20_4_;
      auVar15._20_4_ = auVar247._20_4_ * fVar223;
      fVar171 = auVar19._24_4_;
      auVar15._24_4_ = auVar247._24_4_ * fVar171;
      auVar15._28_4_ = fVar219;
      fVar198 = local_380._0_4_;
      fVar188 = local_380._4_4_;
      auVar20._4_4_ = auVar306._4_4_ * fVar188;
      auVar20._0_4_ = auVar306._0_4_ * fVar198;
      fVar238 = local_380._8_4_;
      auVar20._8_4_ = auVar306._8_4_ * fVar238;
      fVar219 = local_380._12_4_;
      auVar20._12_4_ = auVar306._12_4_ * fVar219;
      fVar192 = local_380._16_4_;
      auVar20._16_4_ = auVar306._16_4_ * fVar192;
      fVar241 = local_380._20_4_;
      auVar20._20_4_ = auVar306._20_4_ * fVar241;
      fVar337 = local_380._24_4_;
      auVar20._24_4_ = auVar306._24_4_ * fVar337;
      auVar20._28_4_ = auVar182._28_4_;
      auVar20 = vsubps_avx(auVar15,auVar20);
      auVar14 = local_380;
      auVar25._4_4_ = fStack_63c;
      auVar25._0_4_ = fVar126;
      auVar25._8_4_ = fStack_638;
      auVar25._12_4_ = fStack_634;
      auVar25._16_4_ = fStack_630;
      auVar25._20_4_ = fStack_62c;
      auVar25._24_4_ = fStack_628;
      auVar25._28_4_ = fStack_624;
      auVar15 = vmaxps_avx(auVar25,auVar296);
      auVar28._4_4_ = auVar15._4_4_ * auVar15._4_4_ * (fVar228 * fVar228 + fVar188 * fVar188);
      auVar28._0_4_ = auVar15._0_4_ * auVar15._0_4_ * (fVar173 * fVar173 + fVar198 * fVar198);
      auVar28._8_4_ = auVar15._8_4_ * auVar15._8_4_ * (fVar215 * fVar215 + fVar238 * fVar238);
      auVar28._12_4_ = auVar15._12_4_ * auVar15._12_4_ * (fVar190 * fVar190 + fVar219 * fVar219);
      auVar28._16_4_ = auVar15._16_4_ * auVar15._16_4_ * (fVar240 * fVar240 + fVar192 * fVar192);
      auVar28._20_4_ = auVar15._20_4_ * auVar15._20_4_ * (fVar223 * fVar223 + fVar241 * fVar241);
      auVar28._24_4_ = auVar15._24_4_ * auVar15._24_4_ * (fVar171 * fVar171 + fVar337 * fVar337);
      auVar28._28_4_ = auVar19._28_4_ + auVar182._28_4_;
      auVar16._4_4_ = auVar20._4_4_ * auVar20._4_4_;
      auVar16._0_4_ = auVar20._0_4_ * auVar20._0_4_;
      auVar16._8_4_ = auVar20._8_4_ * auVar20._8_4_;
      auVar16._12_4_ = auVar20._12_4_ * auVar20._12_4_;
      auVar16._16_4_ = auVar20._16_4_ * auVar20._16_4_;
      auVar16._20_4_ = auVar20._20_4_ * auVar20._20_4_;
      auVar16._24_4_ = auVar20._24_4_ * auVar20._24_4_;
      auVar16._28_4_ = auVar20._28_4_;
      auVar15 = vcmpps_avx(auVar16,auVar28,2);
      fVar173 = auVar178._0_4_ * 4.7683716e-07;
      auVar250 = ZEXT464((uint)fVar173);
      auVar178 = ZEXT416((uint)(float)(int)uVar120);
      _local_440 = auVar178;
      auVar178 = vshufps_avx(auVar178,auVar178,0);
      auVar183._16_16_ = auVar178;
      auVar183._0_16_ = auVar178;
      auVar20 = vcmpps_avx(_DAT_02020f40,auVar183,1);
      auVar187 = ZEXT3264(auVar20);
      auVar178 = vpermilps_avx(auVar205,0xaa);
      register0x00001510 = auVar178;
      _local_160 = auVar178;
      auVar104._8_4_ = auVar206._8_4_;
      auVar104._0_8_ = auVar206._0_8_;
      auVar104._12_4_ = auVar206._12_4_;
      auVar166 = vpermilps_avx(auVar104,0xaa);
      register0x00001550 = auVar166;
      _local_180 = auVar166;
      auVar208 = vpermilps_avx(auVar207,0xaa);
      register0x00001590 = auVar208;
      _local_a0 = auVar208;
      auVar179 = vpermilps_avx(auVar246,0xaa);
      register0x00001310 = auVar179;
      _local_4a0 = auVar179;
      auVar28 = auVar20 & auVar15;
      local_7c0 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      fStack_7bc = 0.0;
      fStack_7b8 = 0.0;
      fStack_7b4 = 0.0;
      auVar152 = ZEXT416((uint)fVar173);
      fVar188 = fVar244;
      fVar215 = fVar251;
      fVar238 = fVar252;
      fVar190 = fVar253;
      fVar173 = fVar338;
      fVar198 = fVar341;
      fVar228 = fVar342;
      fVar219 = fVar199;
      fVar240 = fVar216;
      fVar192 = fVar220;
      if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar28 >> 0x7f,0) == '\0') &&
            (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0xbf,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f])
      {
        uVar121 = 0;
        auVar271 = ZEXT3264(auVar268);
        auVar214 = ZEXT3264(_local_620);
        local_7f8 = context;
        local_7d0 = pPVar123;
        local_7f0 = ray;
      }
      else {
        auVar15 = vandps_avx(auVar15,auVar20);
        fVar304 = auVar178._0_4_;
        fVar311 = auVar178._4_4_;
        fVar312 = auVar178._8_4_;
        fVar313 = auVar178._12_4_;
        fVar316 = auVar166._0_4_;
        fVar322 = auVar166._4_4_;
        fVar324 = auVar166._8_4_;
        fVar326 = auVar166._12_4_;
        fVar328 = auVar208._0_4_;
        fVar332 = auVar208._4_4_;
        fVar334 = auVar208._8_4_;
        fVar336 = auVar208._12_4_;
        local_4c0._0_4_ = auVar114._0_4_;
        local_4c0._4_4_ = auVar114._4_4_;
        fStack_4b8 = auVar114._8_4_;
        fStack_4b4 = auVar114._12_4_;
        fStack_4b0 = auVar114._16_4_;
        fStack_4ac = auVar114._20_4_;
        fStack_4a8 = auVar114._24_4_;
        fVar201 = auVar179._0_4_;
        fVar218 = auVar179._4_4_;
        fVar222 = auVar179._8_4_;
        fVar226 = auVar179._12_4_;
        local_4c0._0_4_ =
             fVar304 * fVar143 +
             fVar316 * fVar274 + fVar328 * fVar302 + fVar201 * (float)local_4c0._0_4_;
        local_4c0._4_4_ =
             fVar311 * fVar144 +
             fVar322 * fVar275 + fVar332 * fVar194 + fVar218 * (float)local_4c0._4_4_;
        fStack_4b8 = fVar312 * fVar145 +
                     fVar324 * fVar197 + fVar334 * fVar294 + fVar222 * fStack_4b8;
        fStack_4b4 = fVar313 * fVar147 +
                     fVar326 * fVar162 + fVar336 * fVar272 + fVar226 * fStack_4b4;
        fStack_4b0 = fVar304 * fVar174 +
                     fVar316 * fVar127 + fVar328 * fVar273 + fVar201 * fStack_4b0;
        fStack_4ac = fVar311 * fVar189 +
                     fVar322 * fVar141 + fVar332 * fVar195 + fVar218 * fStack_4ac;
        fStack_4a8 = fVar312 * fVar191 +
                     fVar324 * fVar142 + fVar334 * fVar295 + fVar222 * fStack_4a8;
        fStack_4a4 = auVar15._28_4_ +
                     auVar20._28_4_ + *(float *)(bspline_basis1 + lVar117 + 0x924) + 0.0;
        local_3c0._0_4_ = auVar113._0_4_;
        local_3c0._4_4_ = auVar113._4_4_;
        fStack_3b8 = auVar113._8_4_;
        fStack_3b4 = auVar113._12_4_;
        fStack_3b0 = auVar113._16_4_;
        fStack_3ac = auVar113._20_4_;
        fStack_3a8 = auVar113._24_4_;
        local_3a0._0_4_ = auVar112._0_4_;
        local_3a0._4_4_ = auVar112._4_4_;
        fStack_398 = auVar112._8_4_;
        fStack_394 = auVar112._12_4_;
        fStack_390 = auVar112._16_4_;
        fStack_38c = auVar112._20_4_;
        fStack_388 = auVar112._24_4_;
        local_560 = fVar304 * (float)local_3c0._0_4_ +
                    fVar316 * (float)local_3a0._0_4_ + fVar328 * fVar293 + fVar201 * fVar299;
        fStack_55c = fVar311 * (float)local_3c0._4_4_ +
                     fVar322 * (float)local_3a0._4_4_ + fVar332 * fVar314 + fVar218 * fVar242;
        fStack_558 = fVar312 * fStack_3b8 +
                     fVar324 * fStack_398 + fVar334 * fVar172 + fVar222 * fVar300;
        fStack_554 = fVar313 * fStack_3b4 +
                     fVar326 * fStack_394 + fVar336 * fVar148 + fVar226 * fVar146;
        fStack_550 = fVar304 * fStack_3b0 +
                     fVar316 * fStack_390 + fVar328 * fVar193 + fVar201 * fVar301;
        fStack_54c = fVar311 * fStack_3ac +
                     fVar322 * fStack_38c + fVar332 * fVar297 + fVar218 * fVar243;
        fStack_548 = fVar312 * fStack_3a8 +
                     fVar324 * fStack_388 + fVar334 * fVar196 + fVar222 * fVar303;
        fStack_544 = fVar225 + fStack_4a4 + auVar15._28_4_ + auVar20._28_4_;
        fVar223 = *(float *)(bspline_basis0 + lVar117 + 0x1210);
        fVar241 = *(float *)(bspline_basis0 + lVar117 + 0x1214);
        fVar171 = *(float *)(bspline_basis0 + lVar117 + 0x1218);
        fVar337 = *(float *)(bspline_basis0 + lVar117 + 0x121c);
        fVar293 = *(float *)(bspline_basis0 + lVar117 + 0x1220);
        fVar314 = *(float *)(bspline_basis0 + lVar117 + 0x1224);
        fVar172 = *(float *)(bspline_basis0 + lVar117 + 0x1228);
        fVar148 = *(float *)(bspline_basis0 + lVar117 + 0x1694);
        fVar193 = *(float *)(bspline_basis0 + lVar117 + 0x1698);
        fVar297 = *(float *)(bspline_basis0 + lVar117 + 0x169c);
        fVar196 = *(float *)(bspline_basis0 + lVar117 + 0x16a0);
        fVar299 = *(float *)(bspline_basis0 + lVar117 + 0x16a4);
        fVar242 = *(float *)(bspline_basis0 + lVar117 + 0x16a8);
        fVar300 = *(float *)(bspline_basis0 + lVar117 + 0x16ac);
        fVar146 = *(float *)(bspline_basis0 + lVar117 + 0x1b18);
        fVar301 = *(float *)(bspline_basis0 + lVar117 + 0x1b1c);
        fVar243 = *(float *)(bspline_basis0 + lVar117 + 0x1b20);
        fVar303 = *(float *)(bspline_basis0 + lVar117 + 0x1b24);
        fVar302 = *(float *)(bspline_basis0 + lVar117 + 0x1b28);
        fVar194 = *(float *)(bspline_basis0 + lVar117 + 0x1b2c);
        fVar294 = *(float *)(bspline_basis0 + lVar117 + 0x1b30);
        fVar272 = *(float *)(bspline_basis0 + lVar117 + 0x1f9c);
        fVar273 = *(float *)(bspline_basis0 + lVar117 + 0x1fa0);
        fVar195 = *(float *)(bspline_basis0 + lVar117 + 0x1fa4);
        fVar295 = *(float *)(bspline_basis0 + lVar117 + 0x1fa8);
        fVar274 = *(float *)(bspline_basis0 + lVar117 + 0x1fac);
        fVar275 = *(float *)(bspline_basis0 + lVar117 + 0x1fb0);
        fVar197 = *(float *)(bspline_basis0 + lVar117 + 0x1fb4);
        local_760._16_16_ = auVar9._16_16_;
        local_760._0_16_ = auVar152;
        fVar264 = local_380._28_4_ + *(float *)(bspline_basis1 + lVar117 + 0x4a0);
        fVar162 = *(float *)(bspline_basis0 + lVar117 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar117 + 0x1fb8);
        fVar288 = *(float *)(bspline_basis0 + lVar117 + 0x16b0) + fVar162;
        auVar154._0_4_ =
             fVar200 * fVar223 + fVar199 * fVar146 + fVar244 * fVar272 + fVar338 * fVar148;
        auVar154._4_4_ =
             fVar217 * fVar241 + fVar216 * fVar301 + fVar251 * fVar273 + fVar341 * fVar193;
        auVar154._8_4_ =
             fVar221 * fVar171 + fVar220 * fVar243 + fVar252 * fVar195 + fVar342 * fVar297;
        auVar154._12_4_ =
             fVar225 * fVar337 + fVar224 * fVar303 + fVar253 * fVar295 + fVar343 * fVar196;
        auVar154._16_4_ =
             fVar200 * fVar293 + fVar199 * fVar302 + fVar244 * fVar274 + fVar338 * fVar299;
        auVar154._20_4_ =
             fVar217 * fVar314 + fVar216 * fVar194 + fVar251 * fVar275 + fVar341 * fVar242;
        auVar154._24_4_ =
             fVar221 * fVar172 + fVar220 * fVar294 + fVar252 * fVar197 + fVar342 * fVar300;
        auVar154._28_4_ =
             fVar162 + local_380._28_4_ + *(float *)(bspline_basis1 + lVar117 + 0x1c) + fVar264;
        auVar255._0_4_ =
             fVar316 * fVar148 + fVar328 * fVar146 + fVar201 * fVar272 + fVar304 * fVar223;
        auVar255._4_4_ =
             fVar322 * fVar193 + fVar332 * fVar301 + fVar218 * fVar273 + fVar311 * fVar241;
        auVar255._8_4_ =
             fVar324 * fVar297 + fVar334 * fVar243 + fVar222 * fVar195 + fVar312 * fVar171;
        auVar255._12_4_ =
             fVar326 * fVar196 + fVar336 * fVar303 + fVar226 * fVar295 + fVar313 * fVar337;
        auVar255._16_4_ =
             fVar316 * fVar299 + fVar328 * fVar302 + fVar201 * fVar274 + fVar304 * fVar293;
        auVar255._20_4_ =
             fVar322 * fVar242 + fVar332 * fVar194 + fVar218 * fVar275 + fVar311 * fVar314;
        auVar255._24_4_ =
             fVar324 * fVar300 + fVar334 * fVar294 + fVar222 * fVar197 + fVar312 * fVar172;
        auVar255._28_4_ = fVar288 + *(float *)(bspline_basis0 + lVar117 + 0x122c);
        fVar162 = *(float *)(bspline_basis1 + lVar117 + 0x1b18);
        fVar127 = *(float *)(bspline_basis1 + lVar117 + 0x1b1c);
        fVar141 = *(float *)(bspline_basis1 + lVar117 + 0x1b20);
        fVar142 = *(float *)(bspline_basis1 + lVar117 + 0x1b24);
        fVar143 = *(float *)(bspline_basis1 + lVar117 + 0x1b28);
        fVar144 = *(float *)(bspline_basis1 + lVar117 + 0x1b2c);
        fVar145 = *(float *)(bspline_basis1 + lVar117 + 0x1b30);
        fVar147 = *(float *)(bspline_basis1 + lVar117 + 0x1f9c);
        fVar174 = *(float *)(bspline_basis1 + lVar117 + 0x1fa0);
        fVar189 = *(float *)(bspline_basis1 + lVar117 + 0x1fa4);
        fVar191 = *(float *)(bspline_basis1 + lVar117 + 0x1fa8);
        fVar163 = *(float *)(bspline_basis1 + lVar117 + 0x1fac);
        fVar254 = *(float *)(bspline_basis1 + lVar117 + 0x1fb0);
        fVar260 = *(float *)(bspline_basis1 + lVar117 + 0x1fb4);
        fVar261 = *(float *)(bspline_basis1 + lVar117 + 0x1694);
        fVar262 = *(float *)(bspline_basis1 + lVar117 + 0x1698);
        fVar263 = *(float *)(bspline_basis1 + lVar117 + 0x169c);
        fVar276 = *(float *)(bspline_basis1 + lVar117 + 0x16a0);
        fVar282 = *(float *)(bspline_basis1 + lVar117 + 0x16a4);
        fVar283 = *(float *)(bspline_basis1 + lVar117 + 0x16a8);
        fVar284 = *(float *)(bspline_basis1 + lVar117 + 0x16ac);
        fVar327 = *(float *)(bspline_basis1 + lVar117 + 0x1210);
        fVar331 = *(float *)(bspline_basis1 + lVar117 + 0x1214);
        fVar333 = *(float *)(bspline_basis1 + lVar117 + 0x1218);
        fVar335 = *(float *)(bspline_basis1 + lVar117 + 0x121c);
        fVar100 = *(float *)(bspline_basis1 + lVar117 + 0x1220);
        fVar101 = *(float *)(bspline_basis1 + lVar117 + 0x1224);
        fVar102 = *(float *)(bspline_basis1 + lVar117 + 0x1228);
        auVar269._0_4_ =
             fVar229 * fVar327 + fVar285 * fVar261 + fVar149 * fVar162 + fVar315 * fVar147;
        auVar269._4_4_ =
             fVar239 * fVar331 + fVar286 * fVar262 + fVar159 * fVar127 + fVar321 * fVar174;
        auVar269._8_4_ =
             fVar128 * fVar333 + fVar287 * fVar263 + fVar160 * fVar141 + fVar323 * fVar189;
        auVar269._12_4_ =
             fVar227 * fVar335 + fVar298 * fVar276 + fVar161 * fVar142 + fVar325 * fVar191;
        auVar269._16_4_ =
             fVar229 * fVar100 + fVar285 * fVar282 + fVar149 * fVar143 + fVar315 * fVar163;
        auVar269._20_4_ =
             fVar239 * fVar101 + fVar286 * fVar283 + fVar159 * fVar144 + fVar321 * fVar254;
        auVar269._24_4_ =
             fVar128 * fVar102 + fVar287 * fVar284 + fVar160 * fVar145 + fVar323 * fVar260;
        auVar269._28_4_ = fVar224 + fVar224 + fVar288 + fVar325;
        auVar278._0_4_ =
             fVar200 * fVar327 + fVar338 * fVar261 + fVar199 * fVar162 + fVar244 * fVar147;
        auVar278._4_4_ =
             fVar217 * fVar331 + fVar341 * fVar262 + fVar216 * fVar127 + fVar251 * fVar174;
        auVar278._8_4_ =
             fVar221 * fVar333 + fVar342 * fVar263 + fVar220 * fVar141 + fVar252 * fVar189;
        auVar278._12_4_ =
             fVar225 * fVar335 + fVar343 * fVar276 + fVar224 * fVar142 + fVar253 * fVar191;
        auVar278._16_4_ =
             fVar200 * fVar100 + fVar338 * fVar282 + fVar199 * fVar143 + fVar244 * fVar163;
        auVar278._20_4_ =
             fVar217 * fVar101 + fVar341 * fVar283 + fVar216 * fVar144 + fVar251 * fVar254;
        auVar278._24_4_ =
             fVar221 * fVar102 + fVar342 * fVar284 + fVar220 * fVar145 + fVar252 * fVar260;
        auVar278._28_4_ = fVar224 + fVar224 + fVar224 + fVar288;
        auVar170._0_4_ =
             fVar304 * fVar327 + fVar316 * fVar261 + fVar328 * fVar162 + fVar147 * fVar201;
        auVar170._4_4_ =
             fVar311 * fVar331 + fVar322 * fVar262 + fVar332 * fVar127 + fVar174 * fVar218;
        auVar170._8_4_ =
             fVar312 * fVar333 + fVar324 * fVar263 + fVar334 * fVar141 + fVar189 * fVar222;
        auVar170._12_4_ =
             fVar313 * fVar335 + fVar326 * fVar276 + fVar336 * fVar142 + fVar191 * fVar226;
        auVar170._16_4_ =
             fVar304 * fVar100 + fVar316 * fVar282 + fVar328 * fVar143 + fVar163 * fVar201;
        auVar170._20_4_ =
             fVar311 * fVar101 + fVar322 * fVar283 + fVar332 * fVar144 + fVar254 * fVar218;
        auVar170._24_4_ =
             fVar312 * fVar102 + fVar324 * fVar284 + fVar334 * fVar145 + fVar260 * fVar222;
        auVar170._28_4_ =
             *(float *)(bspline_basis1 + lVar117 + 0x122c) +
             *(float *)(bspline_basis1 + lVar117 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar117 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar117 + 0x1fb8);
        auVar210._8_4_ = 0x7fffffff;
        auVar210._0_8_ = 0x7fffffff7fffffff;
        auVar210._12_4_ = 0x7fffffff;
        auVar210._16_4_ = 0x7fffffff;
        auVar210._20_4_ = 0x7fffffff;
        auVar210._24_4_ = 0x7fffffff;
        auVar210._28_4_ = 0x7fffffff;
        auVar107._4_4_ =
             fVar239 * fVar241 + fVar286 * fVar193 + fVar159 * fVar301 + fVar321 * fVar273;
        auVar107._0_4_ =
             fVar229 * fVar223 + fVar285 * fVar148 + fVar149 * fVar146 + fVar315 * fVar272;
        auVar107._8_4_ =
             fVar128 * fVar171 + fVar287 * fVar297 + fVar160 * fVar243 + fVar323 * fVar195;
        auVar107._12_4_ =
             fVar227 * fVar337 + fVar298 * fVar196 + fVar161 * fVar303 + fVar325 * fVar295;
        auVar107._16_4_ =
             fVar229 * fVar293 + fVar285 * fVar299 + fVar149 * fVar302 + fVar315 * fVar274;
        auVar107._20_4_ =
             fVar239 * fVar314 + fVar286 * fVar242 + fVar159 * fVar194 + fVar321 * fVar275;
        auVar107._24_4_ =
             fVar128 * fVar172 + fVar287 * fVar300 + fVar160 * fVar294 + fVar323 * fVar197;
        auVar107._28_4_ =
             *(float *)(bspline_basis0 + lVar117 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar117 + 0x1fb8) + fVar264;
        auVar9 = vandps_avx(auVar107,auVar210);
        auVar20 = vandps_avx(auVar154,auVar210);
        auVar20 = vmaxps_avx(auVar9,auVar20);
        auVar9 = vandps_avx(auVar255,auVar210);
        auVar9 = vmaxps_avx(auVar20,auVar9);
        auVar178 = vpermilps_avx(auVar152,0);
        auVar256._16_16_ = auVar178;
        auVar256._0_16_ = auVar178;
        auVar9 = vcmpps_avx(auVar9,auVar256,1);
        auVar28 = vblendvps_avx(auVar107,auVar19,auVar9);
        auVar16 = vblendvps_avx(auVar154,local_380,auVar9);
        auVar9 = vandps_avx(auVar269,auVar210);
        auVar20 = vandps_avx(auVar278,auVar210);
        auVar25 = vmaxps_avx(auVar9,auVar20);
        auVar9 = vandps_avx(auVar170,auVar210);
        auVar9 = vmaxps_avx(auVar25,auVar9);
        auVar25 = vcmpps_avx(auVar9,auVar256,1);
        auVar9 = vblendvps_avx(auVar269,auVar19,auVar25);
        auVar19 = vblendvps_avx(auVar278,local_380,auVar25);
        fVar127 = auVar28._0_4_;
        fVar141 = auVar28._4_4_;
        fVar142 = auVar28._8_4_;
        fVar143 = auVar28._12_4_;
        fVar144 = auVar28._16_4_;
        fVar145 = auVar28._20_4_;
        fVar147 = auVar28._24_4_;
        fVar174 = auVar9._0_4_;
        fVar189 = auVar9._4_4_;
        fVar191 = auVar9._8_4_;
        fVar149 = auVar9._12_4_;
        fVar159 = auVar9._16_4_;
        fVar160 = auVar9._20_4_;
        fVar161 = auVar9._24_4_;
        fStack_564 = -auVar9._28_4_;
        fVar223 = auVar16._0_4_;
        fVar293 = auVar16._4_4_;
        fVar193 = auVar16._8_4_;
        fVar242 = auVar16._12_4_;
        fVar243 = auVar16._16_4_;
        fVar294 = auVar16._20_4_;
        fVar295 = auVar16._24_4_;
        auVar134._0_4_ = fVar223 * fVar223 + fVar127 * fVar127;
        auVar134._4_4_ = fVar293 * fVar293 + fVar141 * fVar141;
        auVar134._8_4_ = fVar193 * fVar193 + fVar142 * fVar142;
        auVar134._12_4_ = fVar242 * fVar242 + fVar143 * fVar143;
        auVar134._16_4_ = fVar243 * fVar243 + fVar144 * fVar144;
        auVar134._20_4_ = fVar294 * fVar294 + fVar145 * fVar145;
        auVar134._24_4_ = fVar295 * fVar295 + fVar147 * fVar147;
        auVar134._28_4_ = auVar278._28_4_ + auVar28._28_4_;
        auVar28 = vrsqrtps_avx(auVar134);
        fVar241 = auVar28._0_4_;
        fVar171 = auVar28._4_4_;
        auVar21._4_4_ = fVar171 * 1.5;
        auVar21._0_4_ = fVar241 * 1.5;
        fVar337 = auVar28._8_4_;
        auVar21._8_4_ = fVar337 * 1.5;
        fVar314 = auVar28._12_4_;
        auVar21._12_4_ = fVar314 * 1.5;
        fVar172 = auVar28._16_4_;
        auVar21._16_4_ = fVar172 * 1.5;
        fVar148 = auVar28._20_4_;
        auVar21._20_4_ = fVar148 * 1.5;
        fVar297 = auVar28._24_4_;
        fVar162 = auVar20._28_4_;
        auVar21._24_4_ = fVar297 * 1.5;
        auVar21._28_4_ = fVar162;
        auVar22._4_4_ = fVar171 * fVar171 * fVar171 * auVar134._4_4_ * 0.5;
        auVar22._0_4_ = fVar241 * fVar241 * fVar241 * auVar134._0_4_ * 0.5;
        auVar22._8_4_ = fVar337 * fVar337 * fVar337 * auVar134._8_4_ * 0.5;
        auVar22._12_4_ = fVar314 * fVar314 * fVar314 * auVar134._12_4_ * 0.5;
        auVar22._16_4_ = fVar172 * fVar172 * fVar172 * auVar134._16_4_ * 0.5;
        auVar22._20_4_ = fVar148 * fVar148 * fVar148 * auVar134._20_4_ * 0.5;
        auVar22._24_4_ = fVar297 * fVar297 * fVar297 * auVar134._24_4_ * 0.5;
        auVar22._28_4_ = auVar134._28_4_;
        auVar20 = vsubps_avx(auVar21,auVar22);
        fVar241 = auVar20._0_4_;
        fVar314 = auVar20._4_4_;
        fVar297 = auVar20._8_4_;
        fVar300 = auVar20._12_4_;
        fVar303 = auVar20._16_4_;
        fVar272 = auVar20._20_4_;
        fVar274 = auVar20._24_4_;
        fVar171 = auVar19._0_4_;
        fVar172 = auVar19._4_4_;
        fVar196 = auVar19._8_4_;
        fVar146 = auVar19._12_4_;
        fVar302 = auVar19._16_4_;
        fVar273 = auVar19._20_4_;
        fVar275 = auVar19._24_4_;
        auVar135._0_4_ = fVar171 * fVar171 + fVar174 * fVar174;
        auVar135._4_4_ = fVar172 * fVar172 + fVar189 * fVar189;
        auVar135._8_4_ = fVar196 * fVar196 + fVar191 * fVar191;
        auVar135._12_4_ = fVar146 * fVar146 + fVar149 * fVar149;
        auVar135._16_4_ = fVar302 * fVar302 + fVar159 * fVar159;
        auVar135._20_4_ = fVar273 * fVar273 + fVar160 * fVar160;
        auVar135._24_4_ = fVar275 * fVar275 + fVar161 * fVar161;
        auVar135._28_4_ = auVar9._28_4_ + auVar20._28_4_;
        auVar9 = vrsqrtps_avx(auVar135);
        fVar337 = auVar9._0_4_;
        fVar148 = auVar9._4_4_;
        auVar23._4_4_ = fVar148 * 1.5;
        auVar23._0_4_ = fVar337 * 1.5;
        fVar299 = auVar9._8_4_;
        auVar23._8_4_ = fVar299 * 1.5;
        fVar301 = auVar9._12_4_;
        auVar23._12_4_ = fVar301 * 1.5;
        fVar194 = auVar9._16_4_;
        auVar23._16_4_ = fVar194 * 1.5;
        fVar195 = auVar9._20_4_;
        auVar23._20_4_ = fVar195 * 1.5;
        fVar197 = auVar9._24_4_;
        auVar23._24_4_ = fVar197 * 1.5;
        auVar23._28_4_ = fVar162;
        auVar9._4_4_ = fVar148 * fVar148 * fVar148 * auVar135._4_4_ * 0.5;
        auVar9._0_4_ = fVar337 * fVar337 * fVar337 * auVar135._0_4_ * 0.5;
        auVar9._8_4_ = fVar299 * fVar299 * fVar299 * auVar135._8_4_ * 0.5;
        auVar9._12_4_ = fVar301 * fVar301 * fVar301 * auVar135._12_4_ * 0.5;
        auVar9._16_4_ = fVar194 * fVar194 * fVar194 * auVar135._16_4_ * 0.5;
        auVar9._20_4_ = fVar195 * fVar195 * fVar195 * auVar135._20_4_ * 0.5;
        auVar9._24_4_ = fVar197 * fVar197 * fVar197 * auVar135._24_4_ * 0.5;
        auVar9._28_4_ = auVar135._28_4_;
        auVar9 = vsubps_avx(auVar23,auVar9);
        fVar337 = auVar9._0_4_;
        fVar148 = auVar9._4_4_;
        fVar299 = auVar9._8_4_;
        fVar301 = auVar9._12_4_;
        fVar194 = auVar9._16_4_;
        fVar195 = auVar9._20_4_;
        fVar197 = auVar9._24_4_;
        local_580 = fVar126 * fVar223 * fVar241;
        fStack_57c = fStack_63c * fVar293 * fVar314;
        auVar24._4_4_ = fStack_57c;
        auVar24._0_4_ = local_580;
        fStack_578 = fStack_638 * fVar193 * fVar297;
        auVar24._8_4_ = fStack_578;
        fStack_574 = fStack_634 * fVar242 * fVar300;
        auVar24._12_4_ = fStack_574;
        fStack_570 = fStack_630 * fVar243 * fVar303;
        auVar24._16_4_ = fStack_570;
        fStack_56c = fStack_62c * fVar294 * fVar272;
        auVar24._20_4_ = fStack_56c;
        fStack_568 = fStack_628 * fVar295 * fVar274;
        auVar24._24_4_ = fStack_568;
        auVar24._28_4_ = fStack_564;
        local_580 = local_580 + auVar306._0_4_;
        fStack_57c = fStack_57c + auVar306._4_4_;
        fStack_578 = fStack_578 + auVar306._8_4_;
        fStack_574 = fStack_574 + auVar306._12_4_;
        fStack_570 = fStack_570 + auVar306._16_4_;
        fStack_56c = fStack_56c + auVar306._20_4_;
        fStack_568 = fStack_568 + auVar306._24_4_;
        fStack_564 = fStack_564 + auVar306._28_4_;
        fVar223 = fVar126 * fVar241 * -fVar127;
        fVar293 = fStack_63c * fVar314 * -fVar141;
        auVar29._4_4_ = fVar293;
        auVar29._0_4_ = fVar223;
        fVar193 = fStack_638 * fVar297 * -fVar142;
        auVar29._8_4_ = fVar193;
        fVar242 = fStack_634 * fVar300 * -fVar143;
        auVar29._12_4_ = fVar242;
        fVar243 = fStack_630 * fVar303 * -fVar144;
        auVar29._16_4_ = fVar243;
        fVar294 = fStack_62c * fVar272 * -fVar145;
        auVar29._20_4_ = fVar294;
        fVar295 = fStack_628 * fVar274 * -fVar147;
        auVar29._24_4_ = fVar295;
        auVar29._28_4_ = fVar162;
        local_520._4_4_ = fVar293 + auVar247._4_4_;
        local_520._0_4_ = fVar223 + auVar247._0_4_;
        fStack_518 = fVar193 + auVar247._8_4_;
        fStack_514 = fVar242 + auVar247._12_4_;
        fStack_510 = fVar243 + auVar247._16_4_;
        fStack_50c = fVar294 + auVar247._20_4_;
        fStack_508 = fVar295 + auVar247._24_4_;
        fStack_504 = fVar162 + auVar247._28_4_;
        fVar223 = fVar241 * 0.0 * fVar126;
        fVar241 = fVar314 * 0.0 * fStack_63c;
        auVar30._4_4_ = fVar241;
        auVar30._0_4_ = fVar223;
        fVar293 = fVar297 * 0.0 * fStack_638;
        auVar30._8_4_ = fVar293;
        fVar314 = fVar300 * 0.0 * fStack_634;
        auVar30._12_4_ = fVar314;
        fVar193 = fVar303 * 0.0 * fStack_630;
        auVar30._16_4_ = fVar193;
        fVar297 = fVar272 * 0.0 * fStack_62c;
        auVar30._20_4_ = fVar297;
        fVar242 = fVar274 * 0.0 * fStack_628;
        auVar30._24_4_ = fVar242;
        auVar30._28_4_ = fVar313;
        auVar110._4_4_ = fStack_55c;
        auVar110._0_4_ = local_560;
        auVar110._8_4_ = fStack_558;
        auVar110._12_4_ = fStack_554;
        auVar110._16_4_ = fStack_550;
        auVar110._20_4_ = fStack_54c;
        auVar110._24_4_ = fStack_548;
        auVar110._28_4_ = fStack_544;
        auVar257._0_4_ = fVar223 + local_560;
        auVar257._4_4_ = fVar241 + fStack_55c;
        auVar257._8_4_ = fVar293 + fStack_558;
        auVar257._12_4_ = fVar314 + fStack_554;
        auVar257._16_4_ = fVar193 + fStack_550;
        auVar257._20_4_ = fVar297 + fStack_54c;
        auVar257._24_4_ = fVar242 + fStack_548;
        auVar257._28_4_ = fVar313 + fStack_544;
        fVar223 = auVar296._0_4_ * fVar171 * fVar337;
        fVar241 = auVar296._4_4_ * fVar172 * fVar148;
        auVar31._4_4_ = fVar241;
        auVar31._0_4_ = fVar223;
        fVar171 = auVar296._8_4_ * fVar196 * fVar299;
        auVar31._8_4_ = fVar171;
        fVar293 = auVar296._12_4_ * fVar146 * fVar301;
        auVar31._12_4_ = fVar293;
        fVar314 = auVar296._16_4_ * fVar302 * fVar194;
        auVar31._16_4_ = fVar314;
        fVar172 = auVar296._20_4_ * fVar273 * fVar195;
        auVar31._20_4_ = fVar172;
        fVar193 = auVar296._24_4_ * fVar275 * fVar197;
        auVar31._24_4_ = fVar193;
        auVar31._28_4_ = auVar19._28_4_;
        auVar25 = vsubps_avx(auVar306,auVar24);
        auVar279._0_4_ = auVar209._0_4_ + fVar223;
        auVar279._4_4_ = auVar209._4_4_ + fVar241;
        auVar279._8_4_ = auVar209._8_4_ + fVar171;
        auVar279._12_4_ = auVar209._12_4_ + fVar293;
        auVar279._16_4_ = auVar209._16_4_ + fVar314;
        auVar279._20_4_ = auVar209._20_4_ + fVar172;
        auVar279._24_4_ = auVar209._24_4_ + fVar193;
        auVar279._28_4_ = auVar209._28_4_ + auVar19._28_4_;
        fVar223 = auVar296._0_4_ * -fVar174 * fVar337;
        fVar241 = auVar296._4_4_ * -fVar189 * fVar148;
        auVar19._4_4_ = fVar241;
        auVar19._0_4_ = fVar223;
        fVar171 = auVar296._8_4_ * -fVar191 * fVar299;
        auVar19._8_4_ = fVar171;
        fVar293 = auVar296._12_4_ * -fVar149 * fVar301;
        auVar19._12_4_ = fVar293;
        fVar314 = auVar296._16_4_ * -fVar159 * fVar194;
        auVar19._16_4_ = fVar314;
        fVar172 = auVar296._20_4_ * -fVar160 * fVar195;
        auVar19._20_4_ = fVar172;
        fVar193 = auVar296._24_4_ * -fVar161 * fVar197;
        auVar19._24_4_ = fVar193;
        auVar19._28_4_ = fVar326;
        auVar183 = vsubps_avx(auVar247,auVar29);
        auVar289._0_4_ = fVar223 + auVar182._0_4_;
        auVar289._4_4_ = fVar241 + auVar182._4_4_;
        auVar289._8_4_ = fVar171 + auVar182._8_4_;
        auVar289._12_4_ = fVar293 + auVar182._12_4_;
        auVar289._16_4_ = fVar314 + auVar182._16_4_;
        auVar289._20_4_ = fVar172 + auVar182._20_4_;
        auVar289._24_4_ = fVar193 + auVar182._24_4_;
        auVar289._28_4_ = fVar326 + auVar182._28_4_;
        fVar223 = auVar296._0_4_ * fVar337 * 0.0;
        fVar241 = auVar296._4_4_ * fVar148 * 0.0;
        auVar32._4_4_ = fVar241;
        auVar32._0_4_ = fVar223;
        fVar171 = auVar296._8_4_ * fVar299 * 0.0;
        auVar32._8_4_ = fVar171;
        fVar337 = auVar296._12_4_ * fVar301 * 0.0;
        auVar32._12_4_ = fVar337;
        fVar293 = auVar296._16_4_ * fVar194 * 0.0;
        auVar32._16_4_ = fVar293;
        fVar314 = auVar296._20_4_ * fVar195 * 0.0;
        auVar32._20_4_ = fVar314;
        fVar172 = auVar296._24_4_ * fVar197 * 0.0;
        auVar32._24_4_ = fVar172;
        auVar32._28_4_ = auVar296._28_4_;
        auVar306 = vsubps_avx(auVar110,auVar30);
        auVar339._0_4_ = fVar223 + (float)local_4c0._0_4_;
        auVar339._4_4_ = fVar241 + (float)local_4c0._4_4_;
        auVar339._8_4_ = fVar171 + fStack_4b8;
        auVar339._12_4_ = fVar337 + fStack_4b4;
        auVar339._16_4_ = fVar293 + fStack_4b0;
        auVar339._20_4_ = fVar314 + fStack_4ac;
        auVar339._24_4_ = fVar172 + fStack_4a8;
        auVar339._28_4_ = auVar296._28_4_ + fStack_4a4;
        auVar9 = vsubps_avx(auVar209,auVar31);
        auVar20 = vsubps_avx(auVar182,auVar19);
        auVar19 = vsubps_avx(_local_4c0,auVar32);
        auVar28 = vsubps_avx(auVar289,auVar183);
        auVar16 = vsubps_avx(auVar339,auVar306);
        auVar33._4_4_ = auVar306._4_4_ * auVar28._4_4_;
        auVar33._0_4_ = auVar306._0_4_ * auVar28._0_4_;
        auVar33._8_4_ = auVar306._8_4_ * auVar28._8_4_;
        auVar33._12_4_ = auVar306._12_4_ * auVar28._12_4_;
        auVar33._16_4_ = auVar306._16_4_ * auVar28._16_4_;
        auVar33._20_4_ = auVar306._20_4_ * auVar28._20_4_;
        auVar33._24_4_ = auVar306._24_4_ * auVar28._24_4_;
        auVar33._28_4_ = auVar296._28_4_;
        auVar34._4_4_ = auVar183._4_4_ * auVar16._4_4_;
        auVar34._0_4_ = auVar183._0_4_ * auVar16._0_4_;
        auVar34._8_4_ = auVar183._8_4_ * auVar16._8_4_;
        auVar34._12_4_ = auVar183._12_4_ * auVar16._12_4_;
        auVar34._16_4_ = auVar183._16_4_ * auVar16._16_4_;
        auVar34._20_4_ = auVar183._20_4_ * auVar16._20_4_;
        auVar34._24_4_ = auVar183._24_4_ * auVar16._24_4_;
        auVar34._28_4_ = fStack_4a4;
        auVar247 = vsubps_avx(auVar34,auVar33);
        auVar35._4_4_ = auVar25._4_4_ * auVar16._4_4_;
        auVar35._0_4_ = auVar25._0_4_ * auVar16._0_4_;
        auVar35._8_4_ = auVar25._8_4_ * auVar16._8_4_;
        auVar35._12_4_ = auVar25._12_4_ * auVar16._12_4_;
        auVar35._16_4_ = auVar25._16_4_ * auVar16._16_4_;
        auVar35._20_4_ = auVar25._20_4_ * auVar16._20_4_;
        auVar35._24_4_ = auVar25._24_4_ * auVar16._24_4_;
        auVar35._28_4_ = auVar16._28_4_;
        auVar21 = vsubps_avx(auVar279,auVar25);
        auVar36._4_4_ = auVar306._4_4_ * auVar21._4_4_;
        auVar36._0_4_ = auVar306._0_4_ * auVar21._0_4_;
        auVar36._8_4_ = auVar306._8_4_ * auVar21._8_4_;
        auVar36._12_4_ = auVar306._12_4_ * auVar21._12_4_;
        auVar36._16_4_ = auVar306._16_4_ * auVar21._16_4_;
        auVar36._20_4_ = auVar306._20_4_ * auVar21._20_4_;
        auVar36._24_4_ = auVar306._24_4_ * auVar21._24_4_;
        auVar36._28_4_ = auVar182._28_4_;
        auVar22 = vsubps_avx(auVar36,auVar35);
        auVar37._4_4_ = auVar21._4_4_ * auVar183._4_4_;
        auVar37._0_4_ = auVar21._0_4_ * auVar183._0_4_;
        auVar37._8_4_ = auVar21._8_4_ * auVar183._8_4_;
        auVar37._12_4_ = auVar21._12_4_ * auVar183._12_4_;
        auVar37._16_4_ = auVar21._16_4_ * auVar183._16_4_;
        auVar37._20_4_ = auVar21._20_4_ * auVar183._20_4_;
        auVar37._24_4_ = auVar21._24_4_ * auVar183._24_4_;
        auVar37._28_4_ = auVar16._28_4_;
        auVar38._4_4_ = auVar25._4_4_ * auVar28._4_4_;
        auVar38._0_4_ = auVar25._0_4_ * auVar28._0_4_;
        auVar38._8_4_ = auVar25._8_4_ * auVar28._8_4_;
        auVar38._12_4_ = auVar25._12_4_ * auVar28._12_4_;
        auVar38._16_4_ = auVar25._16_4_ * auVar28._16_4_;
        auVar38._20_4_ = auVar25._20_4_ * auVar28._20_4_;
        auVar38._24_4_ = auVar25._24_4_ * auVar28._24_4_;
        auVar38._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar38,auVar37);
        auVar136._0_4_ = auVar247._0_4_ * 0.0 + auVar28._0_4_ + auVar22._0_4_ * 0.0;
        auVar136._4_4_ = auVar247._4_4_ * 0.0 + auVar28._4_4_ + auVar22._4_4_ * 0.0;
        auVar136._8_4_ = auVar247._8_4_ * 0.0 + auVar28._8_4_ + auVar22._8_4_ * 0.0;
        auVar136._12_4_ = auVar247._12_4_ * 0.0 + auVar28._12_4_ + auVar22._12_4_ * 0.0;
        auVar136._16_4_ = auVar247._16_4_ * 0.0 + auVar28._16_4_ + auVar22._16_4_ * 0.0;
        auVar136._20_4_ = auVar247._20_4_ * 0.0 + auVar28._20_4_ + auVar22._20_4_ * 0.0;
        auVar136._24_4_ = auVar247._24_4_ * 0.0 + auVar28._24_4_ + auVar22._24_4_ * 0.0;
        auVar136._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar22._28_4_;
        auVar247 = vcmpps_avx(auVar136,ZEXT432(0) << 0x20,2);
        auVar108._4_4_ = fStack_57c;
        auVar108._0_4_ = local_580;
        auVar108._8_4_ = fStack_578;
        auVar108._12_4_ = fStack_574;
        auVar108._16_4_ = fStack_570;
        auVar108._20_4_ = fStack_56c;
        auVar108._24_4_ = fStack_568;
        auVar108._28_4_ = fStack_564;
        local_5a0 = vblendvps_avx(auVar9,auVar108,auVar247);
        auVar9 = vblendvps_avx(auVar20,_local_520,auVar247);
        auVar20 = vblendvps_avx(auVar19,auVar257,auVar247);
        auVar19 = vblendvps_avx(auVar25,auVar279,auVar247);
        auVar28 = vblendvps_avx(auVar183,auVar289,auVar247);
        auVar16 = vblendvps_avx(auVar306,auVar339,auVar247);
        auVar25 = vblendvps_avx(auVar279,auVar25,auVar247);
        auVar183 = vblendvps_avx(auVar289,auVar183,auVar247);
        local_660._0_16_ = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
        local_660._16_16_ = auVar15._16_16_;
        auVar15 = vblendvps_avx(auVar339,auVar306,auVar247);
        auVar25 = vsubps_avx(auVar25,local_5a0);
        auVar21 = vsubps_avx(auVar183,auVar9);
        auVar22 = vsubps_avx(auVar15,auVar20);
        auVar15 = vsubps_avx(auVar9,auVar28);
        fVar223 = auVar21._0_4_;
        fVar147 = auVar20._0_4_;
        fVar314 = auVar21._4_4_;
        fVar174 = auVar20._4_4_;
        auVar39._4_4_ = fVar174 * fVar314;
        auVar39._0_4_ = fVar147 * fVar223;
        fVar196 = auVar21._8_4_;
        fVar189 = auVar20._8_4_;
        auVar39._8_4_ = fVar189 * fVar196;
        fVar301 = auVar21._12_4_;
        fVar191 = auVar20._12_4_;
        auVar39._12_4_ = fVar191 * fVar301;
        fVar294 = auVar21._16_4_;
        fVar149 = auVar20._16_4_;
        auVar39._16_4_ = fVar149 * fVar294;
        fVar274 = auVar21._20_4_;
        fVar159 = auVar20._20_4_;
        auVar39._20_4_ = fVar159 * fVar274;
        fVar141 = auVar21._24_4_;
        fVar160 = auVar20._24_4_;
        auVar39._24_4_ = fVar160 * fVar141;
        auVar39._28_4_ = auVar183._28_4_;
        fVar241 = auVar9._0_4_;
        fVar128 = auVar22._0_4_;
        fVar172 = auVar9._4_4_;
        fVar227 = auVar22._4_4_;
        auVar40._4_4_ = fVar227 * fVar172;
        auVar40._0_4_ = fVar128 * fVar241;
        fVar299 = auVar9._8_4_;
        fVar163 = auVar22._8_4_;
        auVar40._8_4_ = fVar163 * fVar299;
        fVar243 = auVar9._12_4_;
        fVar254 = auVar22._12_4_;
        auVar40._12_4_ = fVar254 * fVar243;
        fVar272 = auVar9._16_4_;
        fVar260 = auVar22._16_4_;
        auVar40._16_4_ = fVar260 * fVar272;
        fVar275 = auVar9._20_4_;
        fVar261 = auVar22._20_4_;
        auVar40._20_4_ = fVar261 * fVar275;
        fVar142 = auVar9._24_4_;
        fVar262 = auVar22._24_4_;
        uVar7 = auVar306._28_4_;
        auVar40._24_4_ = fVar262 * fVar142;
        auVar40._28_4_ = uVar7;
        auVar183 = vsubps_avx(auVar40,auVar39);
        fVar171 = local_5a0._0_4_;
        fVar148 = local_5a0._4_4_;
        auVar41._4_4_ = fVar227 * fVar148;
        auVar41._0_4_ = fVar128 * fVar171;
        fVar242 = local_5a0._8_4_;
        auVar41._8_4_ = fVar163 * fVar242;
        fVar303 = local_5a0._12_4_;
        auVar41._12_4_ = fVar254 * fVar303;
        fVar273 = local_5a0._16_4_;
        auVar41._16_4_ = fVar260 * fVar273;
        fVar197 = local_5a0._20_4_;
        auVar41._20_4_ = fVar261 * fVar197;
        fVar143 = local_5a0._24_4_;
        auVar41._24_4_ = fVar262 * fVar143;
        auVar41._28_4_ = uVar7;
        fVar337 = auVar25._0_4_;
        auVar329._0_4_ = fVar147 * fVar337;
        fVar193 = auVar25._4_4_;
        auVar329._4_4_ = fVar174 * fVar193;
        fVar300 = auVar25._8_4_;
        auVar329._8_4_ = fVar189 * fVar300;
        fVar302 = auVar25._12_4_;
        auVar329._12_4_ = fVar191 * fVar302;
        fVar195 = auVar25._16_4_;
        auVar329._16_4_ = fVar149 * fVar195;
        fVar162 = auVar25._20_4_;
        auVar329._20_4_ = fVar159 * fVar162;
        fVar144 = auVar25._24_4_;
        auVar329._24_4_ = fVar160 * fVar144;
        auVar329._28_4_ = 0;
        auVar306 = vsubps_avx(auVar329,auVar41);
        auVar42._4_4_ = fVar172 * fVar193;
        auVar42._0_4_ = fVar241 * fVar337;
        auVar42._8_4_ = fVar299 * fVar300;
        auVar42._12_4_ = fVar243 * fVar302;
        auVar42._16_4_ = fVar272 * fVar195;
        auVar42._20_4_ = fVar275 * fVar162;
        auVar42._24_4_ = fVar142 * fVar144;
        auVar42._28_4_ = uVar7;
        auVar250 = ZEXT3264(auVar20);
        auVar43._4_4_ = fVar148 * fVar314;
        auVar43._0_4_ = fVar171 * fVar223;
        auVar43._8_4_ = fVar242 * fVar196;
        auVar43._12_4_ = fVar303 * fVar301;
        auVar43._16_4_ = fVar273 * fVar294;
        auVar43._20_4_ = fVar197 * fVar274;
        auVar43._24_4_ = fVar143 * fVar141;
        auVar43._28_4_ = auVar339._28_4_;
        auVar23 = vsubps_avx(auVar43,auVar42);
        auVar24 = vsubps_avx(auVar20,auVar16);
        fVar293 = auVar23._28_4_ + auVar306._28_4_;
        auVar258._0_4_ = auVar23._0_4_ + auVar306._0_4_ * 0.0 + auVar183._0_4_ * 0.0;
        auVar258._4_4_ = auVar23._4_4_ + auVar306._4_4_ * 0.0 + auVar183._4_4_ * 0.0;
        auVar258._8_4_ = auVar23._8_4_ + auVar306._8_4_ * 0.0 + auVar183._8_4_ * 0.0;
        auVar258._12_4_ = auVar23._12_4_ + auVar306._12_4_ * 0.0 + auVar183._12_4_ * 0.0;
        auVar258._16_4_ = auVar23._16_4_ + auVar306._16_4_ * 0.0 + auVar183._16_4_ * 0.0;
        auVar258._20_4_ = auVar23._20_4_ + auVar306._20_4_ * 0.0 + auVar183._20_4_ * 0.0;
        auVar258._24_4_ = auVar23._24_4_ + auVar306._24_4_ * 0.0 + auVar183._24_4_ * 0.0;
        auVar258._28_4_ = fVar293 + auVar183._28_4_;
        fVar161 = auVar15._0_4_;
        fVar200 = auVar15._4_4_;
        auVar44._4_4_ = fVar200 * auVar16._4_4_;
        auVar44._0_4_ = fVar161 * auVar16._0_4_;
        fVar217 = auVar15._8_4_;
        auVar44._8_4_ = fVar217 * auVar16._8_4_;
        fVar221 = auVar15._12_4_;
        auVar44._12_4_ = fVar221 * auVar16._12_4_;
        fVar225 = auVar15._16_4_;
        auVar44._16_4_ = fVar225 * auVar16._16_4_;
        fVar229 = auVar15._20_4_;
        auVar44._20_4_ = fVar229 * auVar16._20_4_;
        fVar239 = auVar15._24_4_;
        auVar44._24_4_ = fVar239 * auVar16._24_4_;
        auVar44._28_4_ = fVar293;
        fVar293 = auVar24._0_4_;
        fVar297 = auVar24._4_4_;
        auVar45._4_4_ = auVar28._4_4_ * fVar297;
        auVar45._0_4_ = auVar28._0_4_ * fVar293;
        fVar146 = auVar24._8_4_;
        auVar45._8_4_ = auVar28._8_4_ * fVar146;
        fVar194 = auVar24._12_4_;
        auVar45._12_4_ = auVar28._12_4_ * fVar194;
        fVar295 = auVar24._16_4_;
        auVar45._16_4_ = auVar28._16_4_ * fVar295;
        fVar127 = auVar24._20_4_;
        auVar45._20_4_ = auVar28._20_4_ * fVar127;
        fVar145 = auVar24._24_4_;
        auVar45._24_4_ = auVar28._24_4_ * fVar145;
        auVar45._28_4_ = auVar23._28_4_;
        auVar15 = vsubps_avx(auVar45,auVar44);
        auVar306 = vsubps_avx(local_5a0,auVar19);
        fVar263 = auVar306._0_4_;
        fVar276 = auVar306._4_4_;
        auVar46._4_4_ = fVar276 * auVar16._4_4_;
        auVar46._0_4_ = fVar263 * auVar16._0_4_;
        fVar282 = auVar306._8_4_;
        auVar46._8_4_ = fVar282 * auVar16._8_4_;
        fVar283 = auVar306._12_4_;
        auVar46._12_4_ = fVar283 * auVar16._12_4_;
        fVar284 = auVar306._16_4_;
        auVar46._16_4_ = fVar284 * auVar16._16_4_;
        fVar285 = auVar306._20_4_;
        auVar46._20_4_ = fVar285 * auVar16._20_4_;
        fVar286 = auVar306._24_4_;
        auVar46._24_4_ = fVar286 * auVar16._24_4_;
        auVar46._28_4_ = auVar16._28_4_;
        auVar47._4_4_ = auVar19._4_4_ * fVar297;
        auVar47._0_4_ = auVar19._0_4_ * fVar293;
        auVar47._8_4_ = auVar19._8_4_ * fVar146;
        auVar47._12_4_ = auVar19._12_4_ * fVar194;
        auVar47._16_4_ = auVar19._16_4_ * fVar295;
        auVar47._20_4_ = auVar19._20_4_ * fVar127;
        auVar47._24_4_ = auVar19._24_4_ * fVar145;
        auVar47._28_4_ = auVar183._28_4_;
        auVar183 = vsubps_avx(auVar46,auVar47);
        auVar48._4_4_ = auVar28._4_4_ * fVar276;
        auVar48._0_4_ = auVar28._0_4_ * fVar263;
        auVar48._8_4_ = auVar28._8_4_ * fVar282;
        auVar48._12_4_ = auVar28._12_4_ * fVar283;
        auVar48._16_4_ = auVar28._16_4_ * fVar284;
        auVar48._20_4_ = auVar28._20_4_ * fVar285;
        auVar48._24_4_ = auVar28._24_4_ * fVar286;
        auVar48._28_4_ = auVar16._28_4_;
        auVar49._4_4_ = auVar19._4_4_ * fVar200;
        auVar49._0_4_ = auVar19._0_4_ * fVar161;
        auVar49._8_4_ = auVar19._8_4_ * fVar217;
        auVar49._12_4_ = auVar19._12_4_ * fVar221;
        auVar49._16_4_ = auVar19._16_4_ * fVar225;
        auVar49._20_4_ = auVar19._20_4_ * fVar229;
        auVar49._24_4_ = auVar19._24_4_ * fVar239;
        auVar49._28_4_ = auVar19._28_4_;
        auVar19 = vsubps_avx(auVar49,auVar48);
        auVar211._0_4_ = auVar15._0_4_ * 0.0 + auVar19._0_4_ + auVar183._0_4_ * 0.0;
        auVar211._4_4_ = auVar15._4_4_ * 0.0 + auVar19._4_4_ + auVar183._4_4_ * 0.0;
        auVar211._8_4_ = auVar15._8_4_ * 0.0 + auVar19._8_4_ + auVar183._8_4_ * 0.0;
        auVar211._12_4_ = auVar15._12_4_ * 0.0 + auVar19._12_4_ + auVar183._12_4_ * 0.0;
        auVar211._16_4_ = auVar15._16_4_ * 0.0 + auVar19._16_4_ + auVar183._16_4_ * 0.0;
        auVar211._20_4_ = auVar15._20_4_ * 0.0 + auVar19._20_4_ + auVar183._20_4_ * 0.0;
        auVar211._24_4_ = auVar15._24_4_ * 0.0 + auVar19._24_4_ + auVar183._24_4_ * 0.0;
        auVar211._28_4_ = auVar19._28_4_ + auVar19._28_4_ + auVar183._28_4_;
        auVar15 = vmaxps_avx(auVar258,auVar211);
        auVar15 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,2);
        auVar178 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
        auVar178 = vpand_avx(auVar178,local_660._0_16_);
        auVar166 = vpmovsxwd_avx(auVar178);
        auVar208 = vpunpckhwd_avx(auVar178,auVar178);
        auVar184._16_16_ = auVar208;
        auVar184._0_16_ = auVar166;
        if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0x7f,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar208 >> 0x3f,0) == '\0') &&
            (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar208[0xf]) {
LAB_00eff608:
          auVar187 = ZEXT3264(auVar184);
          auVar235._8_8_ = uStack_4d8;
          auVar235._0_8_ = local_4e0;
          auVar235._16_8_ = uStack_4d0;
          auVar235._24_8_ = uStack_4c8;
          auVar271 = ZEXT3264(auVar268);
          auVar268._4_4_ = fStack_63c;
          auVar268._0_4_ = fVar126;
          auVar268._8_4_ = fStack_638;
          auVar268._12_4_ = fStack_634;
          auVar268._16_4_ = fStack_630;
          auVar268._20_4_ = fStack_62c;
          auVar268._24_4_ = fStack_628;
          auVar268._28_4_ = fStack_624;
        }
        else {
          auVar50._4_4_ = fVar297 * fVar314;
          auVar50._0_4_ = fVar293 * fVar223;
          auVar50._8_4_ = fVar146 * fVar196;
          auVar50._12_4_ = fVar194 * fVar301;
          auVar50._16_4_ = fVar295 * fVar294;
          auVar50._20_4_ = fVar127 * fVar274;
          auVar50._24_4_ = fVar145 * fVar141;
          auVar50._28_4_ = auVar208._12_4_;
          auVar307._0_4_ = fVar161 * fVar128;
          auVar307._4_4_ = fVar200 * fVar227;
          auVar307._8_4_ = fVar217 * fVar163;
          auVar307._12_4_ = fVar221 * fVar254;
          auVar307._16_4_ = fVar225 * fVar260;
          auVar307._20_4_ = fVar229 * fVar261;
          auVar307._24_4_ = fVar239 * fVar262;
          auVar307._28_4_ = 0;
          auVar15 = vsubps_avx(auVar307,auVar50);
          auVar51._4_4_ = fVar276 * fVar227;
          auVar51._0_4_ = fVar263 * fVar128;
          auVar51._8_4_ = fVar282 * fVar163;
          auVar51._12_4_ = fVar283 * fVar254;
          auVar51._16_4_ = fVar284 * fVar260;
          auVar51._20_4_ = fVar285 * fVar261;
          auVar51._24_4_ = fVar286 * fVar262;
          auVar51._28_4_ = auVar22._28_4_;
          auVar52._4_4_ = fVar297 * fVar193;
          auVar52._0_4_ = fVar293 * fVar337;
          auVar52._8_4_ = fVar146 * fVar300;
          auVar52._12_4_ = fVar194 * fVar302;
          auVar52._16_4_ = fVar295 * fVar195;
          auVar52._20_4_ = fVar127 * fVar162;
          auVar52._24_4_ = fVar145 * fVar144;
          auVar52._28_4_ = auVar24._28_4_;
          auVar28 = vsubps_avx(auVar52,auVar51);
          auVar53._4_4_ = fVar200 * fVar193;
          auVar53._0_4_ = fVar161 * fVar337;
          auVar53._8_4_ = fVar217 * fVar300;
          auVar53._12_4_ = fVar221 * fVar302;
          auVar53._16_4_ = fVar225 * fVar195;
          auVar53._20_4_ = fVar229 * fVar162;
          auVar53._24_4_ = fVar239 * fVar144;
          auVar53._28_4_ = auVar25._28_4_;
          auVar54._4_4_ = fVar276 * fVar314;
          auVar54._0_4_ = fVar263 * fVar223;
          auVar54._8_4_ = fVar282 * fVar196;
          auVar54._12_4_ = fVar283 * fVar301;
          auVar54._16_4_ = fVar284 * fVar294;
          auVar54._20_4_ = fVar285 * fVar274;
          auVar54._24_4_ = fVar286 * fVar141;
          auVar54._28_4_ = auVar258._28_4_;
          auVar16 = vsubps_avx(auVar54,auVar53);
          auVar259._0_4_ = auVar15._0_4_ * 0.0 + auVar16._0_4_ + auVar28._0_4_ * 0.0;
          auVar259._4_4_ = auVar15._4_4_ * 0.0 + auVar16._4_4_ + auVar28._4_4_ * 0.0;
          auVar259._8_4_ = auVar15._8_4_ * 0.0 + auVar16._8_4_ + auVar28._8_4_ * 0.0;
          auVar259._12_4_ = auVar15._12_4_ * 0.0 + auVar16._12_4_ + auVar28._12_4_ * 0.0;
          auVar259._16_4_ = auVar15._16_4_ * 0.0 + auVar16._16_4_ + auVar28._16_4_ * 0.0;
          auVar259._20_4_ = auVar15._20_4_ * 0.0 + auVar16._20_4_ + auVar28._20_4_ * 0.0;
          auVar259._24_4_ = auVar15._24_4_ * 0.0 + auVar16._24_4_ + auVar28._24_4_ * 0.0;
          auVar259._28_4_ = auVar258._28_4_ + auVar16._28_4_ + auVar25._28_4_;
          auVar19 = vrcpps_avx(auVar259);
          fVar337 = auVar19._0_4_;
          fVar293 = auVar19._4_4_;
          auVar55._4_4_ = auVar259._4_4_ * fVar293;
          auVar55._0_4_ = auVar259._0_4_ * fVar337;
          fVar314 = auVar19._8_4_;
          auVar55._8_4_ = auVar259._8_4_ * fVar314;
          fVar193 = auVar19._12_4_;
          auVar55._12_4_ = auVar259._12_4_ * fVar193;
          fVar297 = auVar19._16_4_;
          auVar55._16_4_ = auVar259._16_4_ * fVar297;
          fVar196 = auVar19._20_4_;
          auVar55._20_4_ = auVar259._20_4_ * fVar196;
          fVar300 = auVar19._24_4_;
          auVar55._24_4_ = auVar259._24_4_ * fVar300;
          auVar55._28_4_ = auVar24._28_4_;
          auVar308._8_4_ = 0x3f800000;
          auVar308._0_8_ = &DAT_3f8000003f800000;
          auVar308._12_4_ = 0x3f800000;
          auVar308._16_4_ = 0x3f800000;
          auVar308._20_4_ = 0x3f800000;
          auVar308._24_4_ = 0x3f800000;
          auVar308._28_4_ = 0x3f800000;
          auVar25 = vsubps_avx(auVar308,auVar55);
          fVar337 = auVar25._0_4_ * fVar337 + fVar337;
          fVar293 = auVar25._4_4_ * fVar293 + fVar293;
          fVar314 = auVar25._8_4_ * fVar314 + fVar314;
          fVar193 = auVar25._12_4_ * fVar193 + fVar193;
          fVar297 = auVar25._16_4_ * fVar297 + fVar297;
          fVar196 = auVar25._20_4_ * fVar196 + fVar196;
          fVar300 = auVar25._24_4_ * fVar300 + fVar300;
          auVar56._4_4_ =
               (auVar15._4_4_ * fVar148 + auVar28._4_4_ * fVar172 + auVar16._4_4_ * fVar174) *
               fVar293;
          auVar56._0_4_ =
               (auVar15._0_4_ * fVar171 + auVar28._0_4_ * fVar241 + auVar16._0_4_ * fVar147) *
               fVar337;
          auVar56._8_4_ =
               (auVar15._8_4_ * fVar242 + auVar28._8_4_ * fVar299 + auVar16._8_4_ * fVar189) *
               fVar314;
          auVar56._12_4_ =
               (auVar15._12_4_ * fVar303 + auVar28._12_4_ * fVar243 + auVar16._12_4_ * fVar191) *
               fVar193;
          auVar56._16_4_ =
               (auVar15._16_4_ * fVar273 + auVar28._16_4_ * fVar272 + auVar16._16_4_ * fVar149) *
               fVar297;
          auVar56._20_4_ =
               (auVar15._20_4_ * fVar197 + auVar28._20_4_ * fVar275 + auVar16._20_4_ * fVar159) *
               fVar196;
          auVar56._24_4_ =
               (auVar15._24_4_ * fVar143 + auVar28._24_4_ * fVar142 + auVar16._24_4_ * fVar160) *
               fVar300;
          auVar56._28_4_ = local_5a0._28_4_ + auVar21._28_4_ + auVar20._28_4_;
          auVar166 = vpermilps_avx(ZEXT416(local_7c0),0);
          auVar185._16_16_ = auVar166;
          auVar185._0_16_ = auVar166;
          auVar15 = vcmpps_avx(auVar185,auVar56,2);
          fVar223 = ray->tfar;
          auVar233._4_4_ = fVar223;
          auVar233._0_4_ = fVar223;
          auVar233._8_4_ = fVar223;
          auVar233._12_4_ = fVar223;
          auVar233._16_4_ = fVar223;
          auVar233._20_4_ = fVar223;
          auVar233._24_4_ = fVar223;
          auVar233._28_4_ = fVar223;
          auVar20 = vcmpps_avx(auVar56,auVar233,2);
          auVar15 = vandps_avx(auVar20,auVar15);
          auVar166 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
          auVar178 = vpand_avx(auVar178,auVar166);
          auVar166 = vpmovsxwd_avx(auVar178);
          auVar208 = vpshufd_avx(auVar178,0xee);
          auVar208 = vpmovsxwd_avx(auVar208);
          auVar250 = ZEXT1664(auVar208);
          auVar184._16_16_ = auVar208;
          auVar184._0_16_ = auVar166;
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar208 >> 0x3f,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar208[0xf]) goto LAB_00eff608;
          auVar15 = vcmpps_avx(ZEXT832(0) << 0x20,auVar259,4);
          auVar166 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
          auVar178 = vpand_avx(auVar178,auVar166);
          auVar166 = vpmovsxwd_avx(auVar178);
          auVar178 = vpunpckhwd_avx(auVar178,auVar178);
          auVar187 = ZEXT1664(auVar178);
          auVar248._16_16_ = auVar178;
          auVar248._0_16_ = auVar166;
          auVar250 = ZEXT3264(auVar248);
          auVar235._8_8_ = uStack_4d8;
          auVar235._0_8_ = local_4e0;
          auVar235._16_8_ = uStack_4d0;
          auVar235._24_8_ = uStack_4c8;
          auVar271 = ZEXT3264(auVar268);
          auVar268._4_4_ = fStack_63c;
          auVar268._0_4_ = fVar126;
          auVar268._8_4_ = fStack_638;
          auVar268._12_4_ = fStack_634;
          auVar268._16_4_ = fStack_630;
          auVar268._20_4_ = fStack_62c;
          auVar268._24_4_ = fStack_628;
          auVar268._28_4_ = fStack_624;
          if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar248 >> 0x7f,0) != '\0') ||
                (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar178 >> 0x3f,0) != '\0') ||
              (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar178[0xf] < '\0') {
            auVar186._0_4_ = auVar258._0_4_ * fVar337;
            auVar186._4_4_ = auVar258._4_4_ * fVar293;
            auVar186._8_4_ = auVar258._8_4_ * fVar314;
            auVar186._12_4_ = auVar258._12_4_ * fVar193;
            auVar186._16_4_ = auVar258._16_4_ * fVar297;
            auVar186._20_4_ = auVar258._20_4_ * fVar196;
            auVar186._24_4_ = auVar258._24_4_ * fVar300;
            auVar186._28_4_ = 0;
            auVar57._4_4_ = auVar211._4_4_ * fVar293;
            auVar57._0_4_ = auVar211._0_4_ * fVar337;
            auVar57._8_4_ = auVar211._8_4_ * fVar314;
            auVar57._12_4_ = auVar211._12_4_ * fVar193;
            auVar57._16_4_ = auVar211._16_4_ * fVar297;
            auVar57._20_4_ = auVar211._20_4_ * fVar196;
            auVar57._24_4_ = auVar211._24_4_ * fVar300;
            auVar57._28_4_ = auVar25._28_4_ + auVar19._28_4_;
            auVar234._8_4_ = 0x3f800000;
            auVar234._0_8_ = &DAT_3f8000003f800000;
            auVar234._12_4_ = 0x3f800000;
            auVar234._16_4_ = 0x3f800000;
            auVar234._20_4_ = 0x3f800000;
            auVar234._24_4_ = 0x3f800000;
            auVar234._28_4_ = 0x3f800000;
            auVar15 = vsubps_avx(auVar234,auVar186);
            local_1a0 = vblendvps_avx(auVar15,auVar186,auVar247);
            auVar15 = vsubps_avx(auVar234,auVar57);
            auVar187 = ZEXT3264(auVar15);
            _local_3e0 = vblendvps_avx(auVar15,auVar57,auVar247);
            auVar271 = ZEXT3264(auVar56);
            auVar235 = auVar248;
          }
        }
        if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar235 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar235 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar235 >> 0x7f,0) == '\0') &&
              (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar235 >> 0xbf,0) == '\0') &&
            (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar235[0x1f]) {
          uVar121 = 0;
          _local_7e0 = auVar130;
LAB_00efe62d:
          auVar214 = ZEXT3264(_local_620);
          fVar244 = (float)local_6e0._0_4_;
          fVar251 = (float)local_6e0._4_4_;
          fVar252 = fStack_6d8;
          fVar253 = fStack_6d4;
          fVar188 = fStack_6d0;
          fVar215 = fStack_6cc;
          fVar238 = fStack_6c8;
          fVar190 = fStack_6c4;
          auVar130 = _local_7e0;
        }
        else {
          auVar15 = vsubps_avx(auVar296,auVar268);
          auVar187 = ZEXT3264(local_1a0);
          fVar241 = auVar268._0_4_ + auVar15._0_4_ * local_1a0._0_4_;
          fVar171 = auVar268._4_4_ + auVar15._4_4_ * local_1a0._4_4_;
          fVar337 = auVar268._8_4_ + auVar15._8_4_ * local_1a0._8_4_;
          fVar293 = auVar268._12_4_ + auVar15._12_4_ * local_1a0._12_4_;
          fVar314 = auVar268._16_4_ + auVar15._16_4_ * local_1a0._16_4_;
          fVar172 = auVar268._20_4_ + auVar15._20_4_ * local_1a0._20_4_;
          fVar148 = auVar268._24_4_ + auVar15._24_4_ * local_1a0._24_4_;
          fVar193 = auVar268._28_4_ + auVar15._28_4_;
          fVar223 = pre->depth_scale;
          auVar58._4_4_ = (fVar171 + fVar171) * fVar223;
          auVar58._0_4_ = (fVar241 + fVar241) * fVar223;
          auVar58._8_4_ = (fVar337 + fVar337) * fVar223;
          auVar58._12_4_ = (fVar293 + fVar293) * fVar223;
          auVar58._16_4_ = (fVar314 + fVar314) * fVar223;
          auVar58._20_4_ = (fVar172 + fVar172) * fVar223;
          auVar58._24_4_ = (fVar148 + fVar148) * fVar223;
          auVar58._28_4_ = fVar193 + fVar193;
          local_2e0 = auVar271._0_32_;
          auVar268 = vcmpps_avx(local_2e0,auVar58,6);
          auVar15 = auVar235 & auVar268;
          auVar214 = ZEXT3264(_local_620);
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0x7f,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0xbf,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar15[0x1f] < '\0') {
            local_260 = vandps_avx(auVar268,auVar235);
            local_300 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
            fStack_2fc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
            fStack_2f8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
            fStack_2f4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
            fStack_2f0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
            fStack_2ec = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
            fStack_2e8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
            fStack_2e4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
            local_320 = local_1a0;
            local_2c0 = 0;
            local_2bc = uVar120;
            local_2b0 = local_7e0;
            uStack_2a8 = local_7e0._8_8_;
            local_2a0 = local_450._0_8_;
            uStack_298 = local_450._8_8_;
            local_290 = local_460._0_8_;
            uStack_288 = local_460._8_8_;
            local_280 = local_470._0_8_;
            uStack_278 = local_470._8_8_;
            local_3e0._4_4_ = fStack_2fc;
            local_3e0._0_4_ = local_300;
            uStack_3d8._0_4_ = fStack_2f8;
            uStack_3d8._4_4_ = fStack_2f4;
            uStack_3d0._0_4_ = fStack_2f0;
            uStack_3d0._4_4_ = fStack_2ec;
            auVar115 = _local_3e0;
            uStack_3c8._0_4_ = fStack_2e8;
            uStack_3c8._4_4_ = fStack_2e4;
            auVar268 = _local_3e0;
            if ((pGVar11->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar121 = CONCAT71((int7)((ulong)context->args >> 8),1), local_470 = auVar17,
                 local_460 = auVar18, local_450 = auVar131,
                 pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar168._0_4_ = 1.0 / (float)(int)uVar120;
                auVar168._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar178 = vshufps_avx(auVar168,auVar168,0);
                local_240[0] = auVar178._0_4_ * (local_1a0._0_4_ + 0.0);
                local_240[1] = auVar178._4_4_ * (local_1a0._4_4_ + 1.0);
                local_240[2] = auVar178._8_4_ * (local_1a0._8_4_ + 2.0);
                local_240[3] = auVar178._12_4_ * (local_1a0._12_4_ + 3.0);
                fStack_230 = auVar178._0_4_ * (local_1a0._16_4_ + 4.0);
                fStack_22c = auVar178._4_4_ * (local_1a0._20_4_ + 5.0);
                fStack_228 = auVar178._8_4_ * (local_1a0._24_4_ + 6.0);
                fStack_224 = (float)local_1a0._28_4_ + 7.0;
                uStack_3d0 = auVar115._16_8_;
                uStack_3c8 = auVar268._24_8_;
                local_220 = local_3e0;
                uStack_218 = uStack_3d8;
                uStack_210 = uStack_3d0;
                uStack_208 = uStack_3c8;
                local_200 = local_2e0;
                iVar116 = vmovmskps_avx(local_260);
                uVar119 = CONCAT44((int)((ulong)((long)(int)uVar120 * 0x40) >> 0x20),iVar116);
                local_7a0 = 0;
                if (uVar119 != 0) {
                  for (; (uVar119 >> local_7a0 & 1) == 0; local_7a0 = local_7a0 + 1) {
                  }
                }
                auStack_798 = auVar296._8_24_;
                uVar121 = CONCAT71((int7)(local_7a0 >> 8),iVar116 != 0);
                local_470 = auVar17;
                local_460 = auVar18;
                local_450 = auVar131;
                _local_3e0 = auVar268;
                if (iVar116 != 0) {
                  local_660._0_8_ = uVar119;
                  _auStack_5f0 = auVar9._16_16_;
                  _local_600 = local_450;
                  auStack_4f0 = auVar182._16_16_;
                  _local_500 = local_460;
                  _auStack_670 = auVar209._16_16_;
                  _local_680 = local_470;
                  local_720 = local_2e0;
                  local_7d0 = pPVar123;
                  local_7f8 = context;
                  local_7f0 = ray;
                  fVar188 = (float)local_7e0._0_4_;
                  fVar215 = (float)local_7e0._4_4_;
                  fVar238 = (float)uStack_7d8;
                  fVar190 = uStack_7d8._4_4_;
                  _local_7e0 = auVar130;
                  _local_3c0 = auVar26;
                  _local_3a0 = auVar27;
                  local_380 = auVar14;
                  do {
                    local_640 = (uint)uVar121;
                    local_5c4 = local_240[local_7a0];
                    local_5c0 = *(undefined4 *)((long)&local_220 + local_7a0 * 4);
                    local_5a0._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_200 + local_7a0 * 4);
                    local_6b0.context = context->user;
                    fVar241 = 1.0 - local_5c4;
                    fVar223 = local_5c4 * fVar241 * 4.0;
                    auVar250 = ZEXT464(0x3f000000);
                    auVar178 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                    auVar178 = vshufps_avx(auVar178,auVar178,0);
                    auVar166 = ZEXT416((uint)((fVar241 * fVar241 + fVar223) * 0.5));
                    auVar166 = vshufps_avx(auVar166,auVar166,0);
                    auVar208 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar223) * 0.5));
                    auVar208 = vshufps_avx(auVar208,auVar208,0);
                    auVar179 = ZEXT416((uint)(fVar241 * -fVar241 * 0.5));
                    auVar179 = vshufps_avx(auVar179,auVar179,0);
                    auVar181._0_4_ = fVar188 * auVar179._0_4_;
                    auVar181._4_4_ = fVar215 * auVar179._4_4_;
                    auVar181._8_4_ = fVar238 * auVar179._8_4_;
                    auVar181._12_4_ = fVar190 * auVar179._12_4_;
                    auVar187 = ZEXT1664(auVar181);
                    auVar169._0_4_ =
                         auVar181._0_4_ +
                         auVar208._0_4_ * (float)local_600._0_4_ +
                         auVar178._0_4_ * (float)local_680._0_4_ +
                         auVar166._0_4_ * (float)local_500._0_4_;
                    auVar169._4_4_ =
                         auVar181._4_4_ +
                         auVar208._4_4_ * (float)local_600._4_4_ +
                         auVar178._4_4_ * (float)local_680._4_4_ +
                         auVar166._4_4_ * (float)local_500._4_4_;
                    auVar169._8_4_ =
                         auVar181._8_4_ +
                         auVar208._8_4_ * fStack_5f8 +
                         auVar178._8_4_ * fStack_678 + auVar166._8_4_ * fStack_4f8;
                    auVar169._12_4_ =
                         auVar181._12_4_ +
                         auVar208._12_4_ * fStack_5f4 +
                         auVar178._12_4_ * fStack_674 + auVar166._12_4_ * fStack_4f4;
                    local_5d0 = vmovlps_avx(auVar169);
                    local_5c8 = vextractps_avx(auVar169,2);
                    local_5bc = local_7e4;
                    local_5b8 = (int)local_768;
                    local_5b4 = (local_6b0.context)->instID[0];
                    local_5b0 = (local_6b0.context)->instPrimID[0];
                    local_7fc = -1;
                    local_6b0.valid = &local_7fc;
                    local_6b0.geometryUserPtr = pGVar11->userPtr;
                    local_6b0.ray = (RTCRayN *)ray;
                    local_6b0.hit = (RTCHitN *)&local_5d0;
                    local_6b0.N = 1;
                    if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00eff8f5:
                      p_Var12 = context->args->filter;
                      if (p_Var12 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                          auVar187 = ZEXT1664(auVar187._0_16_);
                          auVar250 = ZEXT1664(auVar250._0_16_);
                          (*p_Var12)(&local_6b0);
                          auVar271 = ZEXT3264(local_720);
                          context = local_7f8;
                          pre = local_7c8;
                          pPVar123 = local_7d0;
                          ray = local_7f0;
                          fVar188 = (float)local_7e0._0_4_;
                          fVar215 = (float)local_7e0._4_4_;
                          fVar238 = (float)uStack_7d8;
                          fVar190 = uStack_7d8._4_4_;
                          fVar338 = (float)local_740._0_4_;
                          fVar341 = (float)local_740._4_4_;
                          fVar342 = fStack_738;
                          fVar343 = fStack_734;
                          fVar173 = fStack_730;
                          fVar198 = fStack_72c;
                          fVar228 = fStack_728;
                          fVar199 = (float)local_700._0_4_;
                          fVar216 = (float)local_700._4_4_;
                          fVar220 = fStack_6f8;
                          fVar224 = fStack_6f4;
                          fVar219 = fStack_6f0;
                          fVar240 = fStack_6ec;
                          fVar192 = fStack_6e8;
                        }
                        if (*local_6b0.valid == 0) goto LAB_00eff973;
                      }
                      uVar121 = (ulong)local_640;
                      auVar130 = _local_7e0;
                      break;
                    }
                    auVar187 = ZEXT1664(auVar181);
                    auVar250 = ZEXT1664(auVar250._0_16_);
                    (*pGVar11->occlusionFilterN)(&local_6b0);
                    auVar271 = ZEXT3264(local_720);
                    context = local_7f8;
                    pre = local_7c8;
                    pPVar123 = local_7d0;
                    ray = local_7f0;
                    fVar188 = (float)local_7e0._0_4_;
                    fVar215 = (float)local_7e0._4_4_;
                    fVar238 = (float)uStack_7d8;
                    fVar190 = uStack_7d8._4_4_;
                    fVar338 = (float)local_740._0_4_;
                    fVar341 = (float)local_740._4_4_;
                    fVar342 = fStack_738;
                    fVar343 = fStack_734;
                    fVar173 = fStack_730;
                    fVar198 = fStack_72c;
                    fVar228 = fStack_728;
                    fVar199 = (float)local_700._0_4_;
                    fVar216 = (float)local_700._4_4_;
                    fVar220 = fStack_6f8;
                    fVar224 = fStack_6f4;
                    fVar219 = fStack_6f0;
                    fVar240 = fStack_6ec;
                    fVar192 = fStack_6e8;
                    if (*local_6b0.valid != 0) goto LAB_00eff8f5;
LAB_00eff973:
                    ray->tfar = (float)local_5a0._0_4_;
                    uVar119 = local_660._0_8_ ^ 1L << (local_7a0 & 0x3f);
                    local_7a0 = 0;
                    if (uVar119 != 0) {
                      for (; (uVar119 >> local_7a0 & 1) == 0; local_7a0 = local_7a0 + 1) {
                      }
                    }
                    local_660._0_8_ = uVar119;
                    uVar121 = CONCAT71((int7)(uVar119 >> 8),uVar119 != 0);
                    auVar130 = _local_7e0;
                  } while (uVar119 != 0);
                }
                _local_7e0 = auVar130;
                uVar121 = uVar121 & 0xffffffffffffff01;
                goto LAB_00efe62d;
              }
              goto LAB_00efe75b;
            }
          }
          uVar121 = 0;
          local_470 = auVar17;
          local_460 = auVar18;
          local_450 = auVar131;
        }
LAB_00efe75b:
        _local_7e0 = auVar130;
        local_7f8 = context;
        local_7d0 = pPVar123;
        local_7f0 = ray;
        auVar152 = local_760._0_16_;
      }
      if (8 < (int)uVar120) {
        local_380._0_16_ = vpshufd_avx(ZEXT416(uVar120),0);
        auVar178 = vshufps_avx(auVar152,auVar152,0);
        register0x00001210 = auVar178;
        _local_4c0 = auVar178;
        auVar105._4_4_ = fStack_7bc;
        auVar105._0_4_ = local_7c0;
        auVar105._8_4_ = fStack_7b8;
        auVar105._12_4_ = fStack_7b4;
        auVar178 = vpermilps_avx(auVar105,0);
        local_c0._16_16_ = auVar178;
        local_c0._0_16_ = auVar178;
        auVar133._0_4_ = 1.0 / (float)local_440._0_4_;
        auVar133._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar178 = vshufps_avx(auVar133,auVar133,0);
        _fStack_430 = auVar178;
        _local_440 = auVar178;
        auVar140 = ZEXT3264(_local_440);
        lVar122 = 8;
        local_720 = auVar271._0_32_;
        _local_620 = auVar214._0_32_;
        fVar223 = (float)local_540._0_4_;
        fVar241 = (float)local_540._4_4_;
        fVar171 = fStack_538;
        fVar337 = fStack_534;
        fVar293 = fStack_530;
        fVar314 = fStack_52c;
        fVar172 = fStack_528;
        fVar148 = fStack_524;
        do {
          local_640 = (int)uVar121;
          pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar122 * 4 + lVar117);
          fVar193 = *(float *)*pauVar1;
          fVar297 = *(float *)(*pauVar1 + 4);
          fVar196 = *(float *)(*pauVar1 + 8);
          fVar299 = *(float *)(*pauVar1 + 0xc);
          fVar242 = *(float *)(*pauVar1 + 0x10);
          fVar300 = *(float *)(*pauVar1 + 0x14);
          fVar146 = *(float *)(*pauVar1 + 0x18);
          auVar113 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar117 + 0x222bfac + lVar122 * 4);
          fVar301 = *(float *)*pauVar1;
          fVar243 = *(float *)(*pauVar1 + 4);
          fVar303 = *(float *)(*pauVar1 + 8);
          fVar302 = *(float *)(*pauVar1 + 0xc);
          fVar194 = *(float *)(*pauVar1 + 0x10);
          fVar294 = *(float *)(*pauVar1 + 0x14);
          fVar272 = *(float *)(*pauVar1 + 0x18);
          auVar112 = *pauVar1;
          pfVar3 = (float *)(lVar117 + 0x222c430 + lVar122 * 4);
          fVar273 = *pfVar3;
          fVar195 = pfVar3[1];
          fVar295 = pfVar3[2];
          fVar274 = pfVar3[3];
          fVar275 = pfVar3[4];
          fVar197 = pfVar3[5];
          fVar162 = pfVar3[6];
          pfVar3 = (float *)(lVar117 + 0x222c8b4 + lVar122 * 4);
          fVar127 = *pfVar3;
          fVar141 = pfVar3[1];
          fVar142 = pfVar3[2];
          fVar143 = pfVar3[3];
          fVar144 = pfVar3[4];
          fVar145 = pfVar3[5];
          fVar147 = pfVar3[6];
          fVar174 = auVar187._28_4_;
          fStack_7a4 = fVar174 + fVar174 + auVar140._28_4_;
          fVar227 = fVar174 + fVar174 + pfVar3[7];
          auVar330._0_4_ =
               (float)local_e0._0_4_ * fVar193 +
               fVar301 * auVar214._0_4_ + fVar273 * fVar223 + (float)local_420._0_4_ * fVar127;
          auVar330._4_4_ =
               (float)local_e0._4_4_ * fVar297 +
               fVar243 * auVar214._4_4_ + fVar195 * fVar241 + (float)local_420._4_4_ * fVar141;
          auVar330._8_4_ =
               fStack_d8 * fVar196 +
               fVar303 * auVar214._8_4_ + fVar295 * fVar171 + fStack_418 * fVar142;
          auVar330._12_4_ =
               fStack_d4 * fVar299 +
               fVar302 * auVar214._12_4_ + fVar274 * fVar337 + fStack_414 * fVar143;
          auVar330._16_4_ =
               fStack_d0 * fVar242 +
               fVar194 * auVar214._16_4_ + fVar275 * fVar293 + fStack_410 * fVar144;
          auVar330._20_4_ =
               fStack_cc * fVar300 +
               fVar294 * auVar214._20_4_ + fVar197 * fVar314 + fStack_40c * fVar145;
          auVar330._24_4_ =
               fStack_c8 * fVar146 +
               fVar272 * auVar214._24_4_ + fVar162 * fVar172 + fStack_408 * fVar147;
          auVar330._28_4_ = fVar174 + pfVar3[7] + fStack_7a4;
          local_760._0_4_ =
               fVar338 * fVar301 + fVar199 * fVar273 + fVar244 * fVar127 +
               (float)local_360._0_4_ * fVar193;
          local_760._4_4_ =
               fVar341 * fVar243 + fVar216 * fVar195 + fVar251 * fVar141 +
               (float)local_360._4_4_ * fVar297;
          local_760._8_4_ =
               fVar342 * fVar303 + fVar220 * fVar295 + fVar252 * fVar142 + fStack_358 * fVar196;
          local_760._12_4_ =
               fVar343 * fVar302 + fVar224 * fVar274 + fVar253 * fVar143 + fStack_354 * fVar299;
          local_760._16_4_ =
               fVar173 * fVar194 + fVar219 * fVar275 + fVar188 * fVar144 + fStack_350 * fVar242;
          local_760._20_4_ =
               fVar198 * fVar294 + fVar240 * fVar197 + fVar215 * fVar145 + fStack_34c * fVar300;
          local_760._24_4_ =
               fVar228 * fVar272 + fVar192 * fVar162 + fVar238 * fVar147 + fStack_348 * fVar146;
          local_760._28_4_ = fVar174 + fVar174 + auVar250._28_4_ + fStack_7a4;
          fVar128 = fVar193 * (float)local_140._0_4_ +
                    fVar301 * (float)local_120._0_4_ +
                    (float)local_80._0_4_ * fVar273 + fVar127 * (float)local_100._0_4_;
          fStack_7bc = fVar297 * (float)local_140._4_4_ +
                       fVar243 * (float)local_120._4_4_ +
                       (float)local_80._4_4_ * fVar195 + fVar141 * (float)local_100._4_4_;
          fStack_7b8 = fVar196 * fStack_138 +
                       fVar303 * fStack_118 + fStack_78 * fVar295 + fVar142 * fStack_f8;
          fStack_7b4 = fVar299 * fStack_134 +
                       fVar302 * fStack_114 + fStack_74 * fVar274 + fVar143 * fStack_f4;
          fStack_7b0 = fVar242 * fStack_130 +
                       fVar194 * fStack_110 + fStack_70 * fVar275 + fVar144 * fStack_f0;
          fStack_7ac = fVar300 * fStack_12c +
                       fVar294 * fStack_10c + fStack_6c * fVar197 + fVar145 * fStack_ec;
          fStack_7a8 = fVar146 * fStack_128 +
                       fVar272 * fStack_108 + fStack_68 * fVar162 + fVar147 * fStack_e8;
          fStack_7a4 = fStack_7a4 + fVar227;
          pfVar3 = (float *)(bspline_basis1 + lVar122 * 4 + lVar117);
          fVar301 = *pfVar3;
          fVar243 = pfVar3[1];
          fVar303 = pfVar3[2];
          fVar302 = pfVar3[3];
          fVar194 = pfVar3[4];
          fVar294 = pfVar3[5];
          fVar272 = pfVar3[6];
          pfVar3 = (float *)(lVar117 + 0x222e3cc + lVar122 * 4);
          fVar174 = *pfVar3;
          fVar189 = pfVar3[1];
          fVar191 = pfVar3[2];
          fVar126 = pfVar3[3];
          fVar149 = pfVar3[4];
          fVar159 = pfVar3[5];
          fVar160 = pfVar3[6];
          pfVar4 = (float *)(lVar117 + 0x222e850 + lVar122 * 4);
          fVar161 = *pfVar4;
          fVar200 = pfVar4[1];
          fVar217 = pfVar4[2];
          fVar221 = pfVar4[3];
          fVar225 = pfVar4[4];
          fVar229 = pfVar4[5];
          fVar239 = pfVar4[6];
          auVar9 = *(undefined1 (*) [32])(lVar117 + 0x222ecd4 + lVar122 * 4);
          auVar140 = ZEXT3264(auVar9);
          fVar193 = auVar9._0_4_;
          fVar297 = auVar9._4_4_;
          fVar196 = auVar9._8_4_;
          fVar299 = auVar9._12_4_;
          fVar242 = auVar9._16_4_;
          fVar300 = auVar9._20_4_;
          fVar146 = auVar9._24_4_;
          fVar227 = fVar148 + fVar148 + fVar227;
          local_660._0_4_ =
               (float)local_e0._0_4_ * fVar301 +
               fVar174 * auVar214._0_4_ + fVar161 * fVar223 + (float)local_420._0_4_ * fVar193;
          local_660._4_4_ =
               (float)local_e0._4_4_ * fVar243 +
               fVar189 * auVar214._4_4_ + fVar200 * fVar241 + (float)local_420._4_4_ * fVar297;
          local_660._8_4_ =
               fStack_d8 * fVar303 +
               fVar191 * auVar214._8_4_ + fVar217 * fVar171 + fStack_418 * fVar196;
          local_660._12_4_ =
               fStack_d4 * fVar302 +
               fVar126 * auVar214._12_4_ + fVar221 * fVar337 + fStack_414 * fVar299;
          local_660._16_4_ =
               fStack_d0 * fVar194 +
               fVar149 * auVar214._16_4_ + fVar225 * fVar293 + fStack_410 * fVar242;
          local_660._20_4_ =
               fStack_cc * fVar294 +
               fVar159 * auVar214._20_4_ + fVar229 * fVar314 + fStack_40c * fVar300;
          local_660._24_4_ =
               fStack_c8 * fVar272 +
               fVar160 * auVar214._24_4_ + fVar239 * fVar172 + fStack_408 * fVar146;
          local_660._28_4_ = auVar214._28_4_ + fVar227;
          auVar236._0_4_ =
               fVar301 * (float)local_360._0_4_ +
               fVar174 * fVar338 + fVar199 * fVar161 + fVar244 * fVar193;
          auVar236._4_4_ =
               fVar243 * (float)local_360._4_4_ +
               fVar189 * fVar341 + fVar216 * fVar200 + fVar251 * fVar297;
          auVar236._8_4_ =
               fVar303 * fStack_358 + fVar191 * fVar342 + fVar220 * fVar217 + fVar252 * fVar196;
          auVar236._12_4_ =
               fVar302 * fStack_354 + fVar126 * fVar343 + fVar224 * fVar221 + fVar253 * fVar299;
          auVar236._16_4_ =
               fVar194 * fStack_350 + fVar149 * fVar173 + fVar219 * fVar225 + fVar188 * fVar242;
          auVar236._20_4_ =
               fVar294 * fStack_34c + fVar159 * fVar198 + fVar240 * fVar229 + fVar215 * fVar300;
          auVar236._24_4_ =
               fVar272 * fStack_348 + fVar160 * fVar228 + fVar192 * fVar239 + fVar238 * fVar146;
          auVar236._28_4_ = fVar227 + fVar148 + fVar148 + fVar190;
          auVar318._0_4_ =
               (float)local_80._0_4_ * fVar161 + fVar193 * (float)local_100._0_4_ +
               fVar174 * (float)local_120._0_4_ + fVar301 * (float)local_140._0_4_;
          auVar318._4_4_ =
               (float)local_80._4_4_ * fVar200 + fVar297 * (float)local_100._4_4_ +
               fVar189 * (float)local_120._4_4_ + fVar243 * (float)local_140._4_4_;
          auVar318._8_4_ =
               fStack_78 * fVar217 + fVar196 * fStack_f8 + fVar191 * fStack_118 +
               fVar303 * fStack_138;
          auVar318._12_4_ =
               fStack_74 * fVar221 + fVar299 * fStack_f4 + fVar126 * fStack_114 +
               fVar302 * fStack_134;
          auVar318._16_4_ =
               fStack_70 * fVar225 + fVar242 * fStack_f0 + fVar149 * fStack_110 +
               fVar194 * fStack_130;
          auVar318._20_4_ =
               fStack_6c * fVar229 + fVar300 * fStack_ec + fVar159 * fStack_10c +
               fVar294 * fStack_12c;
          auVar318._24_4_ =
               fStack_68 * fVar239 + fVar146 * fStack_e8 + fVar160 * fStack_108 +
               fVar272 * fStack_128;
          auVar318._28_4_ = fVar148 + fStack_404 + fVar148 + fVar227;
          auVar15 = vsubps_avx(local_660,auVar330);
          _local_3c0 = vsubps_avx(auVar236,local_760);
          fVar173 = auVar15._0_4_;
          fVar228 = auVar15._4_4_;
          auVar26._4_4_ = local_760._4_4_ * fVar228;
          auVar26._0_4_ = (float)local_760._0_4_ * fVar173;
          fVar215 = auVar15._8_4_;
          auVar26._8_4_ = local_760._8_4_ * fVar215;
          fVar190 = auVar15._12_4_;
          auVar26._12_4_ = local_760._12_4_ * fVar190;
          fVar241 = auVar15._16_4_;
          auVar26._16_4_ = local_760._16_4_ * fVar241;
          fVar337 = auVar15._20_4_;
          auVar26._20_4_ = local_760._20_4_ * fVar337;
          fVar314 = auVar15._24_4_;
          auVar26._24_4_ = local_760._24_4_ * fVar314;
          auVar26._28_4_ = fVar227;
          fVar198 = local_3c0._0_4_;
          fVar188 = local_3c0._4_4_;
          auVar27._4_4_ = auVar330._4_4_ * fVar188;
          auVar27._0_4_ = auVar330._0_4_ * fVar198;
          fVar238 = local_3c0._8_4_;
          auVar27._8_4_ = auVar330._8_4_ * fVar238;
          fVar223 = local_3c0._12_4_;
          auVar27._12_4_ = auVar330._12_4_ * fVar223;
          fVar171 = local_3c0._16_4_;
          auVar27._16_4_ = auVar330._16_4_ * fVar171;
          fVar293 = local_3c0._20_4_;
          auVar27._20_4_ = auVar330._20_4_ * fVar293;
          fVar172 = local_3c0._24_4_;
          auVar27._24_4_ = auVar330._24_4_ * fVar172;
          auVar27._28_4_ = auVar236._28_4_;
          auVar20 = vsubps_avx(auVar26,auVar27);
          auVar106._4_4_ = fStack_7bc;
          auVar106._0_4_ = fVar128;
          auVar106._8_4_ = fStack_7b8;
          auVar106._12_4_ = fStack_7b4;
          auVar106._16_4_ = fStack_7b0;
          auVar106._20_4_ = fStack_7ac;
          auVar106._24_4_ = fStack_7a8;
          auVar106._28_4_ = fStack_7a4;
          auVar268 = vmaxps_avx(auVar106,auVar318);
          auVar14._4_4_ = auVar268._4_4_ * auVar268._4_4_ * (fVar228 * fVar228 + fVar188 * fVar188);
          auVar14._0_4_ = auVar268._0_4_ * auVar268._0_4_ * (fVar173 * fVar173 + fVar198 * fVar198);
          auVar14._8_4_ = auVar268._8_4_ * auVar268._8_4_ * (fVar215 * fVar215 + fVar238 * fVar238);
          auVar14._12_4_ =
               auVar268._12_4_ * auVar268._12_4_ * (fVar190 * fVar190 + fVar223 * fVar223);
          auVar14._16_4_ =
               auVar268._16_4_ * auVar268._16_4_ * (fVar241 * fVar241 + fVar171 * fVar171);
          auVar14._20_4_ =
               auVar268._20_4_ * auVar268._20_4_ * (fVar337 * fVar337 + fVar293 * fVar293);
          auVar14._24_4_ =
               auVar268._24_4_ * auVar268._24_4_ * (fVar314 * fVar314 + fVar172 * fVar172);
          auVar14._28_4_ = local_660._28_4_ + auVar236._28_4_;
          auVar59._4_4_ = auVar20._4_4_ * auVar20._4_4_;
          auVar59._0_4_ = auVar20._0_4_ * auVar20._0_4_;
          auVar59._8_4_ = auVar20._8_4_ * auVar20._8_4_;
          auVar59._12_4_ = auVar20._12_4_ * auVar20._12_4_;
          auVar59._16_4_ = auVar20._16_4_ * auVar20._16_4_;
          auVar59._20_4_ = auVar20._20_4_ * auVar20._20_4_;
          auVar59._24_4_ = auVar20._24_4_ * auVar20._24_4_;
          auVar59._28_4_ = auVar20._28_4_;
          auVar268 = vcmpps_avx(auVar59,auVar14,2);
          local_2c0 = (uint)lVar122;
          auVar166 = vpshufd_avx(ZEXT416(local_2c0),0);
          auVar178 = vpor_avx(auVar166,_DAT_01ff0cf0);
          auVar166 = vpor_avx(auVar166,_DAT_02020ea0);
          auVar178 = vpcmpgtd_avx(local_380._0_16_,auVar178);
          auVar250 = ZEXT1664(auVar178);
          auVar166 = vpcmpgtd_avx(local_380._0_16_,auVar166);
          register0x000012d0 = auVar166;
          _local_3a0 = auVar178;
          auVar187 = ZEXT3264(_local_3a0);
          auVar20 = _local_3a0 & auVar268;
          fVar244 = (float)local_6e0._0_4_;
          fVar251 = (float)local_6e0._4_4_;
          fVar252 = fStack_6d8;
          fVar253 = fStack_6d4;
          fVar188 = fStack_6d0;
          fVar215 = fStack_6cc;
          fVar238 = fStack_6c8;
          fVar190 = fStack_6c4;
          fVar223 = (float)local_540._0_4_;
          fVar241 = (float)local_540._4_4_;
          fVar171 = fStack_538;
          fVar337 = fStack_534;
          fVar293 = fStack_530;
          fVar314 = fStack_52c;
          fVar172 = fStack_528;
          fVar148 = fStack_524;
          fVar338 = (float)local_740._0_4_;
          fVar341 = (float)local_740._4_4_;
          fVar342 = fStack_738;
          fVar343 = fStack_734;
          fVar173 = fStack_730;
          fVar198 = fStack_72c;
          fVar228 = fStack_728;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0x7f,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0xbf,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar20[0x1f]) {
            auVar271 = ZEXT3264(local_720);
            auVar214 = ZEXT3264(_local_620);
            uVar121 = uVar121 & 0xffffffff;
          }
          else {
            local_520._0_4_ =
                 fVar301 * (float)local_160._0_4_ +
                 fVar174 * (float)local_180._0_4_ +
                 fVar161 * (float)local_a0._0_4_ + (float)local_4a0._0_4_ * fVar193;
            local_520._4_4_ =
                 fVar243 * (float)local_160._4_4_ +
                 fVar189 * (float)local_180._4_4_ +
                 fVar200 * (float)local_a0._4_4_ + (float)local_4a0._4_4_ * fVar297;
            fStack_518 = fVar303 * fStack_158 +
                         fVar191 * fStack_178 + fVar217 * fStack_98 + fStack_498 * fVar196;
            fStack_514 = fVar302 * fStack_154 +
                         fVar126 * fStack_174 + fVar221 * fStack_94 + fStack_494 * fVar299;
            fStack_510 = fVar194 * fStack_150 +
                         fVar149 * fStack_170 + fVar225 * fStack_90 + fStack_490 * fVar242;
            fStack_50c = fVar294 * fStack_14c +
                         fVar159 * fStack_16c + fVar229 * fStack_8c + fStack_48c * fVar300;
            fStack_508 = fVar272 * fStack_148 +
                         fVar160 * fStack_168 + fVar239 * fStack_88 + fStack_488 * fVar146;
            fStack_504 = pfVar3[7] + auVar9._28_4_ + auVar268._28_4_ + 0.0;
            local_680._0_4_ = auVar112._0_4_;
            local_680._4_4_ = auVar112._4_4_;
            fStack_678 = auVar112._8_4_;
            fStack_674 = auVar112._12_4_;
            auStack_670._0_4_ = auVar112._16_4_;
            auStack_670._4_4_ = auVar112._20_4_;
            fStack_668 = auVar112._24_4_;
            pfVar3 = (float *)(lVar117 + 0x222d640 + lVar122 * 4);
            fVar193 = *pfVar3;
            fVar297 = pfVar3[1];
            fVar196 = pfVar3[2];
            fVar299 = pfVar3[3];
            fVar242 = pfVar3[4];
            fVar300 = pfVar3[5];
            fVar146 = pfVar3[6];
            pfVar4 = (float *)(lVar117 + 0x222dac4 + lVar122 * 4);
            fVar301 = *pfVar4;
            fVar243 = pfVar4[1];
            fVar303 = pfVar4[2];
            fVar302 = pfVar4[3];
            fVar194 = pfVar4[4];
            fVar294 = pfVar4[5];
            fVar272 = pfVar4[6];
            pfVar5 = (float *)(lVar117 + 0x222d1bc + lVar122 * 4);
            fVar174 = *pfVar5;
            fVar189 = pfVar5[1];
            fVar191 = pfVar5[2];
            fVar126 = pfVar5[3];
            fVar149 = pfVar5[4];
            fVar159 = pfVar5[5];
            fVar160 = pfVar5[6];
            fVar227 = pfVar3[7] + pfVar4[7];
            fVar163 = pfVar4[7] + auVar330._28_4_ + 0.0;
            fVar254 = auVar330._28_4_ + auVar318._28_4_ + auVar330._28_4_ + 0.0;
            pfVar3 = (float *)(lVar117 + 0x222cd38 + lVar122 * 4);
            fVar161 = *pfVar3;
            fVar200 = pfVar3[1];
            fVar217 = pfVar3[2];
            fVar221 = pfVar3[3];
            fVar225 = pfVar3[4];
            fVar229 = pfVar3[5];
            fVar239 = pfVar3[6];
            local_580 = (float)local_e0._0_4_ * fVar161 +
                        fVar174 * (float)local_620._0_4_ +
                        (float)local_540._0_4_ * fVar193 + (float)local_420._0_4_ * fVar301;
            fStack_57c = (float)local_e0._4_4_ * fVar200 +
                         fVar189 * (float)local_620._4_4_ +
                         (float)local_540._4_4_ * fVar297 + (float)local_420._4_4_ * fVar243;
            fStack_578 = fStack_d8 * fVar217 +
                         fVar191 * fStack_618 + fStack_538 * fVar196 + fStack_418 * fVar303;
            fStack_574 = fStack_d4 * fVar221 +
                         fVar126 * fStack_614 + fStack_534 * fVar299 + fStack_414 * fVar302;
            fStack_570 = fStack_d0 * fVar225 +
                         fVar149 * fStack_610 + fStack_530 * fVar242 + fStack_410 * fVar194;
            fStack_56c = fStack_cc * fVar229 +
                         fVar159 * fStack_60c + fStack_52c * fVar300 + fStack_40c * fVar294;
            fStack_568 = fStack_c8 * fVar239 +
                         fVar160 * fStack_608 + fStack_528 * fVar146 + fStack_408 * fVar272;
            fStack_564 = fVar227 + fVar163;
            auVar155._0_4_ =
                 (float)local_360._0_4_ * fVar161 +
                 fVar199 * fVar193 + (float)local_6e0._0_4_ * fVar301 +
                 fVar174 * (float)local_740._0_4_;
            auVar155._4_4_ =
                 (float)local_360._4_4_ * fVar200 +
                 fVar216 * fVar297 + (float)local_6e0._4_4_ * fVar243 +
                 fVar189 * (float)local_740._4_4_;
            auVar155._8_4_ =
                 fStack_358 * fVar217 +
                 fVar220 * fVar196 + fStack_6d8 * fVar303 + fVar191 * fStack_738;
            auVar155._12_4_ =
                 fStack_354 * fVar221 +
                 fVar224 * fVar299 + fStack_6d4 * fVar302 + fVar126 * fStack_734;
            auVar155._16_4_ =
                 fStack_350 * fVar225 +
                 fVar219 * fVar242 + fStack_6d0 * fVar194 + fVar149 * fStack_730;
            auVar155._20_4_ =
                 fStack_34c * fVar229 +
                 fVar240 * fVar300 + fStack_6cc * fVar294 + fVar159 * fStack_72c;
            auVar155._24_4_ =
                 fStack_348 * fVar239 +
                 fVar192 * fVar146 + fStack_6c8 * fVar272 + fVar160 * fStack_728;
            auVar155._28_4_ = fVar163 + fVar254;
            auVar319._0_4_ =
                 (float)local_180._0_4_ * fVar174 +
                 (float)local_a0._0_4_ * fVar193 + (float)local_4a0._0_4_ * fVar301 +
                 fVar161 * (float)local_160._0_4_;
            auVar319._4_4_ =
                 (float)local_180._4_4_ * fVar189 +
                 (float)local_a0._4_4_ * fVar297 + (float)local_4a0._4_4_ * fVar243 +
                 fVar200 * (float)local_160._4_4_;
            auVar319._8_4_ =
                 fStack_178 * fVar191 + fStack_98 * fVar196 + fStack_498 * fVar303 +
                 fVar217 * fStack_158;
            auVar319._12_4_ =
                 fStack_174 * fVar126 + fStack_94 * fVar299 + fStack_494 * fVar302 +
                 fVar221 * fStack_154;
            auVar319._16_4_ =
                 fStack_170 * fVar149 + fStack_90 * fVar242 + fStack_490 * fVar194 +
                 fVar225 * fStack_150;
            auVar319._20_4_ =
                 fStack_16c * fVar159 + fStack_8c * fVar300 + fStack_48c * fVar294 +
                 fVar229 * fStack_14c;
            auVar319._24_4_ =
                 fStack_168 * fVar160 + fStack_88 * fVar146 + fStack_488 * fVar272 +
                 fVar239 * fStack_148;
            auVar319._28_4_ = pfVar5[7] + fVar227 + fVar254;
            pfVar3 = (float *)(lVar117 + 0x222fa60 + lVar122 * 4);
            fVar219 = *pfVar3;
            fVar240 = pfVar3[1];
            fVar192 = pfVar3[2];
            fVar193 = pfVar3[3];
            fVar297 = pfVar3[4];
            fVar196 = pfVar3[5];
            fVar299 = pfVar3[6];
            pfVar4 = (float *)(lVar117 + 0x222fee4 + lVar122 * 4);
            fVar242 = *pfVar4;
            fVar300 = pfVar4[1];
            fVar146 = pfVar4[2];
            fVar301 = pfVar4[3];
            fVar243 = pfVar4[4];
            fVar303 = pfVar4[5];
            fVar302 = pfVar4[6];
            pfVar5 = (float *)(lVar117 + 0x222f5dc + lVar122 * 4);
            fVar194 = *pfVar5;
            fVar294 = pfVar5[1];
            fVar272 = pfVar5[2];
            fVar174 = pfVar5[3];
            fVar189 = pfVar5[4];
            fVar191 = pfVar5[5];
            fVar199 = pfVar5[6];
            pfVar6 = (float *)(lVar117 + 0x222f158 + lVar122 * 4);
            fVar216 = *pfVar6;
            fVar220 = pfVar6[1];
            fVar224 = pfVar6[2];
            fVar126 = pfVar6[3];
            fVar149 = pfVar6[4];
            fVar159 = pfVar6[5];
            fVar160 = pfVar6[6];
            auVar280._0_4_ =
                 (float)local_e0._0_4_ * fVar216 +
                 fVar194 * (float)local_620._0_4_ +
                 (float)local_540._0_4_ * fVar219 + (float)local_420._0_4_ * fVar242;
            auVar280._4_4_ =
                 (float)local_e0._4_4_ * fVar220 +
                 fVar294 * (float)local_620._4_4_ +
                 (float)local_540._4_4_ * fVar240 + (float)local_420._4_4_ * fVar300;
            auVar280._8_4_ =
                 fStack_d8 * fVar224 +
                 fVar272 * fStack_618 + fStack_538 * fVar192 + fStack_418 * fVar146;
            auVar280._12_4_ =
                 fStack_d4 * fVar126 +
                 fVar174 * fStack_614 + fStack_534 * fVar193 + fStack_414 * fVar301;
            auVar280._16_4_ =
                 fStack_d0 * fVar149 +
                 fVar189 * fStack_610 + fStack_530 * fVar297 + fStack_410 * fVar243;
            auVar280._20_4_ =
                 fStack_cc * fVar159 +
                 fVar191 * fStack_60c + fStack_52c * fVar196 + fStack_40c * fVar303;
            auVar280._24_4_ =
                 fStack_c8 * fVar160 +
                 fVar199 * fStack_608 + fStack_528 * fVar299 + fStack_408 * fVar302;
            auVar280._28_4_ = fStack_164 + fStack_164 + fStack_524 + fStack_164;
            auVar309._0_4_ =
                 (float)local_360._0_4_ * fVar216 +
                 fVar194 * (float)local_740._0_4_ +
                 fVar219 * (float)local_700._0_4_ + (float)local_6e0._0_4_ * fVar242;
            auVar309._4_4_ =
                 (float)local_360._4_4_ * fVar220 +
                 fVar294 * (float)local_740._4_4_ +
                 fVar240 * (float)local_700._4_4_ + (float)local_6e0._4_4_ * fVar300;
            auVar309._8_4_ =
                 fStack_358 * fVar224 +
                 fVar272 * fStack_738 + fVar192 * fStack_6f8 + fStack_6d8 * fVar146;
            auVar309._12_4_ =
                 fStack_354 * fVar126 +
                 fVar174 * fStack_734 + fVar193 * fStack_6f4 + fStack_6d4 * fVar301;
            auVar309._16_4_ =
                 fStack_350 * fVar149 +
                 fVar189 * fStack_730 + fVar297 * fStack_6f0 + fStack_6d0 * fVar243;
            auVar309._20_4_ =
                 fStack_34c * fVar159 +
                 fVar191 * fStack_72c + fVar196 * fStack_6ec + fStack_6cc * fVar303;
            auVar309._24_4_ =
                 fStack_348 * fVar160 +
                 fVar199 * fStack_728 + fVar299 * fStack_6e8 + fStack_6c8 * fVar302;
            auVar309._28_4_ = fStack_164 + fStack_164 + fStack_6c4 + fStack_164;
            auVar237._8_4_ = 0x7fffffff;
            auVar237._0_8_ = 0x7fffffff7fffffff;
            auVar237._12_4_ = 0x7fffffff;
            auVar237._16_4_ = 0x7fffffff;
            auVar237._20_4_ = 0x7fffffff;
            auVar237._24_4_ = 0x7fffffff;
            auVar237._28_4_ = 0x7fffffff;
            auVar109._4_4_ = fStack_57c;
            auVar109._0_4_ = local_580;
            auVar109._8_4_ = fStack_578;
            auVar109._12_4_ = fStack_574;
            auVar109._16_4_ = fStack_570;
            auVar109._20_4_ = fStack_56c;
            auVar109._24_4_ = fStack_568;
            auVar109._28_4_ = fStack_564;
            auVar9 = vandps_avx(auVar109,auVar237);
            auVar20 = vandps_avx(auVar155,auVar237);
            auVar20 = vmaxps_avx(auVar9,auVar20);
            auVar9 = vandps_avx(auVar319,auVar237);
            auVar20 = vmaxps_avx(auVar20,auVar9);
            auVar20 = vcmpps_avx(auVar20,_local_4c0,1);
            auVar19 = vblendvps_avx(auVar109,auVar15,auVar20);
            auVar137._0_4_ =
                 fVar216 * (float)local_160._0_4_ +
                 fVar194 * (float)local_180._0_4_ +
                 fVar242 * (float)local_4a0._0_4_ + (float)local_a0._0_4_ * fVar219;
            auVar137._4_4_ =
                 fVar220 * (float)local_160._4_4_ +
                 fVar294 * (float)local_180._4_4_ +
                 fVar300 * (float)local_4a0._4_4_ + (float)local_a0._4_4_ * fVar240;
            auVar137._8_4_ =
                 fVar224 * fStack_158 +
                 fVar272 * fStack_178 + fVar146 * fStack_498 + fStack_98 * fVar192;
            auVar137._12_4_ =
                 fVar126 * fStack_154 +
                 fVar174 * fStack_174 + fVar301 * fStack_494 + fStack_94 * fVar193;
            auVar137._16_4_ =
                 fVar149 * fStack_150 +
                 fVar189 * fStack_170 + fVar243 * fStack_490 + fStack_90 * fVar297;
            auVar137._20_4_ =
                 fVar159 * fStack_14c +
                 fVar191 * fStack_16c + fVar303 * fStack_48c + fStack_8c * fVar196;
            auVar137._24_4_ =
                 fVar160 * fStack_148 +
                 fVar199 * fStack_168 + fVar302 * fStack_488 + fStack_88 * fVar299;
            auVar137._28_4_ = auVar9._28_4_ + pfVar5[7] + pfVar4[7] + pfVar3[7];
            auVar28 = vblendvps_avx(auVar155,_local_3c0,auVar20);
            auVar9 = vandps_avx(auVar280,auVar237);
            auVar20 = vandps_avx(auVar309,auVar237);
            auVar16 = vmaxps_avx(auVar9,auVar20);
            auVar9 = vandps_avx(auVar137,auVar237);
            auVar9 = vmaxps_avx(auVar16,auVar9);
            local_600._0_4_ = auVar113._0_4_;
            local_600._4_4_ = auVar113._4_4_;
            fStack_5f8 = auVar113._8_4_;
            fStack_5f4 = auVar113._12_4_;
            auStack_5f0._0_4_ = auVar113._16_4_;
            auStack_5f0._4_4_ = auVar113._20_4_;
            fStack_5e8 = auVar113._24_4_;
            auVar20 = vcmpps_avx(auVar9,_local_4c0,1);
            auVar9 = vblendvps_avx(auVar280,auVar15,auVar20);
            auVar138._0_4_ =
                 (float)local_160._0_4_ * (float)local_600._0_4_ +
                 (float)local_180._0_4_ * (float)local_680._0_4_ +
                 (float)local_a0._0_4_ * fVar273 + (float)local_4a0._0_4_ * fVar127;
            auVar138._4_4_ =
                 (float)local_160._4_4_ * (float)local_600._4_4_ +
                 (float)local_180._4_4_ * (float)local_680._4_4_ +
                 (float)local_a0._4_4_ * fVar195 + (float)local_4a0._4_4_ * fVar141;
            auVar138._8_4_ =
                 fStack_158 * fStack_5f8 +
                 fStack_178 * fStack_678 + fStack_98 * fVar295 + fStack_498 * fVar142;
            auVar138._12_4_ =
                 fStack_154 * fStack_5f4 +
                 fStack_174 * fStack_674 + fStack_94 * fVar274 + fStack_494 * fVar143;
            auVar138._16_4_ =
                 fStack_150 * (float)auStack_5f0._0_4_ +
                 fStack_170 * (float)auStack_670._0_4_ + fStack_90 * fVar275 + fStack_490 * fVar144;
            auVar138._20_4_ =
                 fStack_14c * (float)auStack_5f0._4_4_ +
                 fStack_16c * (float)auStack_670._4_4_ + fStack_8c * fVar197 + fStack_48c * fVar145;
            auVar138._24_4_ =
                 fStack_148 * fStack_5e8 +
                 fStack_168 * fStack_668 + fStack_88 * fVar162 + fStack_488 * fVar147;
            auVar138._28_4_ = auVar16._28_4_ + fStack_504 + auVar268._28_4_ + 0.0;
            auVar15 = vblendvps_avx(auVar309,_local_3c0,auVar20);
            fVar216 = auVar19._0_4_;
            fVar220 = auVar19._4_4_;
            fVar224 = auVar19._8_4_;
            fVar126 = auVar19._12_4_;
            fVar149 = auVar19._16_4_;
            fVar159 = auVar19._20_4_;
            fVar160 = auVar19._24_4_;
            fVar161 = auVar19._28_4_;
            fVar194 = auVar9._0_4_;
            fVar272 = auVar9._4_4_;
            fVar195 = auVar9._8_4_;
            fVar274 = auVar9._12_4_;
            fVar197 = auVar9._16_4_;
            fVar127 = auVar9._20_4_;
            fVar142 = auVar9._24_4_;
            fVar219 = auVar28._0_4_;
            fVar192 = auVar28._4_4_;
            fVar297 = auVar28._8_4_;
            fVar299 = auVar28._12_4_;
            fVar300 = auVar28._16_4_;
            fVar301 = auVar28._20_4_;
            fVar303 = auVar28._24_4_;
            auVar290._0_4_ = fVar219 * fVar219 + fVar216 * fVar216;
            auVar290._4_4_ = fVar192 * fVar192 + fVar220 * fVar220;
            auVar290._8_4_ = fVar297 * fVar297 + fVar224 * fVar224;
            auVar290._12_4_ = fVar299 * fVar299 + fVar126 * fVar126;
            auVar290._16_4_ = fVar300 * fVar300 + fVar149 * fVar149;
            auVar290._20_4_ = fVar301 * fVar301 + fVar159 * fVar159;
            auVar290._24_4_ = fVar303 * fVar303 + fVar160 * fVar160;
            auVar290._28_4_ = fStack_c4 + local_3c0._28_4_;
            auVar20 = vrsqrtps_avx(auVar290);
            fVar240 = auVar20._0_4_;
            fVar193 = auVar20._4_4_;
            auVar60._4_4_ = fVar193 * 1.5;
            auVar60._0_4_ = fVar240 * 1.5;
            fVar196 = auVar20._8_4_;
            auVar60._8_4_ = fVar196 * 1.5;
            fVar242 = auVar20._12_4_;
            auVar60._12_4_ = fVar242 * 1.5;
            fVar146 = auVar20._16_4_;
            auVar60._16_4_ = fVar146 * 1.5;
            fVar243 = auVar20._20_4_;
            auVar60._20_4_ = fVar243 * 1.5;
            fVar302 = auVar20._24_4_;
            auVar60._24_4_ = fVar302 * 1.5;
            auVar60._28_4_ = auVar309._28_4_;
            auVar61._4_4_ = fVar193 * fVar193 * fVar193 * auVar290._4_4_ * 0.5;
            auVar61._0_4_ = fVar240 * fVar240 * fVar240 * auVar290._0_4_ * 0.5;
            auVar61._8_4_ = fVar196 * fVar196 * fVar196 * auVar290._8_4_ * 0.5;
            auVar61._12_4_ = fVar242 * fVar242 * fVar242 * auVar290._12_4_ * 0.5;
            auVar61._16_4_ = fVar146 * fVar146 * fVar146 * auVar290._16_4_ * 0.5;
            auVar61._20_4_ = fVar243 * fVar243 * fVar243 * auVar290._20_4_ * 0.5;
            auVar61._24_4_ = fVar302 * fVar302 * fVar302 * auVar290._24_4_ * 0.5;
            auVar61._28_4_ = auVar290._28_4_;
            auVar19 = vsubps_avx(auVar60,auVar61);
            fVar144 = auVar19._0_4_;
            fVar145 = auVar19._4_4_;
            fVar147 = auVar19._8_4_;
            fVar174 = auVar19._12_4_;
            fVar189 = auVar19._16_4_;
            fVar191 = auVar19._20_4_;
            fVar199 = auVar19._24_4_;
            fVar240 = auVar15._0_4_;
            fVar193 = auVar15._4_4_;
            fVar196 = auVar15._8_4_;
            fVar242 = auVar15._12_4_;
            fVar146 = auVar15._16_4_;
            fVar243 = auVar15._20_4_;
            fVar302 = auVar15._24_4_;
            auVar270._0_4_ = fVar240 * fVar240 + fVar194 * fVar194;
            auVar270._4_4_ = fVar193 * fVar193 + fVar272 * fVar272;
            auVar270._8_4_ = fVar196 * fVar196 + fVar195 * fVar195;
            auVar270._12_4_ = fVar242 * fVar242 + fVar274 * fVar274;
            auVar270._16_4_ = fVar146 * fVar146 + fVar197 * fVar197;
            auVar270._20_4_ = fVar243 * fVar243 + fVar127 * fVar127;
            auVar270._24_4_ = fVar302 * fVar302 + fVar142 * fVar142;
            auVar270._28_4_ = auVar20._28_4_ + auVar9._28_4_;
            auVar9 = vrsqrtps_avx(auVar270);
            fVar294 = auVar9._0_4_;
            fVar273 = auVar9._4_4_;
            auVar62._4_4_ = fVar273 * 1.5;
            auVar62._0_4_ = fVar294 * 1.5;
            fVar295 = auVar9._8_4_;
            auVar62._8_4_ = fVar295 * 1.5;
            fVar275 = auVar9._12_4_;
            auVar62._12_4_ = fVar275 * 1.5;
            fVar162 = auVar9._16_4_;
            auVar62._16_4_ = fVar162 * 1.5;
            fVar141 = auVar9._20_4_;
            auVar62._20_4_ = fVar141 * 1.5;
            fVar143 = auVar9._24_4_;
            auVar62._24_4_ = fVar143 * 1.5;
            auVar62._28_4_ = auVar309._28_4_;
            auVar63._4_4_ = fVar273 * fVar273 * fVar273 * auVar270._4_4_ * 0.5;
            auVar63._0_4_ = fVar294 * fVar294 * fVar294 * auVar270._0_4_ * 0.5;
            auVar63._8_4_ = fVar295 * fVar295 * fVar295 * auVar270._8_4_ * 0.5;
            auVar63._12_4_ = fVar275 * fVar275 * fVar275 * auVar270._12_4_ * 0.5;
            auVar63._16_4_ = fVar162 * fVar162 * fVar162 * auVar270._16_4_ * 0.5;
            auVar63._20_4_ = fVar141 * fVar141 * fVar141 * auVar270._20_4_ * 0.5;
            auVar63._24_4_ = fVar143 * fVar143 * fVar143 * auVar270._24_4_ * 0.5;
            auVar63._28_4_ = auVar270._28_4_;
            auVar15 = vsubps_avx(auVar62,auVar63);
            fVar294 = auVar15._0_4_;
            fVar273 = auVar15._4_4_;
            fVar295 = auVar15._8_4_;
            fVar275 = auVar15._12_4_;
            fVar162 = auVar15._16_4_;
            fVar141 = auVar15._20_4_;
            fVar143 = auVar15._24_4_;
            fVar219 = fVar128 * fVar144 * fVar219;
            fVar192 = fStack_7bc * fVar145 * fVar192;
            auVar64._4_4_ = fVar192;
            auVar64._0_4_ = fVar219;
            fVar297 = fStack_7b8 * fVar147 * fVar297;
            auVar64._8_4_ = fVar297;
            fVar299 = fStack_7b4 * fVar174 * fVar299;
            auVar64._12_4_ = fVar299;
            fVar300 = fStack_7b0 * fVar189 * fVar300;
            auVar64._16_4_ = fVar300;
            fVar301 = fStack_7ac * fVar191 * fVar301;
            auVar64._20_4_ = fVar301;
            fVar303 = fStack_7a8 * fVar199 * fVar303;
            auVar64._24_4_ = fVar303;
            auVar64._28_4_ = auVar9._28_4_;
            local_600._4_4_ = fVar192 + auVar330._4_4_;
            local_600._0_4_ = fVar219 + auVar330._0_4_;
            fStack_5f8 = fVar297 + auVar330._8_4_;
            fStack_5f4 = fVar299 + auVar330._12_4_;
            auStack_5f0._0_4_ = fVar300 + auVar330._16_4_;
            auStack_5f0._4_4_ = fVar301 + auVar330._20_4_;
            fStack_5e8 = fVar303 + auVar330._24_4_;
            fStack_5e4 = auVar9._28_4_ + auVar330._28_4_;
            local_560 = fVar128 * fVar144 * -fVar216;
            fStack_55c = fStack_7bc * fVar145 * -fVar220;
            auVar65._4_4_ = fStack_55c;
            auVar65._0_4_ = local_560;
            fStack_558 = fStack_7b8 * fVar147 * -fVar224;
            auVar65._8_4_ = fStack_558;
            fStack_554 = fStack_7b4 * fVar174 * -fVar126;
            auVar65._12_4_ = fStack_554;
            fStack_550 = fStack_7b0 * fVar189 * -fVar149;
            auVar65._16_4_ = fStack_550;
            fStack_54c = fStack_7ac * fVar191 * -fVar159;
            auVar65._20_4_ = fStack_54c;
            fStack_548 = fStack_7a8 * fVar199 * -fVar160;
            auVar65._24_4_ = fStack_548;
            auVar65._28_4_ = -fVar161;
            local_560 = (float)local_760._0_4_ + local_560;
            fStack_55c = local_760._4_4_ + fStack_55c;
            fStack_558 = local_760._8_4_ + fStack_558;
            fStack_554 = local_760._12_4_ + fStack_554;
            fStack_550 = local_760._16_4_ + fStack_550;
            fStack_54c = local_760._20_4_ + fStack_54c;
            fStack_548 = local_760._24_4_ + fStack_548;
            fStack_544 = local_760._28_4_ + -fVar161;
            fVar219 = fVar144 * 0.0 * fVar128;
            fVar192 = fVar145 * 0.0 * fStack_7bc;
            auVar66._4_4_ = fVar192;
            auVar66._0_4_ = fVar219;
            fVar297 = fVar147 * 0.0 * fStack_7b8;
            auVar66._8_4_ = fVar297;
            fVar299 = fVar174 * 0.0 * fStack_7b4;
            auVar66._12_4_ = fVar299;
            fVar300 = fVar189 * 0.0 * fStack_7b0;
            auVar66._16_4_ = fVar300;
            fVar301 = fVar191 * 0.0 * fStack_7ac;
            auVar66._20_4_ = fVar301;
            fVar303 = fVar199 * 0.0 * fStack_7a8;
            auVar66._24_4_ = fVar303;
            auVar66._28_4_ = fVar161;
            auVar25 = vsubps_avx(auVar330,auVar64);
            auVar340._0_4_ = fVar219 + auVar138._0_4_;
            auVar340._4_4_ = fVar192 + auVar138._4_4_;
            auVar340._8_4_ = fVar297 + auVar138._8_4_;
            auVar340._12_4_ = fVar299 + auVar138._12_4_;
            auVar340._16_4_ = fVar300 + auVar138._16_4_;
            auVar340._20_4_ = fVar301 + auVar138._20_4_;
            auVar340._24_4_ = fVar303 + auVar138._24_4_;
            auVar340._28_4_ = fVar161 + auVar138._28_4_;
            fVar219 = auVar318._0_4_ * fVar294 * fVar240;
            fVar240 = auVar318._4_4_ * fVar273 * fVar193;
            auVar67._4_4_ = fVar240;
            auVar67._0_4_ = fVar219;
            fVar192 = auVar318._8_4_ * fVar295 * fVar196;
            auVar67._8_4_ = fVar192;
            fVar193 = auVar318._12_4_ * fVar275 * fVar242;
            auVar67._12_4_ = fVar193;
            fVar297 = auVar318._16_4_ * fVar162 * fVar146;
            auVar67._16_4_ = fVar297;
            fVar196 = auVar318._20_4_ * fVar141 * fVar243;
            auVar67._20_4_ = fVar196;
            fVar299 = auVar318._24_4_ * fVar143 * fVar302;
            auVar67._24_4_ = fVar299;
            auVar67._28_4_ = fStack_7a4;
            auVar182 = vsubps_avx(local_760,auVar65);
            auVar320._0_4_ = (float)local_660._0_4_ + fVar219;
            auVar320._4_4_ = local_660._4_4_ + fVar240;
            auVar320._8_4_ = local_660._8_4_ + fVar192;
            auVar320._12_4_ = local_660._12_4_ + fVar193;
            auVar320._16_4_ = local_660._16_4_ + fVar297;
            auVar320._20_4_ = local_660._20_4_ + fVar196;
            auVar320._24_4_ = local_660._24_4_ + fVar299;
            auVar320._28_4_ = local_660._28_4_ + fStack_7a4;
            fVar219 = fVar294 * -fVar194 * auVar318._0_4_;
            fVar240 = fVar273 * -fVar272 * auVar318._4_4_;
            auVar68._4_4_ = fVar240;
            auVar68._0_4_ = fVar219;
            fVar192 = fVar295 * -fVar195 * auVar318._8_4_;
            auVar68._8_4_ = fVar192;
            fVar193 = fVar275 * -fVar274 * auVar318._12_4_;
            auVar68._12_4_ = fVar193;
            fVar297 = fVar162 * -fVar197 * auVar318._16_4_;
            auVar68._16_4_ = fVar297;
            fVar196 = fVar141 * -fVar127 * auVar318._20_4_;
            auVar68._20_4_ = fVar196;
            fVar299 = fVar143 * -fVar142 * auVar318._24_4_;
            auVar68._24_4_ = fVar299;
            auVar68._28_4_ = auVar330._28_4_;
            auVar183 = vsubps_avx(auVar138,auVar66);
            auVar212._0_4_ = auVar236._0_4_ + fVar219;
            auVar212._4_4_ = auVar236._4_4_ + fVar240;
            auVar212._8_4_ = auVar236._8_4_ + fVar192;
            auVar212._12_4_ = auVar236._12_4_ + fVar193;
            auVar212._16_4_ = auVar236._16_4_ + fVar297;
            auVar212._20_4_ = auVar236._20_4_ + fVar196;
            auVar212._24_4_ = auVar236._24_4_ + fVar299;
            auVar212._28_4_ = auVar236._28_4_ + auVar330._28_4_;
            fVar219 = fVar294 * 0.0 * auVar318._0_4_;
            fVar240 = fVar273 * 0.0 * auVar318._4_4_;
            auVar69._4_4_ = fVar240;
            auVar69._0_4_ = fVar219;
            fVar192 = fVar295 * 0.0 * auVar318._8_4_;
            auVar69._8_4_ = fVar192;
            fVar193 = fVar275 * 0.0 * auVar318._12_4_;
            auVar69._12_4_ = fVar193;
            fVar297 = fVar162 * 0.0 * auVar318._16_4_;
            auVar69._16_4_ = fVar297;
            fVar196 = fVar141 * 0.0 * auVar318._20_4_;
            auVar69._20_4_ = fVar196;
            fVar299 = fVar143 * 0.0 * auVar318._24_4_;
            auVar69._24_4_ = fVar299;
            auVar69._28_4_ = auVar138._28_4_;
            auVar9 = vsubps_avx(local_660,auVar67);
            auVar281._0_4_ = (float)local_520._0_4_ + fVar219;
            auVar281._4_4_ = (float)local_520._4_4_ + fVar240;
            auVar281._8_4_ = fStack_518 + fVar192;
            auVar281._12_4_ = fStack_514 + fVar193;
            auVar281._16_4_ = fStack_510 + fVar297;
            auVar281._20_4_ = fStack_50c + fVar196;
            auVar281._24_4_ = fStack_508 + fVar299;
            auVar281._28_4_ = fStack_504 + auVar138._28_4_;
            auVar20 = vsubps_avx(auVar236,auVar68);
            auVar19 = vsubps_avx(_local_520,auVar69);
            auVar28 = vsubps_avx(auVar212,auVar182);
            auVar16 = vsubps_avx(auVar281,auVar183);
            auVar70._4_4_ = auVar183._4_4_ * auVar28._4_4_;
            auVar70._0_4_ = auVar183._0_4_ * auVar28._0_4_;
            auVar70._8_4_ = auVar183._8_4_ * auVar28._8_4_;
            auVar70._12_4_ = auVar183._12_4_ * auVar28._12_4_;
            auVar70._16_4_ = auVar183._16_4_ * auVar28._16_4_;
            auVar70._20_4_ = auVar183._20_4_ * auVar28._20_4_;
            auVar70._24_4_ = auVar183._24_4_ * auVar28._24_4_;
            auVar70._28_4_ = auVar309._28_4_;
            auVar71._4_4_ = auVar182._4_4_ * auVar16._4_4_;
            auVar71._0_4_ = auVar182._0_4_ * auVar16._0_4_;
            auVar71._8_4_ = auVar182._8_4_ * auVar16._8_4_;
            auVar71._12_4_ = auVar182._12_4_ * auVar16._12_4_;
            auVar71._16_4_ = auVar182._16_4_ * auVar16._16_4_;
            auVar71._20_4_ = auVar182._20_4_ * auVar16._20_4_;
            auVar71._24_4_ = auVar182._24_4_ * auVar16._24_4_;
            auVar71._28_4_ = fStack_504;
            auVar26 = vsubps_avx(auVar71,auVar70);
            auVar72._4_4_ = auVar25._4_4_ * auVar16._4_4_;
            auVar72._0_4_ = auVar25._0_4_ * auVar16._0_4_;
            auVar72._8_4_ = auVar25._8_4_ * auVar16._8_4_;
            auVar72._12_4_ = auVar25._12_4_ * auVar16._12_4_;
            auVar72._16_4_ = auVar25._16_4_ * auVar16._16_4_;
            auVar72._20_4_ = auVar25._20_4_ * auVar16._20_4_;
            auVar72._24_4_ = auVar25._24_4_ * auVar16._24_4_;
            auVar72._28_4_ = auVar16._28_4_;
            auVar16 = vsubps_avx(auVar320,auVar25);
            auVar73._4_4_ = auVar183._4_4_ * auVar16._4_4_;
            auVar73._0_4_ = auVar183._0_4_ * auVar16._0_4_;
            auVar73._8_4_ = auVar183._8_4_ * auVar16._8_4_;
            auVar73._12_4_ = auVar183._12_4_ * auVar16._12_4_;
            auVar73._16_4_ = auVar183._16_4_ * auVar16._16_4_;
            auVar73._20_4_ = auVar183._20_4_ * auVar16._20_4_;
            auVar73._24_4_ = auVar183._24_4_ * auVar16._24_4_;
            auVar73._28_4_ = auVar15._28_4_;
            auVar27 = vsubps_avx(auVar73,auVar72);
            auVar74._4_4_ = auVar182._4_4_ * auVar16._4_4_;
            auVar74._0_4_ = auVar182._0_4_ * auVar16._0_4_;
            auVar74._8_4_ = auVar182._8_4_ * auVar16._8_4_;
            auVar74._12_4_ = auVar182._12_4_ * auVar16._12_4_;
            auVar74._16_4_ = auVar182._16_4_ * auVar16._16_4_;
            auVar74._20_4_ = auVar182._20_4_ * auVar16._20_4_;
            auVar74._24_4_ = auVar182._24_4_ * auVar16._24_4_;
            auVar74._28_4_ = auVar15._28_4_;
            auVar75._4_4_ = auVar25._4_4_ * auVar28._4_4_;
            auVar75._0_4_ = auVar25._0_4_ * auVar28._0_4_;
            auVar75._8_4_ = auVar25._8_4_ * auVar28._8_4_;
            auVar75._12_4_ = auVar25._12_4_ * auVar28._12_4_;
            auVar75._16_4_ = auVar25._16_4_ * auVar28._16_4_;
            auVar75._20_4_ = auVar25._20_4_ * auVar28._20_4_;
            auVar75._24_4_ = auVar25._24_4_ * auVar28._24_4_;
            auVar75._28_4_ = auVar28._28_4_;
            auVar15 = vsubps_avx(auVar75,auVar74);
            auVar156._0_4_ = auVar26._0_4_ * 0.0 + auVar15._0_4_ + auVar27._0_4_ * 0.0;
            auVar156._4_4_ = auVar26._4_4_ * 0.0 + auVar15._4_4_ + auVar27._4_4_ * 0.0;
            auVar156._8_4_ = auVar26._8_4_ * 0.0 + auVar15._8_4_ + auVar27._8_4_ * 0.0;
            auVar156._12_4_ = auVar26._12_4_ * 0.0 + auVar15._12_4_ + auVar27._12_4_ * 0.0;
            auVar156._16_4_ = auVar26._16_4_ * 0.0 + auVar15._16_4_ + auVar27._16_4_ * 0.0;
            auVar156._20_4_ = auVar26._20_4_ * 0.0 + auVar15._20_4_ + auVar27._20_4_ * 0.0;
            auVar156._24_4_ = auVar26._24_4_ * 0.0 + auVar15._24_4_ + auVar27._24_4_ * 0.0;
            auVar156._28_4_ = auVar26._28_4_ + auVar15._28_4_ + auVar27._28_4_;
            auVar14 = vcmpps_avx(auVar156,ZEXT832(0) << 0x20,2);
            auVar15 = vblendvps_avx(auVar9,_local_600,auVar14);
            auVar187 = ZEXT3264(auVar15);
            auVar111._4_4_ = fStack_55c;
            auVar111._0_4_ = local_560;
            auVar111._8_4_ = fStack_558;
            auVar111._12_4_ = fStack_554;
            auVar111._16_4_ = fStack_550;
            auVar111._20_4_ = fStack_54c;
            auVar111._24_4_ = fStack_548;
            auVar111._28_4_ = fStack_544;
            auVar9 = vblendvps_avx(auVar20,auVar111,auVar14);
            auVar20 = vblendvps_avx(auVar19,auVar340,auVar14);
            auVar19 = vblendvps_avx(auVar25,auVar320,auVar14);
            auVar28 = vblendvps_avx(auVar182,auVar212,auVar14);
            auVar16 = vblendvps_avx(auVar183,auVar281,auVar14);
            auVar25 = vblendvps_avx(auVar320,auVar25,auVar14);
            auVar26 = vblendvps_avx(auVar212,auVar182,auVar14);
            auVar27 = vblendvps_avx(auVar281,auVar183,auVar14);
            local_760 = vandps_avx(auVar268,_local_3a0);
            auVar25 = vsubps_avx(auVar25,auVar15);
            auVar209 = vsubps_avx(auVar26,auVar9);
            auVar27 = vsubps_avx(auVar27,auVar20);
            auVar247 = vsubps_avx(auVar9,auVar28);
            fVar219 = auVar209._0_4_;
            fVar227 = auVar20._0_4_;
            fVar242 = auVar209._4_4_;
            fVar163 = auVar20._4_4_;
            auVar76._4_4_ = fVar163 * fVar242;
            auVar76._0_4_ = fVar227 * fVar219;
            fVar194 = auVar209._8_4_;
            fVar254 = auVar20._8_4_;
            auVar76._8_4_ = fVar254 * fVar194;
            fVar275 = auVar209._12_4_;
            fVar260 = auVar20._12_4_;
            auVar76._12_4_ = fVar260 * fVar275;
            fVar144 = auVar209._16_4_;
            fVar261 = auVar20._16_4_;
            auVar76._16_4_ = fVar261 * fVar144;
            fVar216 = auVar209._20_4_;
            fVar262 = auVar20._20_4_;
            auVar76._20_4_ = fVar262 * fVar216;
            fVar161 = auVar209._24_4_;
            fVar263 = auVar20._24_4_;
            auVar76._24_4_ = fVar263 * fVar161;
            auVar76._28_4_ = auVar26._28_4_;
            fVar240 = auVar9._0_4_;
            fVar276 = auVar27._0_4_;
            fVar300 = auVar9._4_4_;
            fVar282 = auVar27._4_4_;
            auVar77._4_4_ = fVar282 * fVar300;
            auVar77._0_4_ = fVar276 * fVar240;
            fVar294 = auVar9._8_4_;
            fVar283 = auVar27._8_4_;
            auVar77._8_4_ = fVar283 * fVar294;
            fVar197 = auVar9._12_4_;
            fVar284 = auVar27._12_4_;
            auVar77._12_4_ = fVar284 * fVar197;
            fVar145 = auVar9._16_4_;
            fVar285 = auVar27._16_4_;
            auVar77._16_4_ = fVar285 * fVar145;
            fVar220 = auVar9._20_4_;
            fVar286 = auVar27._20_4_;
            auVar77._20_4_ = fVar286 * fVar220;
            fVar200 = auVar9._24_4_;
            fVar287 = auVar27._24_4_;
            uVar7 = auVar182._28_4_;
            auVar77._24_4_ = fVar287 * fVar200;
            auVar77._28_4_ = uVar7;
            auVar26 = vsubps_avx(auVar77,auVar76);
            fVar192 = auVar15._0_4_;
            fVar146 = auVar15._4_4_;
            auVar78._4_4_ = fVar282 * fVar146;
            auVar78._0_4_ = fVar276 * fVar192;
            fVar272 = auVar15._8_4_;
            auVar78._8_4_ = fVar283 * fVar272;
            fVar162 = auVar15._12_4_;
            auVar78._12_4_ = fVar284 * fVar162;
            fVar147 = auVar15._16_4_;
            auVar78._16_4_ = fVar285 * fVar147;
            fVar224 = auVar15._20_4_;
            auVar78._20_4_ = fVar286 * fVar224;
            fVar217 = auVar15._24_4_;
            auVar78._24_4_ = fVar287 * fVar217;
            auVar78._28_4_ = uVar7;
            fVar193 = auVar25._0_4_;
            fVar301 = auVar25._4_4_;
            auVar79._4_4_ = fVar163 * fVar301;
            auVar79._0_4_ = fVar227 * fVar193;
            fVar273 = auVar25._8_4_;
            auVar79._8_4_ = fVar254 * fVar273;
            fVar127 = auVar25._12_4_;
            auVar79._12_4_ = fVar260 * fVar127;
            fVar174 = auVar25._16_4_;
            auVar79._16_4_ = fVar261 * fVar174;
            fVar126 = auVar25._20_4_;
            auVar79._20_4_ = fVar262 * fVar126;
            fVar221 = auVar25._24_4_;
            auVar79._24_4_ = fVar263 * fVar221;
            auVar79._28_4_ = auVar320._28_4_;
            auVar182 = vsubps_avx(auVar79,auVar78);
            auVar80._4_4_ = fVar300 * fVar301;
            auVar80._0_4_ = fVar240 * fVar193;
            auVar80._8_4_ = fVar294 * fVar273;
            auVar80._12_4_ = fVar197 * fVar127;
            auVar80._16_4_ = fVar145 * fVar174;
            auVar80._20_4_ = fVar220 * fVar126;
            auVar80._24_4_ = fVar200 * fVar221;
            auVar80._28_4_ = uVar7;
            auVar81._4_4_ = fVar146 * fVar242;
            auVar81._0_4_ = fVar192 * fVar219;
            auVar81._8_4_ = fVar272 * fVar194;
            auVar81._12_4_ = fVar162 * fVar275;
            auVar81._16_4_ = fVar147 * fVar144;
            auVar81._20_4_ = fVar224 * fVar216;
            auVar81._24_4_ = fVar217 * fVar161;
            auVar81._28_4_ = auVar183._28_4_;
            auVar183 = vsubps_avx(auVar81,auVar80);
            auVar296 = vsubps_avx(auVar20,auVar16);
            fVar196 = auVar183._28_4_ + auVar182._28_4_;
            auVar291._0_4_ = auVar183._0_4_ + auVar182._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
            auVar291._4_4_ = auVar183._4_4_ + auVar182._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
            auVar291._8_4_ = auVar183._8_4_ + auVar182._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
            auVar291._12_4_ = auVar183._12_4_ + auVar182._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
            auVar291._16_4_ = auVar183._16_4_ + auVar182._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
            auVar291._20_4_ = auVar183._20_4_ + auVar182._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
            auVar291._24_4_ = auVar183._24_4_ + auVar182._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
            auVar291._28_4_ = fVar196 + auVar26._28_4_;
            fVar297 = auVar247._0_4_;
            fVar243 = auVar247._4_4_;
            auVar82._4_4_ = auVar16._4_4_ * fVar243;
            auVar82._0_4_ = auVar16._0_4_ * fVar297;
            fVar195 = auVar247._8_4_;
            auVar82._8_4_ = auVar16._8_4_ * fVar195;
            fVar141 = auVar247._12_4_;
            auVar82._12_4_ = auVar16._12_4_ * fVar141;
            fVar189 = auVar247._16_4_;
            auVar82._16_4_ = auVar16._16_4_ * fVar189;
            fVar149 = auVar247._20_4_;
            auVar82._20_4_ = auVar16._20_4_ * fVar149;
            fVar225 = auVar247._24_4_;
            auVar82._24_4_ = auVar16._24_4_ * fVar225;
            auVar82._28_4_ = fVar196;
            fVar196 = auVar296._0_4_;
            fVar303 = auVar296._4_4_;
            auVar83._4_4_ = auVar28._4_4_ * fVar303;
            auVar83._0_4_ = auVar28._0_4_ * fVar196;
            fVar295 = auVar296._8_4_;
            auVar83._8_4_ = auVar28._8_4_ * fVar295;
            fVar142 = auVar296._12_4_;
            auVar83._12_4_ = auVar28._12_4_ * fVar142;
            fVar191 = auVar296._16_4_;
            auVar83._16_4_ = auVar28._16_4_ * fVar191;
            fVar159 = auVar296._20_4_;
            auVar83._20_4_ = auVar28._20_4_ * fVar159;
            fVar229 = auVar296._24_4_;
            auVar83._24_4_ = auVar28._24_4_ * fVar229;
            auVar83._28_4_ = auVar183._28_4_;
            auVar182 = vsubps_avx(auVar83,auVar82);
            auVar183 = vsubps_avx(auVar15,auVar19);
            fVar299 = auVar183._0_4_;
            fVar302 = auVar183._4_4_;
            auVar84._4_4_ = auVar16._4_4_ * fVar302;
            auVar84._0_4_ = auVar16._0_4_ * fVar299;
            fVar274 = auVar183._8_4_;
            auVar84._8_4_ = auVar16._8_4_ * fVar274;
            fVar143 = auVar183._12_4_;
            auVar84._12_4_ = auVar16._12_4_ * fVar143;
            fVar199 = auVar183._16_4_;
            auVar84._16_4_ = auVar16._16_4_ * fVar199;
            fVar160 = auVar183._20_4_;
            auVar84._20_4_ = auVar16._20_4_ * fVar160;
            fVar239 = auVar183._24_4_;
            auVar84._24_4_ = auVar16._24_4_ * fVar239;
            auVar84._28_4_ = auVar16._28_4_;
            auVar85._4_4_ = fVar303 * auVar19._4_4_;
            auVar85._0_4_ = fVar196 * auVar19._0_4_;
            auVar85._8_4_ = fVar295 * auVar19._8_4_;
            auVar85._12_4_ = fVar142 * auVar19._12_4_;
            auVar85._16_4_ = fVar191 * auVar19._16_4_;
            auVar85._20_4_ = fVar159 * auVar19._20_4_;
            auVar85._24_4_ = fVar229 * auVar19._24_4_;
            auVar85._28_4_ = auVar26._28_4_;
            auVar16 = vsubps_avx(auVar84,auVar85);
            auVar86._4_4_ = auVar28._4_4_ * fVar302;
            auVar86._0_4_ = auVar28._0_4_ * fVar299;
            auVar86._8_4_ = auVar28._8_4_ * fVar274;
            auVar86._12_4_ = auVar28._12_4_ * fVar143;
            auVar86._16_4_ = auVar28._16_4_ * fVar199;
            auVar86._20_4_ = auVar28._20_4_ * fVar160;
            auVar86._24_4_ = auVar28._24_4_ * fVar239;
            auVar86._28_4_ = auVar28._28_4_;
            auVar87._4_4_ = fVar243 * auVar19._4_4_;
            auVar87._0_4_ = fVar297 * auVar19._0_4_;
            auVar87._8_4_ = fVar195 * auVar19._8_4_;
            auVar87._12_4_ = fVar141 * auVar19._12_4_;
            auVar87._16_4_ = fVar189 * auVar19._16_4_;
            auVar87._20_4_ = fVar149 * auVar19._20_4_;
            auVar87._24_4_ = fVar225 * auVar19._24_4_;
            auVar87._28_4_ = auVar19._28_4_;
            auVar19 = vsubps_avx(auVar87,auVar86);
            auVar139._0_4_ = auVar182._0_4_ * 0.0 + auVar19._0_4_ + auVar16._0_4_ * 0.0;
            auVar139._4_4_ = auVar182._4_4_ * 0.0 + auVar19._4_4_ + auVar16._4_4_ * 0.0;
            auVar139._8_4_ = auVar182._8_4_ * 0.0 + auVar19._8_4_ + auVar16._8_4_ * 0.0;
            auVar139._12_4_ = auVar182._12_4_ * 0.0 + auVar19._12_4_ + auVar16._12_4_ * 0.0;
            auVar139._16_4_ = auVar182._16_4_ * 0.0 + auVar19._16_4_ + auVar16._16_4_ * 0.0;
            auVar139._20_4_ = auVar182._20_4_ * 0.0 + auVar19._20_4_ + auVar16._20_4_ * 0.0;
            auVar139._24_4_ = auVar182._24_4_ * 0.0 + auVar19._24_4_ + auVar16._24_4_ * 0.0;
            auVar139._28_4_ = auVar16._28_4_ + auVar19._28_4_ + auVar16._28_4_;
            auVar140 = ZEXT3264(auVar139);
            auVar19 = vmaxps_avx(auVar291,auVar139);
            auVar19 = vcmpps_avx(auVar19,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar28 = local_760 & auVar19;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) {
LAB_00eff5f4:
              auVar158._8_8_ = uStack_4d8;
              auVar158._0_8_ = local_4e0;
              auVar158._16_8_ = uStack_4d0;
              auVar158._24_8_ = uStack_4c8;
              auVar250 = ZEXT3264(auVar9);
              auVar292._4_4_ = fStack_7bc;
              auVar292._0_4_ = fVar128;
              auVar292._8_4_ = fStack_7b8;
              auVar292._12_4_ = fStack_7b4;
              auVar292._16_4_ = fStack_7b0;
              auVar292._20_4_ = fStack_7ac;
              auVar292._24_4_ = fStack_7a8;
              auVar292._28_4_ = fStack_7a4;
            }
            else {
              auVar28 = vandps_avx(auVar19,local_760);
              auVar88._4_4_ = fVar303 * fVar242;
              auVar88._0_4_ = fVar196 * fVar219;
              auVar88._8_4_ = fVar295 * fVar194;
              auVar88._12_4_ = fVar142 * fVar275;
              auVar88._16_4_ = fVar191 * fVar144;
              auVar88._20_4_ = fVar159 * fVar216;
              auVar88._24_4_ = fVar229 * fVar161;
              auVar88._28_4_ = local_760._28_4_;
              auVar89._4_4_ = fVar243 * fVar282;
              auVar89._0_4_ = fVar297 * fVar276;
              auVar89._8_4_ = fVar195 * fVar283;
              auVar89._12_4_ = fVar141 * fVar284;
              auVar89._16_4_ = fVar189 * fVar285;
              auVar89._20_4_ = fVar149 * fVar286;
              auVar89._24_4_ = fVar225 * fVar287;
              auVar89._28_4_ = auVar19._28_4_;
              auVar16 = vsubps_avx(auVar89,auVar88);
              auVar90._4_4_ = fVar302 * fVar282;
              auVar90._0_4_ = fVar299 * fVar276;
              auVar90._8_4_ = fVar274 * fVar283;
              auVar90._12_4_ = fVar143 * fVar284;
              auVar90._16_4_ = fVar199 * fVar285;
              auVar90._20_4_ = fVar160 * fVar286;
              auVar90._24_4_ = fVar239 * fVar287;
              auVar90._28_4_ = auVar27._28_4_;
              auVar91._4_4_ = fVar303 * fVar301;
              auVar91._0_4_ = fVar196 * fVar193;
              auVar91._8_4_ = fVar295 * fVar273;
              auVar91._12_4_ = fVar142 * fVar127;
              auVar91._16_4_ = fVar191 * fVar174;
              auVar91._20_4_ = fVar159 * fVar126;
              auVar91._24_4_ = fVar229 * fVar221;
              auVar91._28_4_ = auVar296._28_4_;
              auVar26 = vsubps_avx(auVar91,auVar90);
              auVar92._4_4_ = fVar243 * fVar301;
              auVar92._0_4_ = fVar297 * fVar193;
              auVar92._8_4_ = fVar195 * fVar273;
              auVar92._12_4_ = fVar141 * fVar127;
              auVar92._16_4_ = fVar189 * fVar174;
              auVar92._20_4_ = fVar149 * fVar126;
              auVar92._24_4_ = fVar225 * fVar221;
              auVar92._28_4_ = auVar25._28_4_;
              auVar93._4_4_ = fVar302 * fVar242;
              auVar93._0_4_ = fVar299 * fVar219;
              auVar93._8_4_ = fVar274 * fVar194;
              auVar93._12_4_ = fVar143 * fVar275;
              auVar93._16_4_ = fVar199 * fVar144;
              auVar93._20_4_ = fVar160 * fVar216;
              auVar93._24_4_ = fVar239 * fVar161;
              auVar93._28_4_ = auVar209._28_4_;
              auVar27 = vsubps_avx(auVar93,auVar92);
              auVar157._0_4_ = auVar16._0_4_ * 0.0 + auVar27._0_4_ + auVar26._0_4_ * 0.0;
              auVar157._4_4_ = auVar16._4_4_ * 0.0 + auVar27._4_4_ + auVar26._4_4_ * 0.0;
              auVar157._8_4_ = auVar16._8_4_ * 0.0 + auVar27._8_4_ + auVar26._8_4_ * 0.0;
              auVar157._12_4_ = auVar16._12_4_ * 0.0 + auVar27._12_4_ + auVar26._12_4_ * 0.0;
              auVar157._16_4_ = auVar16._16_4_ * 0.0 + auVar27._16_4_ + auVar26._16_4_ * 0.0;
              auVar157._20_4_ = auVar16._20_4_ * 0.0 + auVar27._20_4_ + auVar26._20_4_ * 0.0;
              auVar157._24_4_ = auVar16._24_4_ * 0.0 + auVar27._24_4_ + auVar26._24_4_ * 0.0;
              auVar157._28_4_ = auVar209._28_4_ + auVar27._28_4_ + auVar25._28_4_;
              auVar19 = vrcpps_avx(auVar157);
              fVar193 = auVar19._0_4_;
              fVar297 = auVar19._4_4_;
              auVar94._4_4_ = auVar157._4_4_ * fVar297;
              auVar94._0_4_ = auVar157._0_4_ * fVar193;
              fVar196 = auVar19._8_4_;
              auVar94._8_4_ = auVar157._8_4_ * fVar196;
              fVar299 = auVar19._12_4_;
              auVar94._12_4_ = auVar157._12_4_ * fVar299;
              fVar242 = auVar19._16_4_;
              auVar94._16_4_ = auVar157._16_4_ * fVar242;
              fVar301 = auVar19._20_4_;
              auVar94._20_4_ = auVar157._20_4_ * fVar301;
              fVar243 = auVar19._24_4_;
              auVar94._24_4_ = auVar157._24_4_ * fVar243;
              auVar94._28_4_ = auVar296._28_4_;
              auVar310._8_4_ = 0x3f800000;
              auVar310._0_8_ = &DAT_3f8000003f800000;
              auVar310._12_4_ = 0x3f800000;
              auVar310._16_4_ = 0x3f800000;
              auVar310._20_4_ = 0x3f800000;
              auVar310._24_4_ = 0x3f800000;
              auVar310._28_4_ = 0x3f800000;
              auVar19 = vsubps_avx(auVar310,auVar94);
              fVar193 = auVar19._0_4_ * fVar193 + fVar193;
              fVar297 = auVar19._4_4_ * fVar297 + fVar297;
              fVar196 = auVar19._8_4_ * fVar196 + fVar196;
              fVar299 = auVar19._12_4_ * fVar299 + fVar299;
              fVar242 = auVar19._16_4_ * fVar242 + fVar242;
              fVar301 = auVar19._20_4_ * fVar301 + fVar301;
              fVar243 = auVar19._24_4_ * fVar243 + fVar243;
              auVar95._4_4_ =
                   (fVar146 * auVar16._4_4_ + auVar26._4_4_ * fVar300 + auVar27._4_4_ * fVar163) *
                   fVar297;
              auVar95._0_4_ =
                   (fVar192 * auVar16._0_4_ + auVar26._0_4_ * fVar240 + auVar27._0_4_ * fVar227) *
                   fVar193;
              auVar95._8_4_ =
                   (fVar272 * auVar16._8_4_ + auVar26._8_4_ * fVar294 + auVar27._8_4_ * fVar254) *
                   fVar196;
              auVar95._12_4_ =
                   (fVar162 * auVar16._12_4_ + auVar26._12_4_ * fVar197 + auVar27._12_4_ * fVar260)
                   * fVar299;
              auVar95._16_4_ =
                   (fVar147 * auVar16._16_4_ + auVar26._16_4_ * fVar145 + auVar27._16_4_ * fVar261)
                   * fVar242;
              auVar95._20_4_ =
                   (fVar224 * auVar16._20_4_ + auVar26._20_4_ * fVar220 + auVar27._20_4_ * fVar262)
                   * fVar301;
              auVar95._24_4_ =
                   (fVar217 * auVar16._24_4_ + auVar26._24_4_ * fVar200 + auVar27._24_4_ * fVar263)
                   * fVar243;
              auVar95._28_4_ = auVar15._28_4_ + auVar9._28_4_ + auVar20._28_4_;
              auVar187 = ZEXT3264(auVar95);
              fVar219 = local_7f0->tfar;
              auVar213._4_4_ = fVar219;
              auVar213._0_4_ = fVar219;
              auVar213._8_4_ = fVar219;
              auVar213._12_4_ = fVar219;
              auVar213._16_4_ = fVar219;
              auVar213._20_4_ = fVar219;
              auVar213._24_4_ = fVar219;
              auVar213._28_4_ = fVar219;
              auVar9 = vcmpps_avx(local_c0,auVar95,2);
              auVar15 = vcmpps_avx(auVar95,auVar213,2);
              auVar9 = vandps_avx(auVar9,auVar15);
              auVar20 = auVar28 & auVar9;
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar20 >> 0x7f,0) == '\0') &&
                    (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0xbf,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar20[0x1f]) goto LAB_00eff5f4;
              auVar9 = vandps_avx(auVar28,auVar9);
              auVar250 = ZEXT3264(auVar9);
              auVar20 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar157,4);
              auVar19 = auVar9 & auVar20;
              auVar158._8_8_ = uStack_4d8;
              auVar158._0_8_ = local_4e0;
              auVar158._16_8_ = uStack_4d0;
              auVar158._24_8_ = uStack_4c8;
              auVar292._4_4_ = fStack_7bc;
              auVar292._0_4_ = fVar128;
              auVar292._8_4_ = fStack_7b8;
              auVar292._12_4_ = fStack_7b4;
              auVar292._16_4_ = fStack_7b0;
              auVar292._20_4_ = fStack_7ac;
              auVar292._24_4_ = fStack_7a8;
              auVar292._28_4_ = fStack_7a4;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar158 = vandps_avx(auVar20,auVar9);
                auVar96._4_4_ = auVar291._4_4_ * fVar297;
                auVar96._0_4_ = auVar291._0_4_ * fVar193;
                auVar96._8_4_ = auVar291._8_4_ * fVar196;
                auVar96._12_4_ = auVar291._12_4_ * fVar299;
                auVar96._16_4_ = auVar291._16_4_ * fVar242;
                auVar96._20_4_ = auVar291._20_4_ * fVar301;
                auVar96._24_4_ = auVar291._24_4_ * fVar243;
                auVar96._28_4_ = auVar15._28_4_;
                auVar97._4_4_ = auVar139._4_4_ * fVar297;
                auVar97._0_4_ = auVar139._0_4_ * fVar193;
                auVar97._8_4_ = auVar139._8_4_ * fVar196;
                auVar97._12_4_ = auVar139._12_4_ * fVar299;
                auVar97._16_4_ = auVar139._16_4_ * fVar242;
                auVar97._20_4_ = auVar139._20_4_ * fVar301;
                auVar97._24_4_ = auVar139._24_4_ * fVar243;
                auVar97._28_4_ = auVar139._28_4_;
                auVar249._8_4_ = 0x3f800000;
                auVar249._0_8_ = &DAT_3f8000003f800000;
                auVar249._12_4_ = 0x3f800000;
                auVar249._16_4_ = 0x3f800000;
                auVar249._20_4_ = 0x3f800000;
                auVar249._24_4_ = 0x3f800000;
                auVar249._28_4_ = 0x3f800000;
                auVar250 = ZEXT3264(auVar249);
                auVar9 = vsubps_avx(auVar249,auVar96);
                local_1c0 = vblendvps_avx(auVar9,auVar96,auVar14);
                auVar9 = vsubps_avx(auVar249,auVar97);
                _local_400 = vblendvps_avx(auVar9,auVar97,auVar14);
                auVar140 = ZEXT3264(_local_400);
                local_1e0 = auVar95;
              }
            }
            auVar271 = ZEXT3264(local_720);
            uVar121 = uVar121 & 0xffffffff;
            fVar199 = (float)local_700._0_4_;
            fVar216 = (float)local_700._4_4_;
            fVar220 = fStack_6f8;
            fVar224 = fStack_6f4;
            fVar219 = fStack_6f0;
            fVar240 = fStack_6ec;
            fVar192 = fStack_6e8;
            if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar158 >> 0x7f,0) != '\0') ||
                  (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar158 >> 0xbf,0) != '\0') ||
                (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar158[0x1f] < '\0') {
              auVar9 = vsubps_avx(auVar318,auVar292);
              auVar187 = ZEXT3264(local_1c0);
              fVar297 = auVar292._0_4_ + auVar9._0_4_ * local_1c0._0_4_;
              fVar196 = auVar292._4_4_ + auVar9._4_4_ * local_1c0._4_4_;
              fVar299 = auVar292._8_4_ + auVar9._8_4_ * local_1c0._8_4_;
              fVar242 = auVar292._12_4_ + auVar9._12_4_ * local_1c0._12_4_;
              fVar300 = auVar292._16_4_ + auVar9._16_4_ * local_1c0._16_4_;
              fVar146 = auVar292._20_4_ + auVar9._20_4_ * local_1c0._20_4_;
              fVar301 = auVar292._24_4_ + auVar9._24_4_ * local_1c0._24_4_;
              fVar243 = auVar292._28_4_ + auVar9._28_4_;
              fVar193 = pre->depth_scale;
              auVar98._4_4_ = (fVar196 + fVar196) * fVar193;
              auVar98._0_4_ = (fVar297 + fVar297) * fVar193;
              auVar98._8_4_ = (fVar299 + fVar299) * fVar193;
              auVar98._12_4_ = (fVar242 + fVar242) * fVar193;
              auVar98._16_4_ = (fVar300 + fVar300) * fVar193;
              auVar98._20_4_ = (fVar146 + fVar146) * fVar193;
              auVar98._24_4_ = (fVar301 + fVar301) * fVar193;
              auVar98._28_4_ = fVar243 + fVar243;
              auVar9 = vcmpps_avx(local_1e0,auVar98,6);
              auVar140 = ZEXT3264(auVar9);
              auVar15 = auVar158 & auVar9;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                local_260 = vandps_avx(auVar9,auVar158);
                auVar140 = ZEXT3264(local_260);
                local_300 = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                fStack_2fc = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                fStack_2f8 = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                fStack_2f4 = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                fStack_2f0 = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                fStack_2ec = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                fStack_2e8 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                fStack_2e4 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_320 = local_1c0;
                local_2e0 = local_1e0;
                local_2bc = uVar120;
                local_2b0 = local_7e0;
                uStack_2a8 = uStack_7d8;
                local_2a0 = local_450._0_8_;
                uStack_298 = local_450._8_8_;
                local_290 = local_460._0_8_;
                uStack_288 = local_460._8_8_;
                local_280 = local_470._0_8_;
                uStack_278 = local_470._8_8_;
                local_5a0._0_8_ = (local_7f8->scene->geometries).items[local_768].ptr;
                local_400._4_4_ = fStack_2fc;
                local_400._0_4_ = local_300;
                uStack_3f8._0_4_ = fStack_2f8;
                uStack_3f8._4_4_ = fStack_2f4;
                uStack_3f0._0_4_ = fStack_2f0;
                uStack_3f0._4_4_ = fStack_2ec;
                auVar115 = _local_400;
                uStack_3e8._0_4_ = fStack_2e8;
                uStack_3e8._4_4_ = fStack_2e4;
                auVar9 = _local_400;
                if ((((Geometry *)local_5a0._0_8_)->mask & local_7f0->mask) == 0) {
                  local_7c0._0_1_ = 0;
LAB_00eff587:
                  fVar338 = (float)local_740._0_4_;
                  fVar341 = (float)local_740._4_4_;
                  fVar342 = fStack_738;
                  fVar343 = fStack_734;
                  fVar173 = fStack_730;
                  fVar198 = fStack_72c;
                  fVar228 = fStack_728;
                }
                else {
                  pRVar118 = local_7f8->args;
                  if (pRVar118->filter != (RTCFilterFunctionN)0x0) {
LAB_00eff227:
                    local_5a0._8_24_ = auVar236._8_24_;
                    auVar153._0_4_ = (float)(int)local_2c0;
                    auVar153._4_8_ = SUB128(ZEXT812(0),4);
                    auVar153._12_4_ = 0;
                    auVar178 = vshufps_avx(auVar153,auVar153,0);
                    local_240[0] = (auVar178._0_4_ + local_1c0._0_4_ + 0.0) * (float)local_440._0_4_
                    ;
                    local_240[1] = (auVar178._4_4_ + local_1c0._4_4_ + 1.0) * (float)local_440._4_4_
                    ;
                    local_240[2] = (auVar178._8_4_ + local_1c0._8_4_ + 2.0) * fStack_438;
                    local_240[3] = (auVar178._12_4_ + local_1c0._12_4_ + 3.0) * fStack_434;
                    fStack_230 = (auVar178._0_4_ + local_1c0._16_4_ + 4.0) * fStack_430;
                    fStack_22c = (auVar178._4_4_ + local_1c0._20_4_ + 5.0) * fStack_42c;
                    fStack_228 = (auVar178._8_4_ + local_1c0._24_4_ + 6.0) * fStack_428;
                    fStack_224 = auVar178._12_4_ + (float)local_1c0._28_4_ + 7.0;
                    uStack_3f0 = auVar115._16_8_;
                    uStack_3e8 = auVar9._24_8_;
                    local_220 = local_400;
                    uStack_218 = uStack_3f8;
                    uStack_210 = uStack_3f0;
                    uStack_208 = uStack_3e8;
                    local_200 = local_1e0;
                    iVar116 = vmovmskps_avx(local_260);
                    local_7a0 = CONCAT44((int)((ulong)pRVar118 >> 0x20),iVar116);
                    lVar13 = 0;
                    if (local_7a0 != 0) {
                      for (; (local_7a0 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                      }
                    }
                    local_760._0_8_ = lVar13;
                    auStack_798 = auVar330._8_24_;
                    local_7c0 = (int)CONCAT71((int7)(local_7a0 >> 8),iVar116 != 0);
                    _local_400 = auVar9;
                    if (iVar116 != 0) {
                      _local_600 = local_450;
                      auStack_4f0 = auVar268._16_16_;
                      _local_500 = local_460;
                      _auStack_670 = auVar318._16_16_;
                      _local_680 = local_470;
                      do {
                        local_5c4 = local_240[local_760._0_8_];
                        auVar140 = ZEXT464((uint)local_5c4);
                        local_5c0 = *(undefined4 *)((long)&local_220 + local_760._0_8_ * 4);
                        local_660._0_4_ = local_7f0->tfar;
                        local_7f0->tfar = *(float *)(local_200 + local_760._0_8_ * 4);
                        local_6b0.context = local_7f8->user;
                        fVar198 = 1.0 - local_5c4;
                        fVar173 = local_5c4 * fVar198 * 4.0;
                        auVar250 = ZEXT464(0x3f000000);
                        auVar178 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                        auVar178 = vshufps_avx(auVar178,auVar178,0);
                        auVar166 = ZEXT416((uint)((fVar198 * fVar198 + fVar173) * 0.5));
                        auVar166 = vshufps_avx(auVar166,auVar166,0);
                        auVar208 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar173) * 0.5));
                        auVar208 = vshufps_avx(auVar208,auVar208,0);
                        auVar179 = ZEXT416((uint)(fVar198 * -fVar198 * 0.5));
                        auVar179 = vshufps_avx(auVar179,auVar179,0);
                        auVar180._0_4_ = auVar179._0_4_ * (float)local_7e0._0_4_;
                        auVar180._4_4_ = auVar179._4_4_ * (float)local_7e0._4_4_;
                        auVar180._8_4_ = auVar179._8_4_ * (float)uStack_7d8;
                        auVar180._12_4_ = auVar179._12_4_ * uStack_7d8._4_4_;
                        auVar187 = ZEXT1664(auVar180);
                        auVar167._0_4_ =
                             auVar180._0_4_ +
                             auVar208._0_4_ * (float)local_600._0_4_ +
                             auVar178._0_4_ * (float)local_680._0_4_ +
                             auVar166._0_4_ * (float)local_500._0_4_;
                        auVar167._4_4_ =
                             auVar180._4_4_ +
                             auVar208._4_4_ * (float)local_600._4_4_ +
                             auVar178._4_4_ * (float)local_680._4_4_ +
                             auVar166._4_4_ * (float)local_500._4_4_;
                        auVar167._8_4_ =
                             auVar180._8_4_ +
                             auVar208._8_4_ * fStack_5f8 +
                             auVar178._8_4_ * fStack_678 + auVar166._8_4_ * fStack_4f8;
                        auVar167._12_4_ =
                             auVar180._12_4_ +
                             auVar208._12_4_ * fStack_5f4 +
                             auVar178._12_4_ * fStack_674 + auVar166._12_4_ * fStack_4f4;
                        local_5d0 = vmovlps_avx(auVar167);
                        local_5c8 = vextractps_avx(auVar167,2);
                        local_5bc = local_7e4;
                        local_5b8 = (int)local_768;
                        local_5b4 = (local_6b0.context)->instID[0];
                        local_5b0 = (local_6b0.context)->instPrimID[0];
                        local_7fc = -1;
                        local_6b0.valid = &local_7fc;
                        local_6b0.geometryUserPtr = *(void **)(local_5a0._0_8_ + 0x18);
                        local_6b0.ray = (RTCRayN *)local_7f0;
                        local_6b0.hit = (RTCHitN *)&local_5d0;
                        local_6b0.N = 1;
                        if (*(code **)(local_5a0._0_8_ + 0x48) == (code *)0x0) {
LAB_00eff4a4:
                          p_Var12 = local_7f8->args->filter;
                          if (p_Var12 == (RTCFilterFunctionN)0x0) break;
                          if (((local_7f8->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_5a0._0_8_ + 0x3e) & 0x40) != 0)) {
                            auVar187 = ZEXT1664(auVar187._0_16_);
                            auVar250 = ZEXT1664(auVar250._0_16_);
                            auVar140._0_8_ = (*p_Var12)(&local_6b0);
                            auVar140._8_56_ = extraout_var_00;
                          }
                          if (*local_6b0.valid != 0) break;
                        }
                        else {
                          auVar187 = ZEXT1664(auVar180);
                          auVar250 = ZEXT1664(auVar250._0_16_);
                          auVar140._0_8_ = (**(code **)(local_5a0._0_8_ + 0x48))(&local_6b0);
                          auVar140._8_56_ = extraout_var;
                          if (*local_6b0.valid != 0) goto LAB_00eff4a4;
                        }
                        auVar140 = ZEXT464((uint)local_660._0_4_);
                        local_7f0->tfar = (float)local_660._0_4_;
                        uVar121 = local_7a0 ^ 1L << (local_760._0_8_ & 0x3f);
                        lVar13 = 0;
                        if (uVar121 != 0) {
                          for (; (uVar121 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                          }
                        }
                        local_760._0_8_ = lVar13;
                        local_7a0 = uVar121;
                        local_7c0 = (int)CONCAT71((int7)(uVar121 >> 8),uVar121 != 0);
                      } while (uVar121 != 0);
                    }
                    local_7c0._0_1_ = (byte)local_7c0 & 1;
                    auVar271 = ZEXT3264(local_720);
                    pre = local_7c8;
                    fVar244 = (float)local_6e0._0_4_;
                    fVar251 = (float)local_6e0._4_4_;
                    fVar252 = fStack_6d8;
                    fVar253 = fStack_6d4;
                    fVar188 = fStack_6d0;
                    fVar215 = fStack_6cc;
                    fVar238 = fStack_6c8;
                    fVar190 = fStack_6c4;
                    fVar223 = (float)local_540._0_4_;
                    fVar241 = (float)local_540._4_4_;
                    fVar171 = fStack_538;
                    fVar337 = fStack_534;
                    fVar293 = fStack_530;
                    fVar314 = fStack_52c;
                    fVar172 = fStack_528;
                    fVar148 = fStack_524;
                    fVar199 = (float)local_700._0_4_;
                    fVar216 = (float)local_700._4_4_;
                    fVar220 = fStack_6f8;
                    fVar224 = fStack_6f4;
                    fVar219 = fStack_6f0;
                    fVar240 = fStack_6ec;
                    fVar192 = fStack_6e8;
                    goto LAB_00eff587;
                  }
                  pRVar118 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar118 >> 8),1);
                  local_7c0._0_1_ = 1;
                  if (((Geometry *)local_5a0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)
                  goto LAB_00eff227;
                }
                auVar214 = ZEXT3264(_local_620);
                uVar121 = (ulong)CONCAT31((int3)(local_640 >> 8),(byte)local_640 | (byte)local_7c0);
                goto LAB_00eff122;
              }
            }
            auVar214 = ZEXT3264(_local_620);
          }
LAB_00eff122:
          lVar122 = lVar122 + 8;
        } while ((int)lVar122 < (int)uVar120);
      }
      if ((uVar121 & 1) != 0) {
        return bVar125;
      }
      fVar173 = local_7f0->tfar;
      auVar132._4_4_ = fVar173;
      auVar132._0_4_ = fVar173;
      auVar132._8_4_ = fVar173;
      auVar132._12_4_ = fVar173;
      auVar178 = vcmpps_avx(local_330,auVar132,2);
      uVar120 = vmovmskps_avx(auVar178);
      uVar120 = (uint)uVar124 & uVar120;
      bVar125 = uVar120 != 0;
      context = local_7f8;
      pPVar123 = local_7d0;
      ray = local_7f0;
    } while (bVar125);
  }
  return bVar125;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }